

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined4 uVar10;
  Primitive PVar11;
  uint uVar12;
  uint uVar13;
  undefined4 uVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  bool bVar109;
  bool bVar110;
  bool bVar111;
  bool bVar112;
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [28];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [24];
  uint uVar134;
  uint uVar135;
  ulong uVar136;
  uint uVar137;
  ulong uVar138;
  long lVar139;
  undefined1 auVar140 [8];
  long lVar141;
  Geometry *pGVar142;
  float fVar143;
  float fVar146;
  float fVar163;
  float fVar167;
  vint4 bi_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar144;
  float fVar145;
  undefined1 auVar151 [16];
  float fVar164;
  float fVar165;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar150 [16];
  undefined1 auVar155 [32];
  float fVar166;
  undefined1 auVar156 [32];
  float fVar173;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar174;
  undefined8 extraout_XMM1_Qa;
  float fVar199;
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar175;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar176;
  undefined1 auVar187 [32];
  float fVar198;
  float fVar201;
  float fVar204;
  float fVar207;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 extraout_var [56];
  vint4 bi_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar220;
  undefined1 auVar219 [32];
  float fVar221;
  float fVar233;
  float fVar234;
  vint4 ai_1;
  undefined1 auVar222 [16];
  float fVar236;
  undefined1 auVar223 [16];
  float fVar239;
  undefined1 auVar225 [16];
  undefined1 auVar224 [16];
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar241;
  float fVar243;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar245;
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  float fVar246;
  float fVar258;
  float fVar261;
  vint4 ai_2;
  undefined1 auVar249 [16];
  float fVar264;
  undefined1 auVar250 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar252 [16];
  undefined1 auVar251 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar267;
  float fVar275;
  float fVar276;
  undefined1 auVar268 [16];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar269 [32];
  float fVar282;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar289;
  float fVar290;
  undefined1 auVar288 [32];
  float fVar291;
  float fVar299;
  vint4 ai;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  float fVar300;
  float fVar308;
  float fVar311;
  float fVar312;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar305 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar306 [32];
  float fVar309;
  float fVar310;
  float fVar313;
  float fVar314;
  undefined1 auVar307 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  float fVar325;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar326;
  float fVar332;
  float fVar333;
  undefined1 auVar327 [16];
  float fVar334;
  float fVar335;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar336;
  float fVar342;
  float fVar345;
  undefined1 auVar339 [16];
  float fVar337;
  float fVar343;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar340 [32];
  float fVar338;
  float fVar344;
  undefined1 auVar341 [32];
  float fVar349;
  float fVar357;
  undefined1 auVar350 [16];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar358;
  float fVar359;
  float fVar363;
  float fVar365;
  undefined1 auVar360 [16];
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar373 [32];
  float fVar378;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  Precalculations *local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  uint local_840;
  undefined4 uStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined1 auStack_7d0 [8];
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [16];
  undefined1 (*local_788) [16];
  undefined8 local_780;
  undefined1 auStack_778 [8];
  undefined1 auStack_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [16];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 auStack_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  RTCHitN local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  uint local_320;
  uint local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2c0 [32];
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar304 [16];
  undefined1 auVar351 [16];
  undefined1 auVar372 [16];
  
  PVar11 = prim[1];
  uVar136 = (ulong)(byte)PVar11;
  lVar20 = uVar136 * 0x25;
  fVar338 = *(float *)(prim + lVar20 + 0x12);
  auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar252 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar214 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar252 = vsubps_avx(auVar252,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar177._0_4_ = fVar338 * auVar252._0_4_;
  auVar177._4_4_ = fVar338 * auVar252._4_4_;
  auVar177._8_4_ = fVar338 * auVar252._8_4_;
  auVar177._12_4_ = fVar338 * auVar252._12_4_;
  auVar292._0_4_ = fVar338 * auVar214._0_4_;
  auVar292._4_4_ = fVar338 * auVar214._4_4_;
  auVar292._8_4_ = fVar338 * auVar214._8_4_;
  auVar292._12_4_ = fVar338 * auVar214._12_4_;
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 4 + 6)));
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 5 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 6 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar136 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar136 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vshufps_avx(auVar292,auVar292,0);
  auVar27 = vshufps_avx(auVar292,auVar292,0x55);
  auVar28 = vshufps_avx(auVar292,auVar292,0xaa);
  fVar338 = auVar28._0_4_;
  fVar220 = auVar28._4_4_;
  fVar344 = auVar28._8_4_;
  fVar239 = auVar28._12_4_;
  fVar246 = auVar27._0_4_;
  fVar258 = auVar27._4_4_;
  fVar261 = auVar27._8_4_;
  fVar264 = auVar27._12_4_;
  fVar221 = auVar26._0_4_;
  fVar233 = auVar26._4_4_;
  fVar234 = auVar26._8_4_;
  fVar236 = auVar26._12_4_;
  auVar350._0_4_ = fVar221 * auVar252._0_4_ + fVar246 * auVar214._0_4_ + fVar338 * auVar225._0_4_;
  auVar350._4_4_ = fVar233 * auVar252._4_4_ + fVar258 * auVar214._4_4_ + fVar220 * auVar225._4_4_;
  auVar350._8_4_ = fVar234 * auVar252._8_4_ + fVar261 * auVar214._8_4_ + fVar344 * auVar225._8_4_;
  auVar350._12_4_ =
       fVar236 * auVar252._12_4_ + fVar264 * auVar214._12_4_ + fVar239 * auVar225._12_4_;
  auVar360._0_4_ = fVar221 * auVar216._0_4_ + fVar246 * auVar21._0_4_ + auVar22._0_4_ * fVar338;
  auVar360._4_4_ = fVar233 * auVar216._4_4_ + fVar258 * auVar21._4_4_ + auVar22._4_4_ * fVar220;
  auVar360._8_4_ = fVar234 * auVar216._8_4_ + fVar261 * auVar21._8_4_ + auVar22._8_4_ * fVar344;
  auVar360._12_4_ = fVar236 * auVar216._12_4_ + fVar264 * auVar21._12_4_ + auVar22._12_4_ * fVar239;
  auVar293._0_4_ = fVar221 * auVar23._0_4_ + fVar246 * auVar24._0_4_ + auVar25._0_4_ * fVar338;
  auVar293._4_4_ = fVar233 * auVar23._4_4_ + fVar258 * auVar24._4_4_ + auVar25._4_4_ * fVar220;
  auVar293._8_4_ = fVar234 * auVar23._8_4_ + fVar261 * auVar24._8_4_ + auVar25._8_4_ * fVar344;
  auVar293._12_4_ = fVar236 * auVar23._12_4_ + fVar264 * auVar24._12_4_ + auVar25._12_4_ * fVar239;
  auVar26 = vshufps_avx(auVar177,auVar177,0);
  auVar27 = vshufps_avx(auVar177,auVar177,0x55);
  auVar28 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar338 = auVar28._0_4_;
  fVar220 = auVar28._4_4_;
  fVar344 = auVar28._8_4_;
  fVar239 = auVar28._12_4_;
  fVar246 = auVar27._0_4_;
  fVar258 = auVar27._4_4_;
  fVar261 = auVar27._8_4_;
  fVar264 = auVar27._12_4_;
  fVar221 = auVar26._0_4_;
  fVar233 = auVar26._4_4_;
  fVar234 = auVar26._8_4_;
  fVar236 = auVar26._12_4_;
  auVar178._0_4_ = fVar221 * auVar252._0_4_ + fVar246 * auVar214._0_4_ + fVar338 * auVar225._0_4_;
  auVar178._4_4_ = fVar233 * auVar252._4_4_ + fVar258 * auVar214._4_4_ + fVar220 * auVar225._4_4_;
  auVar178._8_4_ = fVar234 * auVar252._8_4_ + fVar261 * auVar214._8_4_ + fVar344 * auVar225._8_4_;
  auVar178._12_4_ =
       fVar236 * auVar252._12_4_ + fVar264 * auVar214._12_4_ + fVar239 * auVar225._12_4_;
  auVar147._0_4_ = fVar221 * auVar216._0_4_ + auVar22._0_4_ * fVar338 + fVar246 * auVar21._0_4_;
  auVar147._4_4_ = fVar233 * auVar216._4_4_ + auVar22._4_4_ * fVar220 + fVar258 * auVar21._4_4_;
  auVar147._8_4_ = fVar234 * auVar216._8_4_ + auVar22._8_4_ * fVar344 + fVar261 * auVar21._8_4_;
  auVar147._12_4_ = fVar236 * auVar216._12_4_ + auVar22._12_4_ * fVar239 + fVar264 * auVar21._12_4_;
  auVar301._8_4_ = 0x7fffffff;
  auVar301._0_8_ = 0x7fffffff7fffffff;
  auVar301._12_4_ = 0x7fffffff;
  auVar252 = vandps_avx(auVar350,auVar301);
  auVar249._8_4_ = 0x219392ef;
  auVar249._0_8_ = 0x219392ef219392ef;
  auVar249._12_4_ = 0x219392ef;
  auVar252 = vcmpps_avx(auVar252,auVar249,1);
  auVar214 = vblendvps_avx(auVar350,auVar249,auVar252);
  auVar252 = vandps_avx(auVar360,auVar301);
  auVar252 = vcmpps_avx(auVar252,auVar249,1);
  auVar225 = vblendvps_avx(auVar360,auVar249,auVar252);
  auVar252 = vandps_avx(auVar301,auVar293);
  auVar252 = vcmpps_avx(auVar252,auVar249,1);
  auVar252 = vblendvps_avx(auVar293,auVar249,auVar252);
  auVar208._0_4_ = fVar221 * auVar23._0_4_ + fVar246 * auVar24._0_4_ + auVar25._0_4_ * fVar338;
  auVar208._4_4_ = fVar233 * auVar23._4_4_ + fVar258 * auVar24._4_4_ + auVar25._4_4_ * fVar220;
  auVar208._8_4_ = fVar234 * auVar23._8_4_ + fVar261 * auVar24._8_4_ + auVar25._8_4_ * fVar344;
  auVar208._12_4_ = fVar236 * auVar23._12_4_ + fVar264 * auVar24._12_4_ + auVar25._12_4_ * fVar239;
  auVar216 = vrcpps_avx(auVar214);
  fVar221 = auVar216._0_4_;
  auVar222._0_4_ = fVar221 * auVar214._0_4_;
  fVar233 = auVar216._4_4_;
  auVar222._4_4_ = fVar233 * auVar214._4_4_;
  fVar234 = auVar216._8_4_;
  auVar222._8_4_ = fVar234 * auVar214._8_4_;
  fVar236 = auVar216._12_4_;
  auVar222._12_4_ = fVar236 * auVar214._12_4_;
  auVar283._8_4_ = 0x3f800000;
  auVar283._0_8_ = &DAT_3f8000003f800000;
  auVar283._12_4_ = 0x3f800000;
  auVar214 = vsubps_avx(auVar283,auVar222);
  fVar221 = fVar221 + fVar221 * auVar214._0_4_;
  fVar233 = fVar233 + fVar233 * auVar214._4_4_;
  fVar234 = fVar234 + fVar234 * auVar214._8_4_;
  fVar236 = fVar236 + fVar236 * auVar214._12_4_;
  auVar214 = vrcpps_avx(auVar225);
  fVar246 = auVar214._0_4_;
  auVar268._0_4_ = fVar246 * auVar225._0_4_;
  fVar258 = auVar214._4_4_;
  auVar268._4_4_ = fVar258 * auVar225._4_4_;
  fVar261 = auVar214._8_4_;
  auVar268._8_4_ = fVar261 * auVar225._8_4_;
  fVar264 = auVar214._12_4_;
  auVar268._12_4_ = fVar264 * auVar225._12_4_;
  auVar214 = vsubps_avx(auVar283,auVar268);
  fVar246 = fVar246 + fVar246 * auVar214._0_4_;
  fVar258 = fVar258 + fVar258 * auVar214._4_4_;
  fVar261 = fVar261 + fVar261 * auVar214._8_4_;
  fVar264 = fVar264 + fVar264 * auVar214._12_4_;
  auVar214 = vrcpps_avx(auVar252);
  fVar267 = auVar214._0_4_;
  auVar294._0_4_ = fVar267 * auVar252._0_4_;
  fVar275 = auVar214._4_4_;
  auVar294._4_4_ = fVar275 * auVar252._4_4_;
  fVar276 = auVar214._8_4_;
  auVar294._8_4_ = fVar276 * auVar252._8_4_;
  fVar277 = auVar214._12_4_;
  auVar294._12_4_ = fVar277 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar283,auVar294);
  fVar267 = fVar267 + fVar267 * auVar252._0_4_;
  fVar275 = fVar275 + fVar275 * auVar252._4_4_;
  fVar276 = fVar276 + fVar276 * auVar252._8_4_;
  fVar277 = fVar277 + fVar277 * auVar252._12_4_;
  auVar252 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar225 = vshufps_avx(auVar252,auVar252,0);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar136 * 7 + 6);
  auVar252 = vpmovsxwd_avx(auVar252);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar136 * 0xb + 6);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar216 = vsubps_avx(auVar214,auVar252);
  fVar338 = auVar225._0_4_;
  fVar220 = auVar225._4_4_;
  fVar344 = auVar225._8_4_;
  fVar239 = auVar225._12_4_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar136 * 9 + 6);
  auVar214 = vpmovsxwd_avx(auVar225);
  auVar295._0_4_ = auVar216._0_4_ * fVar338 + auVar252._0_4_;
  auVar295._4_4_ = auVar216._4_4_ * fVar220 + auVar252._4_4_;
  auVar295._8_4_ = auVar216._8_4_ * fVar344 + auVar252._8_4_;
  auVar295._12_4_ = auVar216._12_4_ * fVar239 + auVar252._12_4_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar136 * 0xd + 6);
  auVar225 = vpmovsxwd_avx(auVar216);
  auVar252 = vcvtdq2ps_avx(auVar214);
  auVar214 = vcvtdq2ps_avx(auVar225);
  auVar214 = vsubps_avx(auVar214,auVar252);
  auVar302._0_4_ = auVar214._0_4_ * fVar338 + auVar252._0_4_;
  auVar302._4_4_ = auVar214._4_4_ * fVar220 + auVar252._4_4_;
  auVar302._8_4_ = auVar214._8_4_ * fVar344 + auVar252._8_4_;
  auVar302._12_4_ = auVar214._12_4_ * fVar239 + auVar252._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar136 * 0x12 + 6);
  auVar252 = vpmovsxwd_avx(auVar21);
  uVar138 = (ulong)(uint)((int)(uVar136 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar136 * 2 + uVar138 + 6);
  auVar214 = vpmovsxwd_avx(auVar22);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar252);
  auVar319._0_4_ = auVar214._0_4_ * fVar338 + auVar252._0_4_;
  auVar319._4_4_ = auVar214._4_4_ * fVar220 + auVar252._4_4_;
  auVar319._8_4_ = auVar214._8_4_ * fVar344 + auVar252._8_4_;
  auVar319._12_4_ = auVar214._12_4_ * fVar239 + auVar252._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar138 + 6);
  auVar252 = vpmovsxwd_avx(auVar23);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar136 * 0x18 + 6);
  auVar214 = vpmovsxwd_avx(auVar24);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar225 = vsubps_avx(auVar214,auVar252);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar136 * 0x1d + 6);
  auVar214 = vpmovsxwd_avx(auVar25);
  auVar327._0_4_ = auVar225._0_4_ * fVar338 + auVar252._0_4_;
  auVar327._4_4_ = auVar225._4_4_ * fVar220 + auVar252._4_4_;
  auVar327._8_4_ = auVar225._8_4_ * fVar344 + auVar252._8_4_;
  auVar327._12_4_ = auVar225._12_4_ * fVar239 + auVar252._12_4_;
  auVar252 = vcvtdq2ps_avx(auVar214);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar136 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar214 = vpmovsxwd_avx(auVar26);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar252);
  auVar339._0_4_ = auVar214._0_4_ * fVar338 + auVar252._0_4_;
  auVar339._4_4_ = auVar214._4_4_ * fVar220 + auVar252._4_4_;
  auVar339._8_4_ = auVar214._8_4_ * fVar344 + auVar252._8_4_;
  auVar339._12_4_ = auVar214._12_4_ * fVar239 + auVar252._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar136) + 6);
  auVar252 = vpmovsxwd_avx(auVar27);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar136 * 0x23 + 6);
  auVar214 = vpmovsxwd_avx(auVar28);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar214 = vsubps_avx(auVar214,auVar252);
  auVar284._0_4_ = auVar252._0_4_ + auVar214._0_4_ * fVar338;
  auVar284._4_4_ = auVar252._4_4_ + auVar214._4_4_ * fVar220;
  auVar284._8_4_ = auVar252._8_4_ + auVar214._8_4_ * fVar344;
  auVar284._12_4_ = auVar252._12_4_ + auVar214._12_4_ * fVar239;
  auVar252 = vsubps_avx(auVar295,auVar178);
  auVar296._0_4_ = fVar221 * auVar252._0_4_;
  auVar296._4_4_ = fVar233 * auVar252._4_4_;
  auVar296._8_4_ = fVar234 * auVar252._8_4_;
  auVar296._12_4_ = fVar236 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar302,auVar178);
  auVar179._0_4_ = fVar221 * auVar252._0_4_;
  auVar179._4_4_ = fVar233 * auVar252._4_4_;
  auVar179._8_4_ = fVar234 * auVar252._8_4_;
  auVar179._12_4_ = fVar236 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar319,auVar147);
  auVar223._0_4_ = fVar246 * auVar252._0_4_;
  auVar223._4_4_ = fVar258 * auVar252._4_4_;
  auVar223._8_4_ = fVar261 * auVar252._8_4_;
  auVar223._12_4_ = fVar264 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar327,auVar147);
  auVar148._0_4_ = fVar246 * auVar252._0_4_;
  auVar148._4_4_ = fVar258 * auVar252._4_4_;
  auVar148._8_4_ = fVar261 * auVar252._8_4_;
  auVar148._12_4_ = fVar264 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar339,auVar208);
  auVar250._0_4_ = fVar267 * auVar252._0_4_;
  auVar250._4_4_ = fVar275 * auVar252._4_4_;
  auVar250._8_4_ = fVar276 * auVar252._8_4_;
  auVar250._12_4_ = fVar277 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar284,auVar208);
  auVar209._0_4_ = fVar267 * auVar252._0_4_;
  auVar209._4_4_ = fVar275 * auVar252._4_4_;
  auVar209._8_4_ = fVar276 * auVar252._8_4_;
  auVar209._12_4_ = fVar277 * auVar252._12_4_;
  auVar252 = vpminsd_avx(auVar296,auVar179);
  auVar214 = vpminsd_avx(auVar223,auVar148);
  auVar252 = vmaxps_avx(auVar252,auVar214);
  auVar214 = vpminsd_avx(auVar250,auVar209);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._4_4_ = uVar10;
  auVar303._0_4_ = uVar10;
  auVar303._8_4_ = uVar10;
  auVar303._12_4_ = uVar10;
  auVar214 = vmaxps_avx(auVar214,auVar303);
  auVar252 = vmaxps_avx(auVar252,auVar214);
  local_130._0_4_ = auVar252._0_4_ * 0.99999964;
  local_130._4_4_ = auVar252._4_4_ * 0.99999964;
  local_130._8_4_ = auVar252._8_4_ * 0.99999964;
  local_130._12_4_ = auVar252._12_4_ * 0.99999964;
  auVar252 = vpmaxsd_avx(auVar296,auVar179);
  auVar214 = vpmaxsd_avx(auVar223,auVar148);
  auVar252 = vminps_avx(auVar252,auVar214);
  auVar214 = vpmaxsd_avx(auVar250,auVar209);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar210._4_4_ = uVar10;
  auVar210._0_4_ = uVar10;
  auVar210._8_4_ = uVar10;
  auVar210._12_4_ = uVar10;
  auVar214 = vminps_avx(auVar214,auVar210);
  auVar252 = vminps_avx(auVar252,auVar214);
  auVar149._0_4_ = auVar252._0_4_ * 1.0000004;
  auVar149._4_4_ = auVar252._4_4_ * 1.0000004;
  auVar149._8_4_ = auVar252._8_4_ * 1.0000004;
  auVar149._12_4_ = auVar252._12_4_ * 1.0000004;
  auVar252 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar214 = vpcmpgtd_avx(auVar252,_DAT_01ff0cf0);
  auVar252 = vcmpps_avx(local_130,auVar149,2);
  auVar252 = vandps_avx(auVar252,auVar214);
  uVar134 = vmovmskps_avx(auVar252);
  if (uVar134 != 0) {
    uVar134 = uVar134 & 0xff;
    local_5c8 = pre->ray_space + k;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_788 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_868 = pre;
    do {
      lVar20 = 0;
      if (uVar134 != 0) {
        for (; (uVar134 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar137 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar20 * 4 + 6);
      pGVar142 = (context->scene->geometries).items[uVar137].ptr;
      uVar136 = (ulong)*(uint *)(*(long *)&pGVar142->field_0x58 +
                                (ulong)uVar12 *
                                pGVar142[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar338 = (pGVar142->time_range).lower;
      fVar338 = pGVar142->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar338) /
                ((pGVar142->time_range).upper - fVar338));
      auVar252 = vroundss_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),9);
      auVar252 = vminss_avx(auVar252,ZEXT416((uint)(pGVar142->fnumTimeSegments + -1.0)));
      auVar252 = vmaxss_avx(ZEXT816(0) << 0x20,auVar252);
      fVar338 = fVar338 - auVar252._0_4_;
      _Var15 = pGVar142[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar139 = (long)(int)auVar252._0_4_ * 0x38;
      lVar141 = *(long *)(_Var15 + 0x10 + lVar139);
      lVar16 = *(long *)(_Var15 + 0x38 + lVar139);
      lVar17 = *(long *)(_Var15 + 0x48 + lVar139);
      auVar252 = vshufps_avx(ZEXT416((uint)fVar338),ZEXT416((uint)fVar338),0);
      pfVar1 = (float *)(lVar16 + lVar17 * uVar136);
      fVar220 = auVar252._0_4_;
      fVar344 = auVar252._4_4_;
      fVar239 = auVar252._8_4_;
      fVar221 = auVar252._12_4_;
      lVar20 = uVar136 + 1;
      pfVar2 = (float *)(lVar16 + lVar17 * lVar20);
      p_Var18 = pGVar142[4].occlusionFilterN;
      auVar252 = vshufps_avx(ZEXT416((uint)(1.0 - fVar338)),ZEXT416((uint)(1.0 - fVar338)),0);
      pfVar3 = (float *)(*(long *)(_Var15 + lVar139) + lVar141 * uVar136);
      fVar338 = auVar252._0_4_;
      fVar233 = auVar252._4_4_;
      fVar234 = auVar252._8_4_;
      fVar236 = auVar252._12_4_;
      pfVar4 = (float *)(*(long *)(_Var15 + lVar139) + lVar141 * lVar20);
      pfVar5 = (float *)(*(long *)(p_Var18 + lVar139 + 0x38) +
                        uVar136 * *(long *)(p_Var18 + lVar139 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var18 + lVar139 + 0x38) +
                        *(long *)(p_Var18 + lVar139 + 0x48) * lVar20);
      pfVar7 = (float *)(*(long *)(p_Var18 + lVar139) +
                        *(long *)(p_Var18 + lVar139 + 0x10) * uVar136);
      pfVar8 = (float *)(*(long *)(p_Var18 + lVar139) + *(long *)(p_Var18 + lVar139 + 0x10) * lVar20
                        );
      uVar13 = (uint)pGVar142[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar13 * 0x44;
      fVar300 = fVar338 * *pfVar3 + fVar220 * *pfVar1;
      fVar308 = fVar233 * pfVar3[1] + fVar344 * pfVar1[1];
      auVar304._0_8_ = CONCAT44(fVar308,fVar300);
      auVar304._8_4_ = fVar234 * pfVar3[2] + fVar239 * pfVar1[2];
      auVar304._12_4_ = fVar236 * pfVar3[3] + fVar221 * pfVar1[3];
      fVar369 = fVar338 * *pfVar4 + fVar220 * *pfVar2;
      fVar374 = fVar233 * pfVar4[1] + fVar344 * pfVar2[1];
      auVar372._0_8_ = CONCAT44(fVar374,fVar369);
      auVar372._8_4_ = fVar234 * pfVar4[2] + fVar239 * pfVar2[2];
      auVar372._12_4_ = fVar236 * pfVar4[3] + fVar221 * pfVar2[3];
      auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar216 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar349 = fVar300 + (fVar338 * *pfVar7 + fVar220 * *pfVar5) * 0.33333334;
      fVar357 = fVar308 + (fVar233 * pfVar7[1] + fVar344 * pfVar5[1]) * 0.33333334;
      auVar351._0_8_ = CONCAT44(fVar357,fVar349);
      auVar351._8_4_ = auVar304._8_4_ + (fVar234 * pfVar7[2] + fVar239 * pfVar5[2]) * 0.33333334;
      auVar351._12_4_ = auVar304._12_4_ + (fVar236 * pfVar7[3] + fVar221 * pfVar5[3]) * 0.33333334;
      auVar180._0_4_ = (fVar338 * *pfVar8 + fVar220 * *pfVar6) * 0.33333334;
      auVar180._4_4_ = (fVar233 * pfVar8[1] + fVar344 * pfVar6[1]) * 0.33333334;
      auVar180._8_4_ = (fVar234 * pfVar8[2] + fVar239 * pfVar6[2]) * 0.33333334;
      auVar180._12_4_ = (fVar236 * pfVar8[3] + fVar221 * pfVar6[3]) * 0.33333334;
      _local_6d0 = vsubps_avx(auVar372,auVar180);
      auVar225 = vsubps_avx(auVar304,auVar216);
      auVar252 = vshufps_avx(auVar225,auVar225,0);
      auVar214 = vshufps_avx(auVar225,auVar225,0x55);
      auVar225 = vshufps_avx(auVar225,auVar225,0xaa);
      fVar338 = (local_5c8->vx).field_0.m128[0];
      fVar220 = (local_5c8->vx).field_0.m128[1];
      fVar344 = (local_5c8->vx).field_0.m128[2];
      fVar239 = (local_5c8->vx).field_0.m128[3];
      fVar221 = (local_5c8->vy).field_0.m128[0];
      fVar233 = (local_5c8->vy).field_0.m128[1];
      fVar234 = (local_5c8->vy).field_0.m128[2];
      fVar236 = (local_5c8->vy).field_0.m128[3];
      fVar246 = (local_5c8->vz).field_0.m128[0];
      fVar258 = (local_5c8->vz).field_0.m128[1];
      fVar261 = (local_5c8->vz).field_0.m128[2];
      fVar264 = (local_5c8->vz).field_0.m128[3];
      auVar224._0_8_ =
           CONCAT44(auVar252._4_4_ * fVar220 + auVar214._4_4_ * fVar233 + fVar258 * auVar225._4_4_,
                    auVar252._0_4_ * fVar338 + auVar214._0_4_ * fVar221 + fVar246 * auVar225._0_4_);
      auVar224._8_4_ =
           auVar252._8_4_ * fVar344 + auVar214._8_4_ * fVar234 + fVar261 * auVar225._8_4_;
      auVar224._12_4_ =
           auVar252._12_4_ * fVar239 + auVar214._12_4_ * fVar236 + fVar264 * auVar225._12_4_;
      auVar252 = vblendps_avx(auVar224,auVar304,8);
      auVar21 = vsubps_avx(auVar351,auVar216);
      auVar214 = vshufps_avx(auVar21,auVar21,0);
      auVar225 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar297._0_4_ = auVar214._0_4_ * fVar338 + auVar225._0_4_ * fVar221 + fVar246 * auVar21._0_4_
      ;
      auVar297._4_4_ = auVar214._4_4_ * fVar220 + auVar225._4_4_ * fVar233 + fVar258 * auVar21._4_4_
      ;
      auVar297._8_4_ = auVar214._8_4_ * fVar344 + auVar225._8_4_ * fVar234 + fVar261 * auVar21._8_4_
      ;
      auVar297._12_4_ =
           auVar214._12_4_ * fVar239 + auVar225._12_4_ * fVar236 + fVar264 * auVar21._12_4_;
      auVar214 = vblendps_avx(auVar297,auVar351,8);
      auVar22 = vsubps_avx(_local_6d0,auVar216);
      auVar225 = vshufps_avx(auVar22,auVar22,0);
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar305._0_4_ = auVar225._0_4_ * fVar338 + auVar21._0_4_ * fVar221 + auVar22._0_4_ * fVar246;
      auVar305._4_4_ = auVar225._4_4_ * fVar220 + auVar21._4_4_ * fVar233 + auVar22._4_4_ * fVar258;
      auVar305._8_4_ = auVar225._8_4_ * fVar344 + auVar21._8_4_ * fVar234 + auVar22._8_4_ * fVar261;
      auVar305._12_4_ =
           auVar225._12_4_ * fVar239 + auVar21._12_4_ * fVar236 + auVar22._12_4_ * fVar264;
      auVar225 = vblendps_avx(auVar305,_local_6d0,8);
      auVar22 = vsubps_avx(auVar372,auVar216);
      auVar216 = vshufps_avx(auVar22,auVar22,0);
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar181._0_4_ = auVar216._0_4_ * fVar338 + auVar21._0_4_ * fVar221 + fVar246 * auVar22._0_4_;
      auVar181._4_4_ = auVar216._4_4_ * fVar220 + auVar21._4_4_ * fVar233 + fVar258 * auVar22._4_4_;
      auVar181._8_4_ = auVar216._8_4_ * fVar344 + auVar21._8_4_ * fVar234 + fVar261 * auVar22._8_4_;
      auVar181._12_4_ =
           auVar216._12_4_ * fVar239 + auVar21._12_4_ * fVar236 + fVar264 * auVar22._12_4_;
      auVar216 = vblendps_avx(auVar181,auVar372,8);
      auVar251._8_4_ = 0x7fffffff;
      auVar251._0_8_ = 0x7fffffff7fffffff;
      auVar251._12_4_ = 0x7fffffff;
      auVar252 = vandps_avx(auVar252,auVar251);
      auVar214 = vandps_avx(auVar214,auVar251);
      auVar21 = vmaxps_avx(auVar252,auVar214);
      auVar252 = vandps_avx(auVar225,auVar251);
      auVar214 = vandps_avx(auVar216,auVar251);
      auVar252 = vmaxps_avx(auVar252,auVar214);
      auVar252 = vmaxps_avx(auVar21,auVar252);
      auVar214 = vmovshdup_avx(auVar252);
      auVar214 = vmaxss_avx(auVar214,auVar252);
      auVar252 = vshufpd_avx(auVar252,auVar252,1);
      auVar252 = vmaxss_avx(auVar252,auVar214);
      fVar276 = *(float *)(bezier_basis0 + lVar20 + 0x908);
      fVar277 = *(float *)(bezier_basis0 + lVar20 + 0x90c);
      fVar310 = *(float *)(bezier_basis0 + lVar20 + 0x910);
      fVar311 = *(float *)(bezier_basis0 + lVar20 + 0x914);
      fVar238 = *(float *)(bezier_basis0 + lVar20 + 0x918);
      fVar278 = *(float *)(bezier_basis0 + lVar20 + 0x91c);
      fVar314 = *(float *)(bezier_basis0 + lVar20 + 0x920);
      auVar214 = vshufps_avx(auVar305,auVar305,0);
      register0x00001250 = auVar214;
      _local_4a0 = auVar214;
      auVar225 = vshufps_avx(auVar305,auVar305,0x55);
      register0x00001310 = auVar225;
      _local_720 = auVar225;
      fVar315 = *(float *)(bezier_basis0 + lVar20 + 0xd8c);
      fVar241 = *(float *)(bezier_basis0 + lVar20 + 0xd90);
      fVar279 = *(float *)(bezier_basis0 + lVar20 + 0xd94);
      fVar245 = *(float *)(bezier_basis0 + lVar20 + 0xd98);
      fStack_650 = *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      fStack_64c = *(float *)(bezier_basis0 + lVar20 + 0xda0);
      fStack_648 = *(float *)(bezier_basis0 + lVar20 + 0xda4);
      fStack_644 = *(float *)(bezier_basis0 + lVar20 + 0xda8);
      auVar216 = vshufps_avx(auVar181,auVar181,0);
      register0x00001210 = auVar216;
      _local_4c0 = auVar216;
      fVar143 = auVar216._0_4_;
      fVar163 = auVar216._4_4_;
      fVar167 = auVar216._8_4_;
      fVar170 = auVar216._12_4_;
      fVar174 = auVar214._0_4_;
      fVar196 = auVar214._4_4_;
      fVar199 = auVar214._8_4_;
      fVar202 = auVar214._12_4_;
      auVar214 = vshufps_avx(auVar181,auVar181,0x55);
      register0x00001250 = auVar214;
      _local_4e0 = auVar214;
      fVar175 = auVar214._0_4_;
      fVar197 = auVar214._4_4_;
      fVar200 = auVar214._8_4_;
      fVar203 = auVar214._12_4_;
      fVar247 = auVar225._0_4_;
      fVar259 = auVar225._4_4_;
      fVar262 = auVar225._8_4_;
      fVar265 = auVar225._12_4_;
      auVar214 = vshufps_avx(_local_6d0,_local_6d0,0xff);
      register0x00001550 = auVar214;
      _local_c0 = auVar214;
      auVar225 = vshufps_avx(auVar372,auVar372,0xff);
      register0x00001590 = auVar225;
      _local_80 = auVar225;
      fVar370 = auVar225._0_4_;
      fVar145 = auVar225._4_4_;
      fVar165 = auVar225._8_4_;
      fVar169 = auVar225._12_4_;
      fVar358 = auVar214._0_4_;
      fVar363 = auVar214._4_4_;
      fVar365 = auVar214._8_4_;
      fVar367 = auVar214._12_4_;
      auVar214 = vshufps_avx(auVar297,auVar297,0);
      register0x000015d0 = auVar214;
      _local_460 = auVar214;
      fVar338 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0x484);
      fVar220 = *(float *)(bezier_basis0 + lVar20 + 0x488);
      fVar344 = *(float *)(bezier_basis0 + lVar20 + 0x48c);
      fVar239 = *(float *)(bezier_basis0 + lVar20 + 0x490);
      fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x494);
      fVar233 = *(float *)(bezier_basis0 + lVar20 + 0x498);
      fVar234 = *(float *)(bezier_basis0 + lVar20 + 0x49c);
      auVar130 = *(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0x484);
      fVar236 = *(float *)(bezier_basis0 + lVar20 + 0x4a0);
      fVar378 = auVar214._0_4_;
      fVar382 = auVar214._4_4_;
      fVar383 = auVar214._8_4_;
      fVar384 = auVar214._12_4_;
      auVar214 = vshufps_avx(auVar297,auVar297,0x55);
      register0x00001210 = auVar214;
      _local_440 = auVar214;
      fVar144 = auVar214._0_4_;
      fVar164 = auVar214._4_4_;
      fVar168 = auVar214._8_4_;
      fVar171 = auVar214._12_4_;
      auVar214 = vshufps_avx(auVar351,auVar351,0xff);
      register0x00001410 = auVar214;
      _local_e0 = auVar214;
      fVar258 = auVar214._0_4_;
      fVar261 = auVar214._4_4_;
      fVar264 = auVar214._8_4_;
      fVar246 = *(float *)(bezier_basis0 + lVar20 + 0x924) + 0.0 + 0.0;
      auVar121._8_4_ = auVar224._8_4_;
      auVar121._0_8_ = auVar224._0_8_;
      auVar121._12_4_ = auVar224._12_4_;
      auVar225 = vshufps_avx(auVar121,auVar121,0);
      register0x00001310 = auVar225;
      _local_700 = auVar225;
      local_1c0 = *(float *)(bezier_basis0 + lVar20);
      fStack_1bc = *(float *)(bezier_basis0 + lVar20 + 4);
      fStack_1b8 = *(float *)(bezier_basis0 + lVar20 + 8);
      fStack_1b4 = *(float *)(bezier_basis0 + lVar20 + 0xc);
      fStack_1b0 = *(float *)(bezier_basis0 + lVar20 + 0x10);
      fStack_1ac = *(float *)(bezier_basis0 + lVar20 + 0x14);
      fStack_1a8 = *(float *)(bezier_basis0 + lVar20 + 0x18);
      fVar248 = auVar225._0_4_;
      fVar260 = auVar225._4_4_;
      fVar263 = auVar225._8_4_;
      fVar266 = auVar225._12_4_;
      auVar320._0_4_ =
           fVar248 * local_1c0 + fVar378 * fVar338 + fVar174 * fVar276 + fVar143 * fVar315;
      auVar320._4_4_ =
           fVar260 * fStack_1bc + fVar382 * fVar220 + fVar196 * fVar277 + fVar163 * fVar241;
      auVar320._8_4_ =
           fVar263 * fStack_1b8 + fVar383 * fVar344 + fVar199 * fVar310 + fVar167 * fVar279;
      auVar320._12_4_ =
           fVar266 * fStack_1b4 + fVar384 * fVar239 + fVar202 * fVar311 + fVar170 * fVar245;
      auVar320._16_4_ =
           fVar248 * fStack_1b0 + fVar378 * fVar221 + fVar174 * fVar238 + fVar143 * fStack_650;
      auVar320._20_4_ =
           fVar260 * fStack_1ac + fVar382 * fVar233 + fVar196 * fVar278 + fVar163 * fStack_64c;
      auVar320._24_4_ =
           fVar263 * fStack_1a8 + fVar383 * fVar234 + fVar199 * fVar314 + fVar167 * fStack_648;
      auVar320._28_4_ = fVar236 + fVar202 + fVar170 + 0.0;
      auVar225 = vshufps_avx(auVar121,auVar121,0x55);
      register0x000014d0 = auVar225;
      _local_1a0 = auVar225;
      fVar336 = auVar225._0_4_;
      fVar342 = auVar225._4_4_;
      fVar345 = auVar225._8_4_;
      fVar347 = auVar225._12_4_;
      auVar352._0_4_ =
           fVar336 * local_1c0 + fVar144 * fVar338 + fVar247 * fVar276 + fVar175 * fVar315;
      auVar352._4_4_ =
           fVar342 * fStack_1bc + fVar164 * fVar220 + fVar259 * fVar277 + fVar197 * fVar241;
      auVar352._8_4_ =
           fVar345 * fStack_1b8 + fVar168 * fVar344 + fVar262 * fVar310 + fVar200 * fVar279;
      auVar352._12_4_ =
           fVar347 * fStack_1b4 + fVar171 * fVar239 + fVar265 * fVar311 + fVar203 * fVar245;
      auVar352._16_4_ =
           fVar336 * fStack_1b0 + fVar144 * fVar221 + fVar247 * fVar238 + fVar175 * fStack_650;
      auVar352._20_4_ =
           fVar342 * fStack_1ac + fVar164 * fVar233 + fVar259 * fVar278 + fVar197 * fStack_64c;
      auVar352._24_4_ =
           fVar345 * fStack_1a8 + fVar168 * fVar234 + fVar262 * fVar314 + fVar200 * fStack_648;
      auVar352._28_4_ = fVar171 + fVar203 + 0.0 + 0.0;
      auVar225 = vpermilps_avx(auVar304,0xff);
      register0x00001490 = auVar225;
      _local_100 = auVar225;
      fStack_1a4 = (float)*(undefined4 *)(bezier_basis0 + lVar20 + 0x1c);
      fVar267 = auVar225._0_4_;
      fVar275 = auVar225._4_4_;
      fVar333 = auVar225._8_4_;
      local_860._0_4_ =
           fVar267 * local_1c0 + fVar258 * fVar338 + fVar358 * fVar276 + fVar370 * fVar315;
      local_860._4_4_ =
           fVar275 * fStack_1bc + fVar261 * fVar220 + fVar363 * fVar277 + fVar145 * fVar241;
      fStack_858 = fVar333 * fStack_1b8 + fVar264 * fVar344 + fVar365 * fVar310 + fVar165 * fVar279;
      fStack_854 = auVar225._12_4_ * fStack_1b4 +
                   auVar214._12_4_ * fVar239 + fVar367 * fVar311 + fVar169 * fVar245;
      fStack_850 = fVar267 * fStack_1b0 +
                   fVar258 * fVar221 + fVar358 * fVar238 + fVar370 * fStack_650;
      fStack_84c = fVar275 * fStack_1ac +
                   fVar261 * fVar233 + fVar363 * fVar278 + fVar145 * fStack_64c;
      fStack_848 = fVar333 * fStack_1a8 +
                   fVar264 * fVar234 + fVar365 * fVar314 + fVar165 * fStack_648;
      fStack_844 = fVar246 + 0.0;
      fVar318 = *(float *)(bezier_basis1 + lVar20 + 0x908);
      fVar243 = *(float *)(bezier_basis1 + lVar20 + 0x90c);
      fVar280 = *(float *)(bezier_basis1 + lVar20 + 0x910);
      fVar173 = *(float *)(bezier_basis1 + lVar20 + 0x914);
      fVar176 = *(float *)(bezier_basis1 + lVar20 + 0x918);
      fVar198 = *(float *)(bezier_basis1 + lVar20 + 0x91c);
      fVar201 = *(float *)(bezier_basis1 + lVar20 + 0x920);
      fVar204 = *(float *)(bezier_basis1 + lVar20 + 0xd8c);
      fVar205 = *(float *)(bezier_basis1 + lVar20 + 0xd90);
      fVar206 = *(float *)(bezier_basis1 + lVar20 + 0xd94);
      fVar146 = *(float *)(bezier_basis1 + lVar20 + 0xd98);
      fVar166 = *(float *)(bezier_basis1 + lVar20 + 0xd9c);
      fVar289 = *(float *)(bezier_basis1 + lVar20 + 0xda0);
      fVar207 = *(float *)(bezier_basis1 + lVar20 + 0xda4);
      fVar290 = *(float *)(bezier_basis1 + lVar20 + 0x484);
      fVar235 = *(float *)(bezier_basis1 + lVar20 + 0x488);
      fVar237 = *(float *)(bezier_basis1 + lVar20 + 0x48c);
      fVar240 = *(float *)(bezier_basis1 + lVar20 + 0x490);
      fVar242 = *(float *)(bezier_basis1 + lVar20 + 0x494);
      fVar244 = *(float *)(bezier_basis1 + lVar20 + 0x498);
      fVar282 = *(float *)(bezier_basis1 + lVar20 + 0x49c);
      fVar220 = fVar367 + fVar246 + 0.0;
      fVar309 = *(float *)(bezier_basis1 + lVar20);
      fVar312 = *(float *)(bezier_basis1 + lVar20 + 4);
      fVar313 = *(float *)(bezier_basis1 + lVar20 + 8);
      fVar316 = *(float *)(bezier_basis1 + lVar20 + 0xc);
      fVar317 = *(float *)(bezier_basis1 + lVar20 + 0x10);
      fVar291 = *(float *)(bezier_basis1 + lVar20 + 0x14);
      fVar299 = *(float *)(bezier_basis1 + lVar20 + 0x18);
      auVar253._0_4_ = fVar248 * fVar309 + fVar378 * fVar290 + fVar318 * fVar174 + fVar204 * fVar143
      ;
      auVar253._4_4_ = fVar260 * fVar312 + fVar382 * fVar235 + fVar243 * fVar196 + fVar205 * fVar163
      ;
      auVar253._8_4_ = fVar263 * fVar313 + fVar383 * fVar237 + fVar280 * fVar199 + fVar206 * fVar167
      ;
      auVar253._12_4_ =
           fVar266 * fVar316 + fVar384 * fVar240 + fVar173 * fVar202 + fVar146 * fVar170;
      auVar253._16_4_ =
           fVar248 * fVar317 + fVar378 * fVar242 + fVar176 * fVar174 + fVar166 * fVar143;
      auVar253._20_4_ =
           fVar260 * fVar291 + fVar382 * fVar244 + fVar198 * fVar196 + fVar289 * fVar163;
      auVar253._24_4_ =
           fVar263 * fVar299 + fVar383 * fVar282 + fVar201 * fVar199 + fVar207 * fVar167;
      auVar253._28_4_ = fVar169 + fVar220;
      auVar226._0_4_ = fVar336 * fVar309 + fVar144 * fVar290 + fVar247 * fVar318 + fVar204 * fVar175
      ;
      auVar226._4_4_ = fVar342 * fVar312 + fVar164 * fVar235 + fVar259 * fVar243 + fVar205 * fVar197
      ;
      auVar226._8_4_ = fVar345 * fVar313 + fVar168 * fVar237 + fVar262 * fVar280 + fVar206 * fVar200
      ;
      auVar226._12_4_ =
           fVar347 * fVar316 + fVar171 * fVar240 + fVar265 * fVar173 + fVar146 * fVar203;
      auVar226._16_4_ =
           fVar336 * fVar317 + fVar144 * fVar242 + fVar247 * fVar176 + fVar166 * fVar175;
      auVar226._20_4_ =
           fVar342 * fVar291 + fVar164 * fVar244 + fVar259 * fVar198 + fVar289 * fVar197;
      auVar226._24_4_ =
           fVar345 * fVar299 + fVar168 * fVar282 + fVar262 * fVar201 + fVar207 * fVar200;
      auVar226._28_4_ = fVar220 + fVar367 + fVar236 + 0.0;
      auVar306._0_4_ = fVar258 * fVar290 + fVar358 * fVar318 + fVar370 * fVar204 + fVar267 * fVar309
      ;
      auVar306._4_4_ = fVar261 * fVar235 + fVar363 * fVar243 + fVar145 * fVar205 + fVar275 * fVar312
      ;
      auVar306._8_4_ = fVar264 * fVar237 + fVar365 * fVar280 + fVar165 * fVar206 + fVar333 * fVar313
      ;
      auVar306._12_4_ =
           auVar214._12_4_ * fVar240 + fVar367 * fVar173 + fVar169 * fVar146 +
           auVar225._12_4_ * fVar316;
      auVar306._16_4_ =
           fVar258 * fVar242 + fVar358 * fVar176 + fVar370 * fVar166 + fVar267 * fVar317;
      auVar306._20_4_ =
           fVar261 * fVar244 + fVar363 * fVar198 + fVar145 * fVar289 + fVar275 * fVar291;
      auVar306._24_4_ =
           fVar264 * fVar282 + fVar365 * fVar201 + fVar165 * fVar207 + fVar333 * fVar299;
      auVar306._28_4_ = fVar367 + fVar265 + fVar236 + fVar220;
      local_200 = vsubps_avx(auVar253,auVar320);
      auVar29 = vsubps_avx(auVar226,auVar352);
      fVar338 = local_200._0_4_;
      fVar344 = local_200._4_4_;
      auVar155._4_4_ = auVar352._4_4_ * fVar344;
      auVar155._0_4_ = auVar352._0_4_ * fVar338;
      fVar221 = local_200._8_4_;
      auVar155._8_4_ = auVar352._8_4_ * fVar221;
      fVar234 = local_200._12_4_;
      auVar155._12_4_ = auVar352._12_4_ * fVar234;
      fVar246 = local_200._16_4_;
      auVar155._16_4_ = auVar352._16_4_ * fVar246;
      fVar261 = local_200._20_4_;
      auVar155._20_4_ = auVar352._20_4_ * fVar261;
      fVar267 = local_200._24_4_;
      auVar155._24_4_ = auVar352._24_4_ * fVar267;
      auVar155._28_4_ = fVar220;
      fVar220 = auVar29._0_4_;
      fVar239 = auVar29._4_4_;
      auVar191._4_4_ = auVar320._4_4_ * fVar239;
      auVar191._0_4_ = auVar320._0_4_ * fVar220;
      fVar233 = auVar29._8_4_;
      auVar191._8_4_ = auVar320._8_4_ * fVar233;
      fVar236 = auVar29._12_4_;
      auVar191._12_4_ = auVar320._12_4_ * fVar236;
      fVar258 = auVar29._16_4_;
      auVar191._16_4_ = auVar320._16_4_ * fVar258;
      fVar264 = auVar29._20_4_;
      auVar191._20_4_ = auVar320._20_4_ * fVar264;
      fVar275 = auVar29._24_4_;
      auVar191._24_4_ = auVar320._24_4_ * fVar275;
      auVar191._28_4_ = auVar226._28_4_;
      auVar191 = vsubps_avx(auVar155,auVar191);
      auVar155 = vmaxps_avx(_local_860,auVar306);
      auVar37._4_4_ = auVar155._4_4_ * auVar155._4_4_ * (fVar344 * fVar344 + fVar239 * fVar239);
      auVar37._0_4_ = auVar155._0_4_ * auVar155._0_4_ * (fVar338 * fVar338 + fVar220 * fVar220);
      auVar37._8_4_ = auVar155._8_4_ * auVar155._8_4_ * (fVar221 * fVar221 + fVar233 * fVar233);
      auVar37._12_4_ = auVar155._12_4_ * auVar155._12_4_ * (fVar234 * fVar234 + fVar236 * fVar236);
      auVar37._16_4_ = auVar155._16_4_ * auVar155._16_4_ * (fVar246 * fVar246 + fVar258 * fVar258);
      auVar37._20_4_ = auVar155._20_4_ * auVar155._20_4_ * (fVar261 * fVar261 + fVar264 * fVar264);
      auVar37._24_4_ = auVar155._24_4_ * auVar155._24_4_ * (fVar267 * fVar267 + fVar275 * fVar275);
      auVar37._28_4_ = auVar29._28_4_ + auVar226._28_4_;
      auVar329._4_4_ = auVar191._4_4_ * auVar191._4_4_;
      auVar329._0_4_ = auVar191._0_4_ * auVar191._0_4_;
      auVar329._8_4_ = auVar191._8_4_ * auVar191._8_4_;
      auVar329._12_4_ = auVar191._12_4_ * auVar191._12_4_;
      auVar329._16_4_ = auVar191._16_4_ * auVar191._16_4_;
      auVar329._20_4_ = auVar191._20_4_ * auVar191._20_4_;
      auVar329._24_4_ = auVar191._24_4_ * auVar191._24_4_;
      auVar329._28_4_ = auVar191._28_4_;
      auVar155 = vcmpps_avx(auVar329,auVar37,2);
      auVar214 = ZEXT416((uint)(float)(int)uVar13);
      _local_480 = auVar214;
      auVar214 = vshufps_avx(auVar214,auVar214,0);
      auVar227._16_16_ = auVar214;
      auVar227._0_16_ = auVar214;
      auVar191 = vcmpps_avx(_DAT_02020f40,auVar227,1);
      auVar232 = ZEXT3264(auVar191);
      auVar122._8_4_ = auVar224._8_4_;
      auVar122._0_8_ = auVar224._0_8_;
      auVar122._12_4_ = auVar224._12_4_;
      auVar214 = vpermilps_avx(auVar122,0xaa);
      register0x00001490 = auVar214;
      _local_120 = auVar214;
      auVar225 = vpermilps_avx(auVar297,0xaa);
      register0x00001550 = auVar225;
      _local_180 = auVar225;
      auVar216 = vpermilps_avx(auVar305,0xaa);
      register0x00001590 = auVar216;
      _local_a0 = auVar216;
      auVar21 = vpermilps_avx(auVar181,0xaa);
      register0x000014d0 = auVar21;
      _local_6a0 = auVar21;
      auVar37 = auVar191 & auVar155;
      local_840 = *(uint *)(ray + k * 4 + 0x30);
      uStack_83c = 0;
      fStack_838 = 0.0;
      fStack_834 = 0.0;
      auVar252 = ZEXT416((uint)(auVar252._0_4_ * 4.7683716e-07));
      _local_680 = auVar252;
      uStack_888 = auVar304._8_8_;
      auVar329 = local_580;
      auVar227 = local_560;
      fVar338 = fVar248;
      fVar220 = fVar260;
      fVar344 = fVar263;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') {
        auVar155 = vandps_avx(auVar155,auVar191);
        fVar326 = auVar214._0_4_;
        fVar332 = auVar214._4_4_;
        fVar334 = auVar214._8_4_;
        fVar335 = auVar214._12_4_;
        fVar359 = auVar225._0_4_;
        fVar364 = auVar225._4_4_;
        fVar366 = auVar225._8_4_;
        fVar368 = auVar225._12_4_;
        fVar371 = auVar216._0_4_;
        fVar375 = auVar216._4_4_;
        fVar376 = auVar216._8_4_;
        fVar377 = auVar216._12_4_;
        fVar337 = auVar21._0_4_;
        fVar343 = auVar21._4_4_;
        fVar346 = auVar21._8_4_;
        fVar348 = auVar21._12_4_;
        fVar239 = auVar191._28_4_ +
                  *(float *)(bezier_basis1 + lVar20 + 0x924) +
                  *(float *)(bezier_basis1 + lVar20 + 0x4a0);
        local_1e0._0_4_ =
             fVar326 * fVar309 + fVar359 * fVar290 + fVar371 * fVar318 + fVar337 * fVar204;
        local_1e0._4_4_ =
             fVar332 * fVar312 + fVar364 * fVar235 + fVar375 * fVar243 + fVar343 * fVar205;
        fStack_1d8 = fVar334 * fVar313 + fVar366 * fVar237 + fVar376 * fVar280 + fVar346 * fVar206;
        fStack_1d4 = fVar335 * fVar316 + fVar368 * fVar240 + fVar377 * fVar173 + fVar348 * fVar146;
        fStack_1d0 = fVar326 * fVar317 + fVar359 * fVar242 + fVar371 * fVar176 + fVar337 * fVar166;
        fStack_1cc = fVar332 * fVar291 + fVar364 * fVar244 + fVar375 * fVar198 + fVar343 * fVar289;
        fStack_1c8 = fVar334 * fVar299 + fVar366 * fVar282 + fVar376 * fVar201 + fVar346 * fVar207;
        fStack_1c4 = auVar155._28_4_ + fVar239;
        local_500._0_4_ = auVar130._0_4_;
        local_500._4_4_ = auVar130._4_4_;
        fStack_4f8 = auVar130._8_4_;
        fStack_4f4 = auVar130._12_4_;
        fStack_4f0 = auVar130._16_4_;
        fStack_4ec = auVar130._20_4_;
        fStack_4e8 = auVar130._24_4_;
        fVar145 = fVar326 * local_1c0 +
                  fVar359 * (float)local_500._0_4_ + fVar371 * fVar276 + fVar337 * fVar315;
        fVar165 = fVar332 * fStack_1bc +
                  fVar364 * (float)local_500._4_4_ + fVar375 * fVar277 + fVar343 * fVar241;
        fVar169 = fVar334 * fStack_1b8 +
                  fVar366 * fStack_4f8 + fVar376 * fVar310 + fVar346 * fVar279;
        fVar172 = fVar335 * fStack_1b4 +
                  fVar368 * fStack_4f4 + fVar377 * fVar311 + fVar348 * fVar245;
        fStack_630 = fVar326 * fStack_1b0 +
                     fVar359 * fStack_4f0 + fVar371 * fVar238 + fVar337 * fStack_650;
        fStack_62c = fVar332 * fStack_1ac +
                     fVar364 * fStack_4ec + fVar375 * fVar278 + fVar343 * fStack_64c;
        fStack_628 = fVar334 * fStack_1a8 +
                     fVar366 * fStack_4e8 + fVar376 * fVar314 + fVar346 * fStack_648;
        fStack_624 = fStack_1c4 + fVar239 + auVar155._28_4_ + auVar191._28_4_;
        fVar239 = *(float *)(bezier_basis0 + lVar20 + 0x1210);
        fVar221 = *(float *)(bezier_basis0 + lVar20 + 0x1214);
        fVar233 = *(float *)(bezier_basis0 + lVar20 + 0x1218);
        fVar234 = *(float *)(bezier_basis0 + lVar20 + 0x121c);
        fVar236 = *(float *)(bezier_basis0 + lVar20 + 0x1220);
        fVar246 = *(float *)(bezier_basis0 + lVar20 + 0x1224);
        fVar258 = *(float *)(bezier_basis0 + lVar20 + 0x1228);
        fVar261 = *(float *)(bezier_basis0 + lVar20 + 0x1694);
        fVar264 = *(float *)(bezier_basis0 + lVar20 + 0x1698);
        fVar267 = *(float *)(bezier_basis0 + lVar20 + 0x169c);
        fVar275 = *(float *)(bezier_basis0 + lVar20 + 0x16a0);
        fVar276 = *(float *)(bezier_basis0 + lVar20 + 0x16a4);
        fVar277 = *(float *)(bezier_basis0 + lVar20 + 0x16a8);
        fVar310 = *(float *)(bezier_basis0 + lVar20 + 0x16ac);
        fVar311 = *(float *)(bezier_basis0 + lVar20 + 0x1b18);
        fVar238 = *(float *)(bezier_basis0 + lVar20 + 0x1b1c);
        fVar278 = *(float *)(bezier_basis0 + lVar20 + 0x1b20);
        fVar314 = *(float *)(bezier_basis0 + lVar20 + 0x1b24);
        fVar315 = *(float *)(bezier_basis0 + lVar20 + 0x1b28);
        fVar241 = *(float *)(bezier_basis0 + lVar20 + 0x1b2c);
        fVar279 = *(float *)(bezier_basis0 + lVar20 + 0x1b30);
        fVar245 = *(float *)(bezier_basis0 + lVar20 + 0x1f9c);
        fVar318 = *(float *)(bezier_basis0 + lVar20 + 0x1fa0);
        fVar243 = *(float *)(bezier_basis0 + lVar20 + 0x1fa4);
        fVar280 = *(float *)(bezier_basis0 + lVar20 + 0x1fa8);
        fVar173 = *(float *)(bezier_basis0 + lVar20 + 0x1fac);
        fVar176 = *(float *)(bezier_basis0 + lVar20 + 0x1fb0);
        fVar198 = *(float *)(bezier_basis0 + lVar20 + 0x1fb4);
        fVar281 = *(float *)(bezier_basis1 + lVar20 + 0x4a0) + 0.0;
        fVar201 = *(float *)(bezier_basis0 + lVar20 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar20 + 0x1fb8);
        fVar325 = auVar352._28_4_ + 0.0 + fVar281;
        auVar185._0_4_ =
             fVar247 * fVar311 + fVar175 * fVar245 + fVar144 * fVar261 + fVar336 * fVar239;
        auVar185._4_4_ =
             fVar259 * fVar238 + fVar197 * fVar318 + fVar164 * fVar264 + fVar342 * fVar221;
        auVar185._8_4_ =
             fVar262 * fVar278 + fVar200 * fVar243 + fVar168 * fVar267 + fVar345 * fVar233;
        auVar185._12_4_ =
             fVar265 * fVar314 + fVar203 * fVar280 + fVar171 * fVar275 + fVar347 * fVar234;
        auVar185._16_4_ =
             fVar247 * fVar315 + fVar175 * fVar173 + fVar144 * fVar276 + fVar336 * fVar236;
        auVar185._20_4_ =
             fVar259 * fVar241 + fVar197 * fVar176 + fVar164 * fVar277 + fVar342 * fVar246;
        auVar185._24_4_ =
             fVar262 * fVar279 + fVar200 * fVar198 + fVar168 * fVar310 + fVar345 * fVar258;
        auVar185._28_4_ = fVar325 + fVar201;
        local_500._4_4_ =
             fVar364 * fVar264 + fVar375 * fVar238 + fVar343 * fVar318 + fVar332 * fVar221;
        local_500._0_4_ =
             fVar359 * fVar261 + fVar371 * fVar311 + fVar337 * fVar245 + fVar326 * fVar239;
        fStack_4f8 = fVar366 * fVar267 + fVar376 * fVar278 + fVar346 * fVar243 + fVar334 * fVar233;
        fStack_4f4 = fVar368 * fVar275 + fVar377 * fVar314 + fVar348 * fVar280 + fVar335 * fVar234;
        fStack_4f0 = fVar359 * fVar276 + fVar371 * fVar315 + fVar337 * fVar173 + fVar326 * fVar236;
        fStack_4ec = fVar364 * fVar277 + fVar375 * fVar241 + fVar343 * fVar176 + fVar332 * fVar246;
        fStack_4e8 = fVar366 * fVar310 + fVar376 * fVar279 + fVar346 * fVar198 + fVar334 * fVar258;
        fStack_4e4 = *(float *)(bezier_basis0 + lVar20 + 0x16b0) + fVar201 +
                     *(float *)(bezier_basis0 + lVar20 + 0x122c);
        fVar201 = *(float *)(bezier_basis1 + lVar20 + 0x1b18);
        fVar204 = *(float *)(bezier_basis1 + lVar20 + 0x1b1c);
        fVar205 = *(float *)(bezier_basis1 + lVar20 + 0x1b20);
        fVar206 = *(float *)(bezier_basis1 + lVar20 + 0x1b24);
        fVar146 = *(float *)(bezier_basis1 + lVar20 + 0x1b28);
        fVar166 = *(float *)(bezier_basis1 + lVar20 + 0x1b2c);
        fVar289 = *(float *)(bezier_basis1 + lVar20 + 0x1b30);
        fVar207 = *(float *)(bezier_basis1 + lVar20 + 0x1f9c);
        fVar290 = *(float *)(bezier_basis1 + lVar20 + 0x1fa0);
        fVar235 = *(float *)(bezier_basis1 + lVar20 + 0x1fa4);
        fVar237 = *(float *)(bezier_basis1 + lVar20 + 0x1fa8);
        fVar240 = *(float *)(bezier_basis1 + lVar20 + 0x1fac);
        fVar242 = *(float *)(bezier_basis1 + lVar20 + 0x1fb0);
        fVar244 = *(float *)(bezier_basis1 + lVar20 + 0x1fb4);
        fVar282 = *(float *)(bezier_basis1 + lVar20 + 0x1694);
        fVar309 = *(float *)(bezier_basis1 + lVar20 + 0x1698);
        fVar312 = *(float *)(bezier_basis1 + lVar20 + 0x169c);
        fVar313 = *(float *)(bezier_basis1 + lVar20 + 0x16a0);
        fVar316 = *(float *)(bezier_basis1 + lVar20 + 0x16a4);
        fVar317 = *(float *)(bezier_basis1 + lVar20 + 0x16a8);
        fVar291 = *(float *)(bezier_basis1 + lVar20 + 0x16ac);
        fVar299 = *(float *)(bezier_basis1 + lVar20 + 0x1210);
        fVar333 = *(float *)(bezier_basis1 + lVar20 + 0x1214);
        fVar358 = *(float *)(bezier_basis1 + lVar20 + 0x1218);
        fVar363 = *(float *)(bezier_basis1 + lVar20 + 0x121c);
        fVar365 = *(float *)(bezier_basis1 + lVar20 + 0x1220);
        fVar367 = *(float *)(bezier_basis1 + lVar20 + 0x1224);
        fVar370 = *(float *)(bezier_basis1 + lVar20 + 0x1228);
        auVar285._0_4_ =
             fVar248 * fVar299 + fVar378 * fVar282 + fVar174 * fVar201 + fVar143 * fVar207;
        auVar285._4_4_ =
             fVar260 * fVar333 + fVar382 * fVar309 + fVar196 * fVar204 + fVar163 * fVar290;
        auVar285._8_4_ =
             fVar263 * fVar358 + fVar383 * fVar312 + fVar199 * fVar205 + fVar167 * fVar235;
        auVar285._12_4_ =
             fVar266 * fVar363 + fVar384 * fVar313 + fVar202 * fVar206 + fVar170 * fVar237;
        auVar285._16_4_ =
             fVar248 * fVar365 + fVar378 * fVar316 + fVar174 * fVar146 + fVar143 * fVar240;
        auVar285._20_4_ =
             fVar260 * fVar367 + fVar382 * fVar317 + fVar196 * fVar166 + fVar163 * fVar242;
        auVar285._24_4_ =
             fVar263 * fVar370 + fVar383 * fVar291 + fVar199 * fVar289 + fVar167 * fVar244;
        auVar285._28_4_ = fVar335 + fVar335 + fVar325 + fVar170;
        auVar321._0_4_ =
             fVar336 * fVar299 + fVar144 * fVar282 + fVar247 * fVar201 + fVar175 * fVar207;
        auVar321._4_4_ =
             fVar342 * fVar333 + fVar164 * fVar309 + fVar259 * fVar204 + fVar197 * fVar290;
        auVar321._8_4_ =
             fVar345 * fVar358 + fVar168 * fVar312 + fVar262 * fVar205 + fVar200 * fVar235;
        auVar321._12_4_ =
             fVar347 * fVar363 + fVar171 * fVar313 + fVar265 * fVar206 + fVar203 * fVar237;
        auVar321._16_4_ =
             fVar336 * fVar365 + fVar144 * fVar316 + fVar247 * fVar146 + fVar175 * fVar240;
        auVar321._20_4_ =
             fVar342 * fVar367 + fVar164 * fVar317 + fVar259 * fVar166 + fVar197 * fVar242;
        auVar321._24_4_ =
             fVar345 * fVar370 + fVar168 * fVar291 + fVar262 * fVar289 + fVar200 * fVar244;
        auVar321._28_4_ = fVar335 + fVar335 + fVar335 + fVar325;
        auVar219._0_4_ =
             fVar326 * fVar299 + fVar359 * fVar282 + fVar371 * fVar201 + fVar207 * fVar337;
        auVar219._4_4_ =
             fVar332 * fVar333 + fVar364 * fVar309 + fVar375 * fVar204 + fVar290 * fVar343;
        auVar219._8_4_ =
             fVar334 * fVar358 + fVar366 * fVar312 + fVar376 * fVar205 + fVar235 * fVar346;
        auVar219._12_4_ =
             fVar335 * fVar363 + fVar368 * fVar313 + fVar377 * fVar206 + fVar237 * fVar348;
        auVar219._16_4_ =
             fVar326 * fVar365 + fVar359 * fVar316 + fVar371 * fVar146 + fVar240 * fVar337;
        auVar219._20_4_ =
             fVar332 * fVar367 + fVar364 * fVar317 + fVar375 * fVar166 + fVar242 * fVar343;
        auVar219._24_4_ =
             fVar334 * fVar370 + fVar366 * fVar291 + fVar376 * fVar289 + fVar244 * fVar346;
        auVar219._28_4_ =
             *(float *)(bezier_basis1 + lVar20 + 0x122c) +
             *(float *)(bezier_basis1 + lVar20 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar20 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar20 + 0x1fb8);
        auVar254._8_4_ = 0x7fffffff;
        auVar254._0_8_ = 0x7fffffff7fffffff;
        auVar254._12_4_ = 0x7fffffff;
        auVar254._16_4_ = 0x7fffffff;
        auVar254._20_4_ = 0x7fffffff;
        auVar254._24_4_ = 0x7fffffff;
        auVar254._28_4_ = 0x7fffffff;
        auVar126._4_4_ =
             fVar260 * fVar221 + fVar382 * fVar264 + fVar196 * fVar238 + fVar163 * fVar318;
        auVar126._0_4_ =
             fVar248 * fVar239 + fVar378 * fVar261 + fVar174 * fVar311 + fVar143 * fVar245;
        auVar126._8_4_ =
             fVar263 * fVar233 + fVar383 * fVar267 + fVar199 * fVar278 + fVar167 * fVar243;
        auVar126._12_4_ =
             fVar266 * fVar234 + fVar384 * fVar275 + fVar202 * fVar314 + fVar170 * fVar280;
        auVar126._16_4_ =
             fVar248 * fVar236 + fVar378 * fVar276 + fVar174 * fVar315 + fVar143 * fVar173;
        auVar126._20_4_ =
             fVar260 * fVar246 + fVar382 * fVar277 + fVar196 * fVar241 + fVar163 * fVar176;
        auVar126._24_4_ =
             fVar263 * fVar258 + fVar383 * fVar310 + fVar199 * fVar279 + fVar167 * fVar198;
        auVar126._28_4_ =
             *(float *)(bezier_basis0 + lVar20 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar20 + 0x1fb8) + fVar281;
        auVar191 = vandps_avx(auVar126,auVar254);
        auVar37 = vandps_avx(auVar185,auVar254);
        auVar37 = vmaxps_avx(auVar191,auVar37);
        auVar191 = vandps_avx(auVar254,_local_500);
        auVar191 = vmaxps_avx(auVar37,auVar191);
        auVar252 = vpermilps_avx(auVar252,0);
        auVar269._16_16_ = auVar252;
        auVar269._0_16_ = auVar252;
        auVar191 = vcmpps_avx(auVar191,auVar269,1);
        auVar329 = vblendvps_avx(auVar126,local_200,auVar191);
        auVar227 = vblendvps_avx(auVar185,auVar29,auVar191);
        auVar191 = vandps_avx(auVar285,auVar254);
        auVar37 = vandps_avx(auVar321,auVar254);
        auVar32 = vmaxps_avx(auVar191,auVar37);
        auVar191 = vandps_avx(auVar219,auVar254);
        auVar191 = vmaxps_avx(auVar32,auVar191);
        auVar32 = vcmpps_avx(auVar191,auVar269,1);
        auVar191 = vblendvps_avx(auVar285,local_200,auVar32);
        auVar29 = vblendvps_avx(auVar321,auVar29,auVar32);
        fVar201 = auVar329._0_4_;
        fVar204 = auVar329._4_4_;
        fVar205 = auVar329._8_4_;
        fVar206 = auVar329._12_4_;
        fVar146 = auVar329._16_4_;
        fVar166 = auVar329._20_4_;
        fVar289 = auVar329._24_4_;
        fVar282 = -auVar329._28_4_;
        fVar207 = auVar191._0_4_;
        fVar290 = auVar191._4_4_;
        fVar235 = auVar191._8_4_;
        fVar237 = auVar191._12_4_;
        fVar240 = auVar191._16_4_;
        fVar242 = auVar191._20_4_;
        fVar244 = auVar191._24_4_;
        fVar239 = auVar227._0_4_;
        fVar236 = auVar227._4_4_;
        fVar264 = auVar227._8_4_;
        fVar277 = auVar227._12_4_;
        fVar278 = auVar227._16_4_;
        fVar279 = auVar227._20_4_;
        fVar280 = auVar227._24_4_;
        auVar152._0_4_ = fVar239 * fVar239 + fVar201 * fVar201;
        auVar152._4_4_ = fVar236 * fVar236 + fVar204 * fVar204;
        auVar152._8_4_ = fVar264 * fVar264 + fVar205 * fVar205;
        auVar152._12_4_ = fVar277 * fVar277 + fVar206 * fVar206;
        auVar152._16_4_ = fVar278 * fVar278 + fVar146 * fVar146;
        auVar152._20_4_ = fVar279 * fVar279 + fVar166 * fVar166;
        auVar152._24_4_ = fVar280 * fVar280 + fVar289 * fVar289;
        auVar152._28_4_ = auVar321._28_4_ + auVar329._28_4_;
        auVar329 = vrsqrtps_avx(auVar152);
        fVar221 = auVar329._0_4_;
        fVar233 = auVar329._4_4_;
        auVar32._4_4_ = fVar233 * 1.5;
        auVar32._0_4_ = fVar221 * 1.5;
        fVar234 = auVar329._8_4_;
        auVar32._8_4_ = fVar234 * 1.5;
        fVar246 = auVar329._12_4_;
        auVar32._12_4_ = fVar246 * 1.5;
        fVar258 = auVar329._16_4_;
        auVar32._16_4_ = fVar258 * 1.5;
        fVar261 = auVar329._20_4_;
        auVar32._20_4_ = fVar261 * 1.5;
        fVar267 = auVar329._24_4_;
        fStack_644 = auVar37._28_4_;
        auVar32._24_4_ = fVar267 * 1.5;
        auVar32._28_4_ = fStack_644;
        auVar33._4_4_ = fVar233 * fVar233 * fVar233 * auVar152._4_4_ * 0.5;
        auVar33._0_4_ = fVar221 * fVar221 * fVar221 * auVar152._0_4_ * 0.5;
        auVar33._8_4_ = fVar234 * fVar234 * fVar234 * auVar152._8_4_ * 0.5;
        auVar33._12_4_ = fVar246 * fVar246 * fVar246 * auVar152._12_4_ * 0.5;
        auVar33._16_4_ = fVar258 * fVar258 * fVar258 * auVar152._16_4_ * 0.5;
        auVar33._20_4_ = fVar261 * fVar261 * fVar261 * auVar152._20_4_ * 0.5;
        auVar33._24_4_ = fVar267 * fVar267 * fVar267 * auVar152._24_4_ * 0.5;
        auVar33._28_4_ = auVar152._28_4_;
        auVar37 = vsubps_avx(auVar32,auVar33);
        fVar221 = auVar37._0_4_;
        fVar246 = auVar37._4_4_;
        fVar267 = auVar37._8_4_;
        fVar310 = auVar37._12_4_;
        fVar314 = auVar37._16_4_;
        fVar245 = auVar37._20_4_;
        fVar173 = auVar37._24_4_;
        fVar233 = auVar29._0_4_;
        fVar258 = auVar29._4_4_;
        fVar275 = auVar29._8_4_;
        fVar311 = auVar29._12_4_;
        fVar315 = auVar29._16_4_;
        fVar318 = auVar29._20_4_;
        fVar176 = auVar29._24_4_;
        auVar153._0_4_ = fVar233 * fVar233 + fVar207 * fVar207;
        auVar153._4_4_ = fVar258 * fVar258 + fVar290 * fVar290;
        auVar153._8_4_ = fVar275 * fVar275 + fVar235 * fVar235;
        auVar153._12_4_ = fVar311 * fVar311 + fVar237 * fVar237;
        auVar153._16_4_ = fVar315 * fVar315 + fVar240 * fVar240;
        auVar153._20_4_ = fVar318 * fVar318 + fVar242 * fVar242;
        auVar153._24_4_ = fVar176 * fVar176 + fVar244 * fVar244;
        auVar153._28_4_ = auVar191._28_4_ + auVar37._28_4_;
        auVar191 = vrsqrtps_avx(auVar153);
        fVar234 = auVar191._0_4_;
        fVar261 = auVar191._4_4_;
        auVar34._4_4_ = fVar261 * 1.5;
        auVar34._0_4_ = fVar234 * 1.5;
        fVar276 = auVar191._8_4_;
        auVar34._8_4_ = fVar276 * 1.5;
        fVar238 = auVar191._12_4_;
        auVar34._12_4_ = fVar238 * 1.5;
        fVar241 = auVar191._16_4_;
        auVar34._16_4_ = fVar241 * 1.5;
        fVar243 = auVar191._20_4_;
        auVar34._20_4_ = fVar243 * 1.5;
        fVar198 = auVar191._24_4_;
        auVar34._24_4_ = fVar198 * 1.5;
        auVar34._28_4_ = fStack_644;
        auVar35._4_4_ = fVar261 * fVar261 * fVar261 * auVar153._4_4_ * 0.5;
        auVar35._0_4_ = fVar234 * fVar234 * fVar234 * auVar153._0_4_ * 0.5;
        auVar35._8_4_ = fVar276 * fVar276 * fVar276 * auVar153._8_4_ * 0.5;
        auVar35._12_4_ = fVar238 * fVar238 * fVar238 * auVar153._12_4_ * 0.5;
        auVar35._16_4_ = fVar241 * fVar241 * fVar241 * auVar153._16_4_ * 0.5;
        auVar35._20_4_ = fVar243 * fVar243 * fVar243 * auVar153._20_4_ * 0.5;
        auVar35._24_4_ = fVar198 * fVar198 * fVar198 * auVar153._24_4_ * 0.5;
        auVar35._28_4_ = auVar153._28_4_;
        auVar191 = vsubps_avx(auVar34,auVar35);
        fVar234 = auVar191._0_4_;
        fVar261 = auVar191._4_4_;
        fVar276 = auVar191._8_4_;
        fVar238 = auVar191._12_4_;
        fVar241 = auVar191._16_4_;
        fVar243 = auVar191._20_4_;
        fVar198 = auVar191._24_4_;
        local_660 = (float)local_860._0_4_ * fVar239 * fVar221;
        fStack_65c = (float)local_860._4_4_ * fVar236 * fVar246;
        auVar36._4_4_ = fStack_65c;
        auVar36._0_4_ = local_660;
        fStack_658 = fStack_858 * fVar264 * fVar267;
        auVar36._8_4_ = fStack_658;
        fStack_654 = fStack_854 * fVar277 * fVar310;
        auVar36._12_4_ = fStack_654;
        fStack_650 = fStack_850 * fVar278 * fVar314;
        auVar36._16_4_ = fStack_650;
        fStack_64c = fStack_84c * fVar279 * fVar245;
        auVar36._20_4_ = fStack_64c;
        fStack_648 = fStack_848 * fVar280 * fVar173;
        auVar36._24_4_ = fStack_648;
        auVar36._28_4_ = fStack_644;
        local_660 = local_660 + auVar320._0_4_;
        fStack_65c = fStack_65c + auVar320._4_4_;
        fStack_658 = fStack_658 + auVar320._8_4_;
        fStack_654 = fStack_654 + auVar320._12_4_;
        fStack_650 = fStack_650 + auVar320._16_4_;
        fStack_64c = fStack_64c + auVar320._20_4_;
        fStack_648 = fStack_648 + auVar320._24_4_;
        fStack_644 = fStack_644 + auVar320._28_4_;
        fVar239 = (float)local_860._0_4_ * fVar221 * -fVar201;
        fVar236 = (float)local_860._4_4_ * fVar246 * -fVar204;
        auVar30._4_4_ = fVar236;
        auVar30._0_4_ = fVar239;
        fVar264 = fStack_858 * fVar267 * -fVar205;
        auVar30._8_4_ = fVar264;
        fVar277 = fStack_854 * fVar310 * -fVar206;
        auVar30._12_4_ = fVar277;
        fVar278 = fStack_850 * fVar314 * -fVar146;
        auVar30._16_4_ = fVar278;
        fVar279 = fStack_84c * fVar245 * -fVar166;
        auVar30._20_4_ = fVar279;
        fVar280 = fStack_848 * fVar173 * -fVar289;
        auVar30._24_4_ = fVar280;
        auVar30._28_4_ = fVar282;
        local_5a0._4_4_ = auVar352._4_4_ + fVar236;
        local_5a0._0_4_ = auVar352._0_4_ + fVar239;
        fStack_598 = auVar352._8_4_ + fVar264;
        fStack_594 = auVar352._12_4_ + fVar277;
        fStack_590 = auVar352._16_4_ + fVar278;
        fStack_58c = auVar352._20_4_ + fVar279;
        fStack_588 = auVar352._24_4_ + fVar280;
        fStack_584 = auVar352._28_4_ + fVar282;
        fVar239 = fVar221 * 0.0 * (float)local_860._0_4_;
        fVar221 = fVar246 * 0.0 * (float)local_860._4_4_;
        auVar31._4_4_ = fVar221;
        auVar31._0_4_ = fVar239;
        fVar236 = fVar267 * 0.0 * fStack_858;
        auVar31._8_4_ = fVar236;
        fVar246 = fVar310 * 0.0 * fStack_854;
        auVar31._12_4_ = fVar246;
        fVar264 = fVar314 * 0.0 * fStack_850;
        auVar31._16_4_ = fVar264;
        fVar267 = fVar245 * 0.0 * fStack_84c;
        auVar31._20_4_ = fVar267;
        fVar277 = fVar173 * 0.0 * fStack_848;
        auVar31._24_4_ = fVar277;
        auVar31._28_4_ = fVar368;
        auVar128._4_4_ = fVar165;
        auVar128._0_4_ = fVar145;
        auVar128._8_4_ = fVar169;
        auVar128._12_4_ = fVar172;
        auVar128._16_4_ = fStack_630;
        auVar128._20_4_ = fStack_62c;
        auVar128._24_4_ = fStack_628;
        auVar128._28_4_ = fStack_624;
        auVar286._0_4_ = fVar145 + fVar239;
        auVar286._4_4_ = fVar165 + fVar221;
        auVar286._8_4_ = fVar169 + fVar236;
        auVar286._12_4_ = fVar172 + fVar246;
        auVar286._16_4_ = fStack_630 + fVar264;
        auVar286._20_4_ = fStack_62c + fVar267;
        auVar286._24_4_ = fStack_628 + fVar277;
        auVar286._28_4_ = fStack_624 + fVar368;
        fVar239 = auVar306._0_4_ * fVar233 * fVar234;
        fVar221 = auVar306._4_4_ * fVar258 * fVar261;
        auVar38._4_4_ = fVar221;
        auVar38._0_4_ = fVar239;
        fVar233 = auVar306._8_4_ * fVar275 * fVar276;
        auVar38._8_4_ = fVar233;
        fVar236 = auVar306._12_4_ * fVar311 * fVar238;
        auVar38._12_4_ = fVar236;
        fVar246 = auVar306._16_4_ * fVar315 * fVar241;
        auVar38._16_4_ = fVar246;
        fVar258 = auVar306._20_4_ * fVar318 * fVar243;
        auVar38._20_4_ = fVar258;
        fVar264 = auVar306._24_4_ * fVar176 * fVar198;
        auVar38._24_4_ = fVar264;
        auVar38._28_4_ = auVar29._28_4_;
        auVar32 = vsubps_avx(auVar320,auVar36);
        auVar328._0_4_ = auVar253._0_4_ + fVar239;
        auVar328._4_4_ = auVar253._4_4_ + fVar221;
        auVar328._8_4_ = auVar253._8_4_ + fVar233;
        auVar328._12_4_ = auVar253._12_4_ + fVar236;
        auVar328._16_4_ = auVar253._16_4_ + fVar246;
        auVar328._20_4_ = auVar253._20_4_ + fVar258;
        auVar328._24_4_ = auVar253._24_4_ + fVar264;
        auVar328._28_4_ = auVar253._28_4_ + auVar29._28_4_;
        fVar239 = auVar306._0_4_ * fVar234 * -fVar207;
        fVar221 = auVar306._4_4_ * fVar261 * -fVar290;
        auVar29._4_4_ = fVar221;
        auVar29._0_4_ = fVar239;
        fVar233 = auVar306._8_4_ * fVar276 * -fVar235;
        auVar29._8_4_ = fVar233;
        fVar236 = auVar306._12_4_ * fVar238 * -fVar237;
        auVar29._12_4_ = fVar236;
        fVar246 = auVar306._16_4_ * fVar241 * -fVar240;
        auVar29._16_4_ = fVar246;
        fVar258 = auVar306._20_4_ * fVar243 * -fVar242;
        auVar29._20_4_ = fVar258;
        fVar264 = auVar306._24_4_ * fVar198 * -fVar244;
        auVar29._24_4_ = fVar264;
        auVar29._28_4_ = fVar377;
        auVar34 = vsubps_avx(auVar352,auVar30);
        auVar340._0_4_ = fVar239 + auVar226._0_4_;
        auVar340._4_4_ = fVar221 + auVar226._4_4_;
        auVar340._8_4_ = fVar233 + auVar226._8_4_;
        auVar340._12_4_ = fVar236 + auVar226._12_4_;
        auVar340._16_4_ = fVar246 + auVar226._16_4_;
        auVar340._20_4_ = fVar258 + auVar226._20_4_;
        auVar340._24_4_ = fVar264 + auVar226._24_4_;
        auVar340._28_4_ = fVar377 + auVar226._28_4_;
        fVar239 = fVar234 * 0.0 * auVar306._0_4_;
        fVar221 = fVar261 * 0.0 * auVar306._4_4_;
        auVar39._4_4_ = fVar221;
        auVar39._0_4_ = fVar239;
        fVar233 = fVar276 * 0.0 * auVar306._8_4_;
        auVar39._8_4_ = fVar233;
        fVar234 = fVar238 * 0.0 * auVar306._12_4_;
        auVar39._12_4_ = fVar234;
        fVar236 = fVar241 * 0.0 * auVar306._16_4_;
        auVar39._16_4_ = fVar236;
        fVar246 = fVar243 * 0.0 * auVar306._20_4_;
        auVar39._20_4_ = fVar246;
        fVar258 = fVar198 * 0.0 * auVar306._24_4_;
        auVar39._24_4_ = fVar258;
        auVar39._28_4_ = fVar282;
        auVar35 = vsubps_avx(auVar128,auVar31);
        auVar379._0_4_ = (float)local_1e0._0_4_ + fVar239;
        auVar379._4_4_ = (float)local_1e0._4_4_ + fVar221;
        auVar379._8_4_ = fStack_1d8 + fVar233;
        auVar379._12_4_ = fStack_1d4 + fVar234;
        auVar379._16_4_ = fStack_1d0 + fVar236;
        auVar379._20_4_ = fStack_1cc + fVar246;
        auVar379._24_4_ = fStack_1c8 + fVar258;
        auVar379._28_4_ = fStack_1c4 + fVar282;
        auVar191 = vsubps_avx(auVar253,auVar38);
        auVar29 = vsubps_avx(auVar226,auVar29);
        auVar37 = vsubps_avx(_local_1e0,auVar39);
        auVar329 = vsubps_avx(auVar340,auVar34);
        auVar227 = vsubps_avx(auVar379,auVar35);
        auVar40._4_4_ = auVar35._4_4_ * auVar329._4_4_;
        auVar40._0_4_ = auVar35._0_4_ * auVar329._0_4_;
        auVar40._8_4_ = auVar35._8_4_ * auVar329._8_4_;
        auVar40._12_4_ = auVar35._12_4_ * auVar329._12_4_;
        auVar40._16_4_ = auVar35._16_4_ * auVar329._16_4_;
        auVar40._20_4_ = auVar35._20_4_ * auVar329._20_4_;
        auVar40._24_4_ = auVar35._24_4_ * auVar329._24_4_;
        auVar40._28_4_ = fVar377;
        auVar41._4_4_ = auVar34._4_4_ * auVar227._4_4_;
        auVar41._0_4_ = auVar34._0_4_ * auVar227._0_4_;
        auVar41._8_4_ = auVar34._8_4_ * auVar227._8_4_;
        auVar41._12_4_ = auVar34._12_4_ * auVar227._12_4_;
        auVar41._16_4_ = auVar34._16_4_ * auVar227._16_4_;
        auVar41._20_4_ = auVar34._20_4_ * auVar227._20_4_;
        auVar41._24_4_ = auVar34._24_4_ * auVar227._24_4_;
        auVar41._28_4_ = auVar226._28_4_;
        auVar320 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar32._4_4_ * auVar227._4_4_;
        auVar42._0_4_ = auVar32._0_4_ * auVar227._0_4_;
        auVar42._8_4_ = auVar32._8_4_ * auVar227._8_4_;
        auVar42._12_4_ = auVar32._12_4_ * auVar227._12_4_;
        auVar42._16_4_ = auVar32._16_4_ * auVar227._16_4_;
        auVar42._20_4_ = auVar32._20_4_ * auVar227._20_4_;
        auVar42._24_4_ = auVar32._24_4_ * auVar227._24_4_;
        auVar42._28_4_ = auVar227._28_4_;
        auVar352 = vsubps_avx(auVar328,auVar32);
        auVar43._4_4_ = auVar35._4_4_ * auVar352._4_4_;
        auVar43._0_4_ = auVar35._0_4_ * auVar352._0_4_;
        auVar43._8_4_ = auVar35._8_4_ * auVar352._8_4_;
        auVar43._12_4_ = auVar35._12_4_ * auVar352._12_4_;
        auVar43._16_4_ = auVar35._16_4_ * auVar352._16_4_;
        auVar43._20_4_ = auVar35._20_4_ * auVar352._20_4_;
        auVar43._24_4_ = auVar35._24_4_ * auVar352._24_4_;
        auVar43._28_4_ = auVar253._28_4_;
        auVar33 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar352._4_4_ * auVar34._4_4_;
        auVar44._0_4_ = auVar352._0_4_ * auVar34._0_4_;
        auVar44._8_4_ = auVar352._8_4_ * auVar34._8_4_;
        auVar44._12_4_ = auVar352._12_4_ * auVar34._12_4_;
        auVar44._16_4_ = auVar352._16_4_ * auVar34._16_4_;
        auVar44._20_4_ = auVar352._20_4_ * auVar34._20_4_;
        auVar44._24_4_ = auVar352._24_4_ * auVar34._24_4_;
        auVar44._28_4_ = auVar227._28_4_;
        auVar45._4_4_ = auVar32._4_4_ * auVar329._4_4_;
        auVar45._0_4_ = auVar32._0_4_ * auVar329._0_4_;
        auVar45._8_4_ = auVar32._8_4_ * auVar329._8_4_;
        auVar45._12_4_ = auVar32._12_4_ * auVar329._12_4_;
        auVar45._16_4_ = auVar32._16_4_ * auVar329._16_4_;
        auVar45._20_4_ = auVar32._20_4_ * auVar329._20_4_;
        auVar45._24_4_ = auVar32._24_4_ * auVar329._24_4_;
        auVar45._28_4_ = auVar329._28_4_;
        auVar329 = vsubps_avx(auVar45,auVar44);
        auVar154._0_4_ = auVar320._0_4_ * 0.0 + auVar329._0_4_ + auVar33._0_4_ * 0.0;
        auVar154._4_4_ = auVar320._4_4_ * 0.0 + auVar329._4_4_ + auVar33._4_4_ * 0.0;
        auVar154._8_4_ = auVar320._8_4_ * 0.0 + auVar329._8_4_ + auVar33._8_4_ * 0.0;
        auVar154._12_4_ = auVar320._12_4_ * 0.0 + auVar329._12_4_ + auVar33._12_4_ * 0.0;
        auVar154._16_4_ = auVar320._16_4_ * 0.0 + auVar329._16_4_ + auVar33._16_4_ * 0.0;
        auVar154._20_4_ = auVar320._20_4_ * 0.0 + auVar329._20_4_ + auVar33._20_4_ * 0.0;
        auVar154._24_4_ = auVar320._24_4_ * 0.0 + auVar329._24_4_ + auVar33._24_4_ * 0.0;
        auVar154._28_4_ = auVar329._28_4_ + auVar329._28_4_ + auVar33._28_4_;
        auVar33 = vcmpps_avx(auVar154,ZEXT432(0) << 0x20,2);
        auVar127._4_4_ = fStack_65c;
        auVar127._0_4_ = local_660;
        auVar127._8_4_ = fStack_658;
        auVar127._12_4_ = fStack_654;
        auVar127._16_4_ = fStack_650;
        auVar127._20_4_ = fStack_64c;
        auVar127._24_4_ = fStack_648;
        auVar127._28_4_ = fStack_644;
        auVar191 = vblendvps_avx(auVar191,auVar127,auVar33);
        auVar29 = vblendvps_avx(auVar29,_local_5a0,auVar33);
        auVar37 = vblendvps_avx(auVar37,auVar286,auVar33);
        auVar329 = vblendvps_avx(auVar32,auVar328,auVar33);
        auVar227 = vblendvps_avx(auVar34,auVar340,auVar33);
        auVar320 = vblendvps_avx(auVar35,auVar379,auVar33);
        auVar352 = vblendvps_avx(auVar328,auVar32,auVar33);
        auVar32 = vblendvps_avx(auVar340,auVar34,auVar33);
        _local_7c0 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auStack_7b0 = auVar155._16_16_;
        auVar155 = vblendvps_avx(auVar379,auVar35,auVar33);
        auVar352 = vsubps_avx(auVar352,auVar191);
        auVar34 = vsubps_avx(auVar32,auVar29);
        auVar35 = vsubps_avx(auVar155,auVar37);
        auVar155 = vsubps_avx(auVar29,auVar227);
        fVar239 = auVar34._0_4_;
        fVar207 = auVar37._0_4_;
        fVar246 = auVar34._4_4_;
        fVar290 = auVar37._4_4_;
        auVar46._4_4_ = fVar290 * fVar246;
        auVar46._0_4_ = fVar207 * fVar239;
        fVar275 = auVar34._8_4_;
        fVar235 = auVar37._8_4_;
        auVar46._8_4_ = fVar235 * fVar275;
        fVar238 = auVar34._12_4_;
        fVar237 = auVar37._12_4_;
        auVar46._12_4_ = fVar237 * fVar238;
        fVar279 = auVar34._16_4_;
        fVar240 = auVar37._16_4_;
        auVar46._16_4_ = fVar240 * fVar279;
        fVar173 = auVar34._20_4_;
        fVar242 = auVar37._20_4_;
        auVar46._20_4_ = fVar242 * fVar173;
        fVar205 = auVar34._24_4_;
        fVar244 = auVar37._24_4_;
        auVar46._24_4_ = fVar244 * fVar205;
        auVar46._28_4_ = auVar32._28_4_;
        fVar221 = auVar29._0_4_;
        fVar299 = auVar35._0_4_;
        fVar258 = auVar29._4_4_;
        fVar143 = auVar35._4_4_;
        auVar47._4_4_ = fVar143 * fVar258;
        auVar47._0_4_ = fVar299 * fVar221;
        fVar276 = auVar29._8_4_;
        fVar144 = auVar35._8_4_;
        auVar47._8_4_ = fVar144 * fVar276;
        fVar278 = auVar29._12_4_;
        fVar163 = auVar35._12_4_;
        auVar47._12_4_ = fVar163 * fVar278;
        fVar245 = auVar29._16_4_;
        fVar164 = auVar35._16_4_;
        auVar47._16_4_ = fVar164 * fVar245;
        fVar176 = auVar29._20_4_;
        fVar167 = auVar35._20_4_;
        auVar47._20_4_ = fVar167 * fVar176;
        fVar206 = auVar29._24_4_;
        fVar168 = auVar35._24_4_;
        auVar47._24_4_ = fVar168 * fVar206;
        auVar47._28_4_ = auVar340._28_4_;
        auVar32 = vsubps_avx(auVar47,auVar46);
        fVar233 = auVar191._0_4_;
        fVar261 = auVar191._4_4_;
        auVar48._4_4_ = fVar143 * fVar261;
        auVar48._0_4_ = fVar299 * fVar233;
        fVar277 = auVar191._8_4_;
        auVar48._8_4_ = fVar144 * fVar277;
        fVar314 = auVar191._12_4_;
        auVar48._12_4_ = fVar163 * fVar314;
        fVar318 = auVar191._16_4_;
        auVar48._16_4_ = fVar164 * fVar318;
        fVar198 = auVar191._20_4_;
        auVar48._20_4_ = fVar167 * fVar198;
        fVar146 = auVar191._24_4_;
        auVar48._24_4_ = fVar168 * fVar146;
        auVar48._28_4_ = auVar340._28_4_;
        fVar234 = auVar352._0_4_;
        auVar373._0_4_ = fVar207 * fVar234;
        fVar264 = auVar352._4_4_;
        auVar373._4_4_ = fVar290 * fVar264;
        fVar310 = auVar352._8_4_;
        auVar373._8_4_ = fVar235 * fVar310;
        fVar315 = auVar352._12_4_;
        auVar373._12_4_ = fVar237 * fVar315;
        fVar243 = auVar352._16_4_;
        auVar373._16_4_ = fVar240 * fVar243;
        fVar201 = auVar352._20_4_;
        auVar373._20_4_ = fVar242 * fVar201;
        fVar166 = auVar352._24_4_;
        auVar373._24_4_ = fVar244 * fVar166;
        auVar373._28_4_ = 0;
        auVar36 = vsubps_avx(auVar373,auVar48);
        auVar49._4_4_ = fVar258 * fVar264;
        auVar49._0_4_ = fVar221 * fVar234;
        auVar49._8_4_ = fVar276 * fVar310;
        auVar49._12_4_ = fVar278 * fVar315;
        auVar49._16_4_ = fVar245 * fVar243;
        auVar49._20_4_ = fVar176 * fVar201;
        auVar49._24_4_ = fVar206 * fVar166;
        auVar49._28_4_ = auVar340._28_4_;
        auVar50._4_4_ = fVar261 * fVar246;
        auVar50._0_4_ = fVar233 * fVar239;
        auVar50._8_4_ = fVar277 * fVar275;
        auVar50._12_4_ = fVar314 * fVar238;
        auVar50._16_4_ = fVar318 * fVar279;
        auVar50._20_4_ = fVar198 * fVar173;
        auVar50._24_4_ = fVar146 * fVar205;
        auVar50._28_4_ = auVar379._28_4_;
        auVar30 = vsubps_avx(auVar50,auVar49);
        auVar31 = vsubps_avx(auVar37,auVar320);
        fVar236 = auVar30._28_4_ + auVar36._28_4_;
        auVar186._0_4_ = auVar30._0_4_ + auVar36._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
        auVar186._4_4_ = auVar30._4_4_ + auVar36._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
        auVar186._8_4_ = auVar30._8_4_ + auVar36._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
        auVar186._12_4_ = auVar30._12_4_ + auVar36._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
        auVar186._16_4_ = auVar30._16_4_ + auVar36._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
        auVar186._20_4_ = auVar30._20_4_ + auVar36._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
        auVar186._24_4_ = auVar30._24_4_ + auVar36._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
        auVar186._28_4_ = fVar236 + auVar32._28_4_;
        fVar282 = auVar155._0_4_;
        fVar309 = auVar155._4_4_;
        auVar51._4_4_ = fVar309 * auVar320._4_4_;
        auVar51._0_4_ = fVar282 * auVar320._0_4_;
        fVar312 = auVar155._8_4_;
        auVar51._8_4_ = fVar312 * auVar320._8_4_;
        fVar313 = auVar155._12_4_;
        auVar51._12_4_ = fVar313 * auVar320._12_4_;
        fVar316 = auVar155._16_4_;
        auVar51._16_4_ = fVar316 * auVar320._16_4_;
        fVar317 = auVar155._20_4_;
        auVar51._20_4_ = fVar317 * auVar320._20_4_;
        fVar291 = auVar155._24_4_;
        auVar51._24_4_ = fVar291 * auVar320._24_4_;
        auVar51._28_4_ = fVar236;
        fVar236 = auVar31._0_4_;
        fVar267 = auVar31._4_4_;
        auVar52._4_4_ = auVar227._4_4_ * fVar267;
        auVar52._0_4_ = auVar227._0_4_ * fVar236;
        fVar311 = auVar31._8_4_;
        auVar52._8_4_ = auVar227._8_4_ * fVar311;
        fVar241 = auVar31._12_4_;
        auVar52._12_4_ = auVar227._12_4_ * fVar241;
        fVar280 = auVar31._16_4_;
        auVar52._16_4_ = auVar227._16_4_ * fVar280;
        fVar204 = auVar31._20_4_;
        auVar52._20_4_ = auVar227._20_4_ * fVar204;
        fVar289 = auVar31._24_4_;
        auVar52._24_4_ = auVar227._24_4_ * fVar289;
        auVar52._28_4_ = auVar30._28_4_;
        auVar155 = vsubps_avx(auVar52,auVar51);
        auVar36 = vsubps_avx(auVar191,auVar329);
        fVar170 = auVar36._0_4_;
        fVar171 = auVar36._4_4_;
        auVar53._4_4_ = fVar171 * auVar320._4_4_;
        auVar53._0_4_ = fVar170 * auVar320._0_4_;
        fVar174 = auVar36._8_4_;
        auVar53._8_4_ = fVar174 * auVar320._8_4_;
        fVar175 = auVar36._12_4_;
        auVar53._12_4_ = fVar175 * auVar320._12_4_;
        fVar196 = auVar36._16_4_;
        auVar53._16_4_ = fVar196 * auVar320._16_4_;
        fVar197 = auVar36._20_4_;
        auVar53._20_4_ = fVar197 * auVar320._20_4_;
        fVar199 = auVar36._24_4_;
        auVar53._24_4_ = fVar199 * auVar320._24_4_;
        auVar53._28_4_ = auVar320._28_4_;
        auVar54._4_4_ = auVar329._4_4_ * fVar267;
        auVar54._0_4_ = auVar329._0_4_ * fVar236;
        auVar54._8_4_ = auVar329._8_4_ * fVar311;
        auVar54._12_4_ = auVar329._12_4_ * fVar241;
        auVar54._16_4_ = auVar329._16_4_ * fVar280;
        auVar54._20_4_ = auVar329._20_4_ * fVar204;
        auVar54._24_4_ = auVar329._24_4_ * fVar289;
        auVar54._28_4_ = auVar32._28_4_;
        auVar32 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar227._4_4_ * fVar171;
        auVar55._0_4_ = auVar227._0_4_ * fVar170;
        auVar55._8_4_ = auVar227._8_4_ * fVar174;
        auVar55._12_4_ = auVar227._12_4_ * fVar175;
        auVar55._16_4_ = auVar227._16_4_ * fVar196;
        auVar55._20_4_ = auVar227._20_4_ * fVar197;
        auVar55._24_4_ = auVar227._24_4_ * fVar199;
        auVar55._28_4_ = auVar320._28_4_;
        auVar56._4_4_ = auVar329._4_4_ * fVar309;
        auVar56._0_4_ = auVar329._0_4_ * fVar282;
        auVar56._8_4_ = auVar329._8_4_ * fVar312;
        auVar56._12_4_ = auVar329._12_4_ * fVar313;
        auVar56._16_4_ = auVar329._16_4_ * fVar316;
        auVar56._20_4_ = auVar329._20_4_ * fVar317;
        auVar56._24_4_ = auVar329._24_4_ * fVar291;
        auVar56._28_4_ = auVar329._28_4_;
        auVar329 = vsubps_avx(auVar56,auVar55);
        auVar195 = ZEXT864(0) << 0x20;
        auVar255._0_4_ = auVar155._0_4_ * 0.0 + auVar329._0_4_ + auVar32._0_4_ * 0.0;
        auVar255._4_4_ = auVar155._4_4_ * 0.0 + auVar329._4_4_ + auVar32._4_4_ * 0.0;
        auVar255._8_4_ = auVar155._8_4_ * 0.0 + auVar329._8_4_ + auVar32._8_4_ * 0.0;
        auVar255._12_4_ = auVar155._12_4_ * 0.0 + auVar329._12_4_ + auVar32._12_4_ * 0.0;
        auVar255._16_4_ = auVar155._16_4_ * 0.0 + auVar329._16_4_ + auVar32._16_4_ * 0.0;
        auVar255._20_4_ = auVar155._20_4_ * 0.0 + auVar329._20_4_ + auVar32._20_4_ * 0.0;
        auVar255._24_4_ = auVar155._24_4_ * 0.0 + auVar329._24_4_ + auVar32._24_4_ * 0.0;
        auVar255._28_4_ = auVar329._28_4_ + auVar329._28_4_ + auVar32._28_4_;
        auVar155 = vmaxps_avx(auVar186,auVar255);
        auVar155 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,2);
        auVar252 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auVar252 = vpand_avx(auVar252,_local_7c0);
        auVar214 = vpmovsxwd_avx(auVar252);
        auVar225 = vpunpckhwd_avx(auVar252,auVar252);
        auVar228._16_16_ = auVar225;
        auVar228._0_16_ = auVar214;
        if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar228 >> 0x7f,0) == '\0') &&
              (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar225 >> 0x3f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar225[0xf]) {
LAB_0104f677:
          auVar272._8_8_ = uStack_5b8;
          auVar272._0_8_ = local_5c0;
          auVar272._16_8_ = uStack_5b0;
          auVar272._24_8_ = uStack_5a8;
          auVar381 = ZEXT3264(local_580);
          auVar162 = ZEXT3264(local_560);
          auVar232 = ZEXT3264(auVar228);
        }
        else {
          auVar57._4_4_ = fVar267 * fVar246;
          auVar57._0_4_ = fVar236 * fVar239;
          auVar57._8_4_ = fVar311 * fVar275;
          auVar57._12_4_ = fVar241 * fVar238;
          auVar57._16_4_ = fVar280 * fVar279;
          auVar57._20_4_ = fVar204 * fVar173;
          auVar57._24_4_ = fVar289 * fVar205;
          auVar57._28_4_ = auVar225._12_4_;
          auVar353._0_4_ = fVar282 * fVar299;
          auVar353._4_4_ = fVar309 * fVar143;
          auVar353._8_4_ = fVar312 * fVar144;
          auVar353._12_4_ = fVar313 * fVar163;
          auVar353._16_4_ = fVar316 * fVar164;
          auVar353._20_4_ = fVar317 * fVar167;
          auVar353._24_4_ = fVar291 * fVar168;
          auVar353._28_4_ = 0;
          auVar155 = vsubps_avx(auVar353,auVar57);
          auVar58._4_4_ = fVar171 * fVar143;
          auVar58._0_4_ = fVar170 * fVar299;
          auVar58._8_4_ = fVar174 * fVar144;
          auVar58._12_4_ = fVar175 * fVar163;
          auVar58._16_4_ = fVar196 * fVar164;
          auVar58._20_4_ = fVar197 * fVar167;
          auVar58._24_4_ = fVar199 * fVar168;
          auVar58._28_4_ = auVar35._28_4_;
          auVar59._4_4_ = fVar267 * fVar264;
          auVar59._0_4_ = fVar236 * fVar234;
          auVar59._8_4_ = fVar311 * fVar310;
          auVar59._12_4_ = fVar241 * fVar315;
          auVar59._16_4_ = fVar280 * fVar243;
          auVar59._20_4_ = fVar204 * fVar201;
          auVar59._24_4_ = fVar289 * fVar166;
          auVar59._28_4_ = auVar31._28_4_;
          auVar227 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar309 * fVar264;
          auVar60._0_4_ = fVar282 * fVar234;
          auVar60._8_4_ = fVar312 * fVar310;
          auVar60._12_4_ = fVar313 * fVar315;
          auVar60._16_4_ = fVar316 * fVar243;
          auVar60._20_4_ = fVar317 * fVar201;
          auVar60._24_4_ = fVar291 * fVar166;
          auVar60._28_4_ = auVar186._28_4_;
          auVar61._4_4_ = fVar171 * fVar246;
          auVar61._0_4_ = fVar170 * fVar239;
          auVar61._8_4_ = fVar174 * fVar275;
          auVar61._12_4_ = fVar175 * fVar238;
          auVar61._16_4_ = fVar196 * fVar279;
          auVar61._20_4_ = fVar197 * fVar173;
          auVar61._24_4_ = fVar199 * fVar205;
          auVar61._28_4_ = auVar34._28_4_;
          auVar320 = vsubps_avx(auVar61,auVar60);
          auVar298._0_4_ = auVar155._0_4_ * 0.0 + auVar320._0_4_ + auVar227._0_4_ * 0.0;
          auVar298._4_4_ = auVar155._4_4_ * 0.0 + auVar320._4_4_ + auVar227._4_4_ * 0.0;
          auVar298._8_4_ = auVar155._8_4_ * 0.0 + auVar320._8_4_ + auVar227._8_4_ * 0.0;
          auVar298._12_4_ = auVar155._12_4_ * 0.0 + auVar320._12_4_ + auVar227._12_4_ * 0.0;
          auVar298._16_4_ = auVar155._16_4_ * 0.0 + auVar320._16_4_ + auVar227._16_4_ * 0.0;
          auVar298._20_4_ = auVar155._20_4_ * 0.0 + auVar320._20_4_ + auVar227._20_4_ * 0.0;
          auVar298._24_4_ = auVar155._24_4_ * 0.0 + auVar320._24_4_ + auVar227._24_4_ * 0.0;
          auVar298._28_4_ = auVar34._28_4_ + auVar320._28_4_ + auVar186._28_4_;
          auVar329 = vrcpps_avx(auVar298);
          fVar239 = auVar329._0_4_;
          fVar234 = auVar329._4_4_;
          auVar62._4_4_ = auVar298._4_4_ * fVar234;
          auVar62._0_4_ = auVar298._0_4_ * fVar239;
          fVar236 = auVar329._8_4_;
          auVar62._8_4_ = auVar298._8_4_ * fVar236;
          fVar246 = auVar329._12_4_;
          auVar62._12_4_ = auVar298._12_4_ * fVar246;
          fVar264 = auVar329._16_4_;
          auVar62._16_4_ = auVar298._16_4_ * fVar264;
          fVar267 = auVar329._20_4_;
          auVar62._20_4_ = auVar298._20_4_ * fVar267;
          fVar275 = auVar329._24_4_;
          auVar62._24_4_ = auVar298._24_4_ * fVar275;
          auVar62._28_4_ = auVar31._28_4_;
          auVar354._8_4_ = 0x3f800000;
          auVar354._0_8_ = &DAT_3f8000003f800000;
          auVar354._12_4_ = 0x3f800000;
          auVar354._16_4_ = 0x3f800000;
          auVar354._20_4_ = 0x3f800000;
          auVar354._24_4_ = 0x3f800000;
          auVar354._28_4_ = 0x3f800000;
          auVar32 = vsubps_avx(auVar354,auVar62);
          fVar239 = auVar32._0_4_ * fVar239 + fVar239;
          fVar234 = auVar32._4_4_ * fVar234 + fVar234;
          fVar236 = auVar32._8_4_ * fVar236 + fVar236;
          fVar246 = auVar32._12_4_ * fVar246 + fVar246;
          fVar264 = auVar32._16_4_ * fVar264 + fVar264;
          fVar267 = auVar32._20_4_ * fVar267 + fVar267;
          fVar275 = auVar32._24_4_ * fVar275 + fVar275;
          auVar63._4_4_ =
               (auVar155._4_4_ * fVar261 + auVar227._4_4_ * fVar258 + auVar320._4_4_ * fVar290) *
               fVar234;
          auVar63._0_4_ =
               (auVar155._0_4_ * fVar233 + auVar227._0_4_ * fVar221 + auVar320._0_4_ * fVar207) *
               fVar239;
          auVar63._8_4_ =
               (auVar155._8_4_ * fVar277 + auVar227._8_4_ * fVar276 + auVar320._8_4_ * fVar235) *
               fVar236;
          auVar63._12_4_ =
               (auVar155._12_4_ * fVar314 + auVar227._12_4_ * fVar278 + auVar320._12_4_ * fVar237) *
               fVar246;
          auVar63._16_4_ =
               (auVar155._16_4_ * fVar318 + auVar227._16_4_ * fVar245 + auVar320._16_4_ * fVar240) *
               fVar264;
          auVar63._20_4_ =
               (auVar155._20_4_ * fVar198 + auVar227._20_4_ * fVar176 + auVar320._20_4_ * fVar242) *
               fVar267;
          auVar63._24_4_ =
               (auVar155._24_4_ * fVar146 + auVar227._24_4_ * fVar206 + auVar320._24_4_ * fVar244) *
               fVar275;
          auVar63._28_4_ = auVar191._28_4_ + auVar352._28_4_ + auVar37._28_4_;
          auVar214 = vpermilps_avx(ZEXT416(local_840),0);
          auVar229._16_16_ = auVar214;
          auVar229._0_16_ = auVar214;
          auVar155 = vcmpps_avx(auVar229,auVar63,2);
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar270._4_4_ = uVar10;
          auVar270._0_4_ = uVar10;
          auVar270._8_4_ = uVar10;
          auVar270._12_4_ = uVar10;
          auVar270._16_4_ = uVar10;
          auVar270._20_4_ = uVar10;
          auVar270._24_4_ = uVar10;
          auVar270._28_4_ = uVar10;
          auVar37 = vcmpps_avx(auVar63,auVar270,2);
          auVar155 = vandps_avx(auVar37,auVar155);
          auVar214 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar252 = vpand_avx(auVar252,auVar214);
          auVar214 = vpmovsxwd_avx(auVar252);
          auVar225 = vpshufd_avx(auVar252,0xee);
          auVar225 = vpmovsxwd_avx(auVar225);
          auVar228._16_16_ = auVar225;
          auVar228._0_16_ = auVar214;
          auVar162 = ZEXT3264(local_560);
          auVar381 = ZEXT3264(local_580);
          if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar228 >> 0x7f,0) == '\0') &&
                (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar225 >> 0x3f,0) == '\0') &&
              (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar225[0xf]) goto LAB_0104f677;
          auVar155 = vcmpps_avx(ZEXT832(0) << 0x20,auVar298,4);
          auVar214 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar252 = vpand_avx(auVar252,auVar214);
          auVar214 = vpmovsxwd_avx(auVar252);
          auVar252 = vpunpckhwd_avx(auVar252,auVar252);
          auVar232 = ZEXT1664(auVar252);
          auVar287._16_16_ = auVar252;
          auVar287._0_16_ = auVar214;
          auVar272._8_8_ = uStack_5b8;
          auVar272._0_8_ = local_5c0;
          auVar272._16_8_ = uStack_5b0;
          auVar272._24_8_ = uStack_5a8;
          if ((((((((auVar287 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar287 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar287 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar287 >> 0x7f,0) != '\0') ||
                (auVar287 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar252 >> 0x3f,0) != '\0') ||
              (auVar287 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar252[0xf] < '\0') {
            auVar230._0_4_ = auVar186._0_4_ * fVar239;
            auVar230._4_4_ = auVar186._4_4_ * fVar234;
            auVar230._8_4_ = auVar186._8_4_ * fVar236;
            auVar230._12_4_ = auVar186._12_4_ * fVar246;
            auVar230._16_4_ = auVar186._16_4_ * fVar264;
            auVar230._20_4_ = auVar186._20_4_ * fVar267;
            auVar230._24_4_ = auVar186._24_4_ * fVar275;
            auVar230._28_4_ = 0;
            auVar64._4_4_ = auVar255._4_4_ * fVar234;
            auVar64._0_4_ = auVar255._0_4_ * fVar239;
            auVar64._8_4_ = auVar255._8_4_ * fVar236;
            auVar64._12_4_ = auVar255._12_4_ * fVar246;
            auVar64._16_4_ = auVar255._16_4_ * fVar264;
            auVar64._20_4_ = auVar255._20_4_ * fVar267;
            auVar64._24_4_ = auVar255._24_4_ * fVar275;
            auVar64._28_4_ = auVar32._28_4_ + auVar329._28_4_;
            auVar271._8_4_ = 0x3f800000;
            auVar271._0_8_ = &DAT_3f8000003f800000;
            auVar271._12_4_ = 0x3f800000;
            auVar271._16_4_ = 0x3f800000;
            auVar271._20_4_ = 0x3f800000;
            auVar271._24_4_ = 0x3f800000;
            auVar271._28_4_ = 0x3f800000;
            auVar155 = vsubps_avx(auVar271,auVar230);
            auVar155 = vblendvps_avx(auVar155,auVar230,auVar33);
            auVar162 = ZEXT3264(auVar155);
            auVar155 = vsubps_avx(auVar271,auVar64);
            auVar232 = ZEXT3264(auVar155);
            _local_220 = vblendvps_avx(auVar155,auVar64,auVar33);
            auVar381 = ZEXT3264(auVar63);
            auVar272 = auVar287;
          }
        }
        local_560 = auVar162._0_32_;
        local_580 = auVar381._0_32_;
        auVar329 = local_580;
        auVar227 = local_560;
        if ((((((((auVar272 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar272 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar272 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar272 >> 0x7f,0) != '\0') ||
              (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar272 >> 0xbf,0) != '\0') ||
            (auVar272 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar272[0x1f] < '\0') {
          auVar155 = vsubps_avx(auVar306,_local_860);
          fVar221 = (float)local_860._0_4_ + auVar162._0_4_ * auVar155._0_4_;
          fVar233 = (float)local_860._4_4_ + auVar162._4_4_ * auVar155._4_4_;
          fVar234 = fStack_858 + auVar162._8_4_ * auVar155._8_4_;
          fVar236 = fStack_854 + auVar162._12_4_ * auVar155._12_4_;
          fVar246 = fStack_850 + auVar162._16_4_ * auVar155._16_4_;
          fVar258 = fStack_84c + auVar162._20_4_ * auVar155._20_4_;
          fVar261 = fStack_848 + auVar162._24_4_ * auVar155._24_4_;
          fVar264 = fStack_844 + auVar155._28_4_;
          fVar239 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
          auVar65._4_4_ = (fVar233 + fVar233) * fVar239;
          auVar65._0_4_ = (fVar221 + fVar221) * fVar239;
          auVar65._8_4_ = (fVar234 + fVar234) * fVar239;
          auVar65._12_4_ = (fVar236 + fVar236) * fVar239;
          auVar65._16_4_ = (fVar246 + fVar246) * fVar239;
          auVar65._20_4_ = (fVar258 + fVar258) * fVar239;
          auVar65._24_4_ = (fVar261 + fVar261) * fVar239;
          auVar65._28_4_ = fVar264 + fVar264;
          auVar155 = vcmpps_avx(local_580,auVar65,6);
          auVar37 = auVar272 & auVar155;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            local_2c0 = vandps_avx(auVar155,auVar272);
            local_220._0_4_ = (float)local_220._0_4_ + (float)local_220._0_4_ + -1.0;
            local_220._4_4_ = (float)local_220._4_4_ + (float)local_220._4_4_ + -1.0;
            uStack_218._0_4_ = (float)uStack_218 + (float)uStack_218 + -1.0;
            uStack_218._4_4_ = uStack_218._4_4_ + uStack_218._4_4_ + -1.0;
            uStack_210._0_4_ = (float)uStack_210 + (float)uStack_210 + -1.0;
            uStack_210._4_4_ = uStack_210._4_4_ + uStack_210._4_4_ + -1.0;
            uStack_208._0_4_ = (float)uStack_208 + (float)uStack_208 + -1.0;
            uStack_208._4_4_ = uStack_208._4_4_ + uStack_208._4_4_ + -1.0;
            local_380 = local_560;
            auVar133 = _local_220;
            auVar155 = _local_220;
            local_360 = (float)local_220._0_4_;
            fStack_35c = (float)local_220._4_4_;
            fStack_358 = (float)uStack_218;
            fStack_354 = uStack_218._4_4_;
            fStack_350 = (float)uStack_210;
            fStack_34c = uStack_210._4_4_;
            fStack_348 = (float)uStack_208;
            fStack_344 = uStack_208._4_4_;
            local_340 = local_580;
            local_320 = 0;
            local_31c = uVar13;
            local_310 = auVar304._0_8_;
            uStack_308 = uStack_888;
            uStack_6b8 = auVar351._8_8_;
            local_300 = auVar351._0_8_;
            uStack_2f8 = uStack_6b8;
            local_2f0 = local_6d0;
            uStack_2e8 = uStack_6c8;
            uStack_6a8 = auVar372._8_8_;
            local_2e0._8_8_ = uStack_6a8;
            local_2e0._0_8_ = auVar372._0_8_;
            _local_220 = auVar155;
            if ((pGVar142->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar211._0_4_ = 1.0 / (float)(int)uVar13;
              auVar211._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar252 = vshufps_avx(auVar211,auVar211,0);
              local_2a0[0] = auVar252._0_4_ * (auVar162._0_4_ + 0.0);
              local_2a0[1] = auVar252._4_4_ * (auVar162._4_4_ + 1.0);
              local_2a0[2] = auVar252._8_4_ * (auVar162._8_4_ + 2.0);
              local_2a0[3] = auVar252._12_4_ * (auVar162._12_4_ + 3.0);
              fStack_290 = auVar252._0_4_ * (auVar162._16_4_ + 4.0);
              fStack_28c = auVar252._4_4_ * (auVar162._20_4_ + 5.0);
              fStack_288 = auVar252._8_4_ * (auVar162._24_4_ + 6.0);
              fStack_284 = auVar162._28_4_ + 7.0;
              uStack_210 = auVar133._16_8_;
              uStack_208 = auVar155._24_8_;
              local_280 = local_220;
              uStack_278 = uStack_218;
              uStack_270 = uStack_210;
              uStack_268 = uStack_208;
              local_260 = local_580;
              auVar187._8_4_ = 0x7f800000;
              auVar187._0_8_ = 0x7f8000007f800000;
              auVar187._12_4_ = 0x7f800000;
              auVar187._16_4_ = 0x7f800000;
              auVar187._20_4_ = 0x7f800000;
              auVar187._24_4_ = 0x7f800000;
              auVar187._28_4_ = 0x7f800000;
              auVar155 = vblendvps_avx(auVar187,local_580,local_2c0);
              auVar37 = vshufps_avx(auVar155,auVar155,0xb1);
              auVar37 = vminps_avx(auVar155,auVar37);
              auVar320 = vshufpd_avx(auVar37,auVar37,5);
              auVar37 = vminps_avx(auVar37,auVar320);
              auVar320 = vperm2f128_avx(auVar37,auVar37,1);
              auVar37 = vminps_avx(auVar37,auVar320);
              auVar37 = vcmpps_avx(auVar155,auVar37,0);
              auVar320 = local_2c0 & auVar37;
              auVar155 = local_2c0;
              if ((((((((auVar320 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar320 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar320 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar320 >> 0x7f,0) != '\0') ||
                    (auVar320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar320 >> 0xbf,0) != '\0') ||
                  (auVar320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar320[0x1f] < '\0') {
                auVar155 = vandps_avx(auVar37,local_2c0);
              }
              uVar135 = vmovmskps_avx(auVar155);
              uVar19 = 0;
              if (uVar135 != 0) {
                for (; (uVar135 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              auVar140 = (undefined1  [8])(ulong)uVar19;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar142->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar239 = local_2a0[(long)auVar140];
                uVar10 = *(undefined4 *)((long)&local_280 + (long)auVar140 * 4);
                fVar233 = 1.0 - fVar239;
                fVar221 = fVar239 * fVar233 + fVar239 * fVar233;
                auVar252 = ZEXT416((uint)(fVar239 * fVar239 * 3.0));
                auVar252 = vshufps_avx(auVar252,auVar252,0);
                auVar214 = ZEXT416((uint)((fVar221 - fVar239 * fVar239) * 3.0));
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar225 = ZEXT416((uint)((fVar233 * fVar233 - fVar221) * 3.0));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar216 = ZEXT416((uint)(fVar233 * fVar233 * -3.0));
                auVar216 = vshufps_avx(auVar216,auVar216,0);
                auVar212._0_4_ =
                     auVar216._0_4_ * fVar300 +
                     auVar225._0_4_ * fVar349 +
                     auVar252._0_4_ * fVar369 + auVar214._0_4_ * (float)local_6d0._0_4_;
                auVar212._4_4_ =
                     auVar216._4_4_ * fVar308 +
                     auVar225._4_4_ * fVar357 +
                     auVar252._4_4_ * fVar374 + auVar214._4_4_ * (float)local_6d0._4_4_;
                auVar212._8_4_ =
                     auVar216._8_4_ * auVar304._8_4_ +
                     auVar225._8_4_ * auVar351._8_4_ +
                     auVar252._8_4_ * auVar372._8_4_ + auVar214._8_4_ * (float)uStack_6c8;
                auVar212._12_4_ =
                     auVar216._12_4_ * auVar304._12_4_ +
                     auVar225._12_4_ * auVar351._12_4_ +
                     auVar252._12_4_ * auVar372._12_4_ + auVar214._12_4_ * uStack_6c8._4_4_;
                auVar232 = ZEXT464(*(uint *)(local_260 + (long)auVar140 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_260 + (long)auVar140 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar212._0_4_;
                uVar14 = vextractps_avx(auVar212,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                uVar14 = vextractps_avx(auVar212,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                *(float *)(ray + k * 4 + 0xf0) = fVar239;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar10;
                *(uint *)(ray + k * 4 + 0x110) = uVar12;
                *(uint *)(ray + k * 4 + 0x120) = uVar137;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_7e0 = vshufps_avx(ZEXT416(uVar137),ZEXT416(uVar137),0);
                _auStack_7d0 = auVar306._16_16_;
                local_740 = vshufps_avx(ZEXT416(uVar12),ZEXT416(uVar12),0);
                auStack_730 = auVar191._16_16_;
                auStack_770 = auVar29._16_16_;
                auStack_778 = (undefined1  [8])uStack_6b8;
                local_780 = (Geometry *)auVar351._0_8_;
                _auStack_750 = auVar253._16_16_;
                _local_760 = _local_6d0;
                _auStack_610 = auVar226._16_16_;
                uStack_618 = uStack_6a8;
                local_620 = (undefined1  [8])auVar372._0_8_;
                local_640 = (float)*(undefined8 *)*local_788;
                fStack_63c = (float)((ulong)*(undefined8 *)*local_788 >> 0x20);
                fStack_638 = (float)*(undefined8 *)(*local_788 + 8);
                fStack_634 = (float)((ulong)*(undefined8 *)(*local_788 + 8) >> 0x20);
                _local_6c0 = auVar351;
                _local_6b0 = auVar372;
                local_600 = local_2c0;
                do {
                  local_7c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_3e0 = local_2a0[(long)auVar140];
                  uVar10 = *(undefined4 *)((long)&local_280 + (long)auVar140 * 4);
                  auVar183._4_4_ = uVar10;
                  auVar183._0_4_ = uVar10;
                  auVar183._8_4_ = uVar10;
                  auVar183._12_4_ = uVar10;
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_260 + (long)auVar140 * 4);
                  fVar221 = 1.0 - local_3e0;
                  fVar239 = local_3e0 * fVar221 + local_3e0 * fVar221;
                  auVar252 = ZEXT416((uint)(local_3e0 * local_3e0 * 3.0));
                  auVar252 = vshufps_avx(auVar252,auVar252,0);
                  auVar214 = ZEXT416((uint)((fVar239 - local_3e0 * local_3e0) * 3.0));
                  auVar214 = vshufps_avx(auVar214,auVar214,0);
                  auVar225 = ZEXT416((uint)((fVar221 * fVar221 - fVar239) * 3.0));
                  auVar225 = vshufps_avx(auVar225,auVar225,0);
                  local_810.context = context->user;
                  auVar216 = ZEXT416((uint)(fVar221 * fVar221 * -3.0));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  auVar218._0_4_ =
                       auVar216._0_4_ * fVar300 +
                       auVar225._0_4_ * (float)local_780 +
                       auVar252._0_4_ * (float)local_620._0_4_ +
                       auVar214._0_4_ * (float)local_760._0_4_;
                  auVar218._4_4_ =
                       auVar216._4_4_ * fVar308 +
                       auVar225._4_4_ * local_780._4_4_ +
                       auVar252._4_4_ * (float)local_620._4_4_ +
                       auVar214._4_4_ * (float)local_760._4_4_;
                  auVar218._8_4_ =
                       auVar216._8_4_ * auVar304._8_4_ +
                       auVar225._8_4_ * (float)auStack_778._0_4_ +
                       auVar252._8_4_ * (float)uStack_618 + auVar214._8_4_ * fStack_758;
                  auVar218._12_4_ =
                       auVar216._12_4_ * auVar304._12_4_ +
                       auVar225._12_4_ * (float)auStack_778._4_4_ +
                       auVar252._12_4_ * uStack_618._4_4_ + auVar214._12_4_ * fStack_754;
                  auVar252 = vshufps_avx(auVar218,auVar218,0);
                  local_410[0] = (RTCHitN)auVar252[0];
                  local_410[1] = (RTCHitN)auVar252[1];
                  local_410[2] = (RTCHitN)auVar252[2];
                  local_410[3] = (RTCHitN)auVar252[3];
                  local_410[4] = (RTCHitN)auVar252[4];
                  local_410[5] = (RTCHitN)auVar252[5];
                  local_410[6] = (RTCHitN)auVar252[6];
                  local_410[7] = (RTCHitN)auVar252[7];
                  local_410[8] = (RTCHitN)auVar252[8];
                  local_410[9] = (RTCHitN)auVar252[9];
                  local_410[10] = (RTCHitN)auVar252[10];
                  local_410[0xb] = (RTCHitN)auVar252[0xb];
                  local_410[0xc] = (RTCHitN)auVar252[0xc];
                  local_410[0xd] = (RTCHitN)auVar252[0xd];
                  local_410[0xe] = (RTCHitN)auVar252[0xe];
                  local_410[0xf] = (RTCHitN)auVar252[0xf];
                  local_400 = vshufps_avx(auVar218,auVar218,0x55);
                  auVar232 = ZEXT1664(local_400);
                  local_3f0 = vshufps_avx(auVar218,auVar218,0xaa);
                  fStack_3dc = local_3e0;
                  fStack_3d8 = local_3e0;
                  fStack_3d4 = local_3e0;
                  local_3d0 = auVar183;
                  local_3c0 = local_740._0_8_;
                  uStack_3b8 = local_740._8_8_;
                  local_3b0 = local_7e0;
                  uStack_3a8 = uStack_7d8;
                  vcmpps_avx(auVar195._0_32_,auVar195._0_32_,0xf);
                  uStack_39c = (local_810.context)->instID[0];
                  local_3a0 = uStack_39c;
                  uStack_398 = uStack_39c;
                  uStack_394 = uStack_39c;
                  uStack_390 = (local_810.context)->instPrimID[0];
                  uStack_38c = uStack_390;
                  uStack_388 = uStack_390;
                  uStack_384 = uStack_390;
                  local_880 = CONCAT44(fStack_63c,local_640);
                  uStack_878 = CONCAT44(fStack_634,fStack_638);
                  local_810.valid = (int *)&local_880;
                  local_810.geometryUserPtr = pGVar142->userPtr;
                  local_810.hit = local_410;
                  local_810.N = 4;
                  local_860 = auVar140;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar142->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar232 = ZEXT1664(local_400);
                    (*pGVar142->intersectionFilterN)(&local_810);
                    auVar195._8_56_ = extraout_var;
                    auVar195._0_8_ = extraout_XMM1_Qa;
                    auVar183 = auVar195._0_16_;
                    auVar381 = ZEXT3264(local_580);
                    auVar162 = ZEXT3264(local_560);
                    auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar140 = local_860;
                    fVar248 = (float)local_700._0_4_;
                    fVar260 = (float)local_700._4_4_;
                    fVar263 = fStack_6f8;
                    fVar266 = fStack_6f4;
                    fVar338 = fStack_6f0;
                    fVar220 = fStack_6ec;
                    fVar344 = fStack_6e8;
                  }
                  auVar252 = auVar232._0_16_;
                  auVar119._8_8_ = uStack_878;
                  auVar119._0_8_ = local_880;
                  if (auVar119 == (undefined1  [16])0x0) {
                    auVar252 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar214 = vpcmpeqd_avx(auVar183,auVar183);
                    auVar252 = auVar252 ^ auVar214;
                  }
                  else {
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar142->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var18)(&local_810);
                      auVar381 = ZEXT3264(local_580);
                      auVar162 = ZEXT3264(local_560);
                      auVar195 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar140 = local_860;
                      fVar248 = (float)local_700._0_4_;
                      fVar260 = (float)local_700._4_4_;
                      fVar263 = fStack_6f8;
                      fVar266 = fStack_6f4;
                      fVar338 = fStack_6f0;
                      fVar220 = fStack_6ec;
                      fVar344 = fStack_6e8;
                    }
                    auVar120._8_8_ = uStack_878;
                    auVar120._0_8_ = local_880;
                    auVar214 = vpcmpeqd_avx(auVar120,_DAT_01feba10);
                    auVar225 = vpcmpeqd_avx(auVar252,auVar252);
                    auVar232 = ZEXT1664(auVar225);
                    auVar252 = auVar214 ^ auVar225;
                    if (auVar120 != (undefined1  [16])0x0) {
                      auVar214 = auVar214 ^ auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])local_810.hit);
                      *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x10));
                      *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x20));
                      *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x30));
                      *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x40));
                      *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar225;
                      auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar225;
                      auVar214 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar214;
                    }
                  }
                  auVar329 = auVar381._0_32_;
                  auVar184._8_8_ = 0x100000001;
                  auVar184._0_8_ = 0x100000001;
                  if ((auVar184 & auVar252) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_7c0._0_4_;
                  }
                  *(undefined4 *)(local_600 + (long)auVar140 * 4) = 0;
                  uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar161._4_4_ = uVar10;
                  auVar161._0_4_ = uVar10;
                  auVar161._8_4_ = uVar10;
                  auVar161._12_4_ = uVar10;
                  auVar161._16_4_ = uVar10;
                  auVar161._20_4_ = uVar10;
                  auVar161._24_4_ = uVar10;
                  auVar161._28_4_ = uVar10;
                  auVar191 = vcmpps_avx(auVar329,auVar161,2);
                  auVar155 = vandps_avx(auVar191,local_600);
                  local_600 = local_600 & auVar191;
                  bVar115 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar116 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar114 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar113 = SUB321(local_600 >> 0x7f,0) != '\0';
                  bVar112 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar111 = SUB321(local_600 >> 0xbf,0) != '\0';
                  bVar110 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar109 = local_600[0x1f] < '\0';
                  if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111) ||
                      bVar110) || bVar109) {
                    auVar194._8_4_ = 0x7f800000;
                    auVar194._0_8_ = 0x7f8000007f800000;
                    auVar194._12_4_ = 0x7f800000;
                    auVar194._16_4_ = 0x7f800000;
                    auVar194._20_4_ = 0x7f800000;
                    auVar194._24_4_ = 0x7f800000;
                    auVar194._28_4_ = 0x7f800000;
                    auVar191 = vblendvps_avx(auVar194,auVar329,auVar155);
                    auVar29 = vshufps_avx(auVar191,auVar191,0xb1);
                    auVar29 = vminps_avx(auVar191,auVar29);
                    auVar37 = vshufpd_avx(auVar29,auVar29,5);
                    auVar29 = vminps_avx(auVar29,auVar37);
                    auVar37 = vperm2f128_avx(auVar29,auVar29,1);
                    auVar232 = ZEXT3264(auVar37);
                    auVar29 = vminps_avx(auVar29,auVar37);
                    auVar29 = vcmpps_avx(auVar191,auVar29,0);
                    auVar37 = auVar155 & auVar29;
                    auVar191 = auVar155;
                    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar37 >> 0x7f,0) != '\0') ||
                          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar37 >> 0xbf,0) != '\0') ||
                        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar37[0x1f] < '\0') {
                      auVar191 = vandps_avx(auVar29,auVar155);
                    }
                    uVar135 = vmovmskps_avx(auVar191);
                    uVar19 = 0;
                    if (uVar135 != 0) {
                      for (; (uVar135 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    auVar140 = (undefined1  [8])(ulong)uVar19;
                  }
                  auVar227 = auVar162._0_32_;
                  auVar351 = _local_6c0;
                  auVar372 = _local_6b0;
                  local_600 = auVar155;
                } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                         || bVar110) || bVar109);
              }
            }
          }
        }
      }
      _local_6b0 = auVar372;
      _local_6c0 = auVar351;
      auVar195 = ZEXT1664(_local_680);
      local_580 = auVar329;
      local_560 = auVar227;
      if (8 < (int)uVar13) {
        auVar252 = vpshufd_avx(ZEXT416(uVar13),0);
        local_660 = auVar252._0_4_;
        fStack_65c = auVar252._4_4_;
        fStack_658 = auVar252._8_4_;
        fStack_654 = auVar252._12_4_;
        auVar252 = vshufps_avx(_local_680,_local_680,0);
        register0x00001210 = auVar252;
        _local_1e0 = auVar252;
        auVar123._4_4_ = uStack_83c;
        auVar123._0_4_ = local_840;
        auVar123._8_4_ = fStack_838;
        auVar123._12_4_ = fStack_834;
        auVar252 = vpermilps_avx(auVar123,0);
        local_200._16_16_ = auVar252;
        local_200._0_16_ = auVar252;
        auVar151._0_4_ = 1.0 / (float)local_480._0_4_;
        auVar151._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar252 = vshufps_avx(auVar151,auVar151,0);
        _fStack_470 = auVar252;
        _local_480 = auVar252;
        local_140 = vshufps_avx(ZEXT416(uVar137),ZEXT416(uVar137),0);
        local_150 = vshufps_avx(ZEXT416(uVar12),ZEXT416(uVar12),0);
        auVar162 = ZEXT1664(local_150);
        lVar141 = 8;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar141 * 4 + lVar20);
          fVar239 = *(float *)*pauVar9;
          fVar221 = *(float *)(*pauVar9 + 4);
          fVar233 = *(float *)(*pauVar9 + 8);
          fVar234 = *(float *)(*pauVar9 + 0xc);
          fVar236 = *(float *)(*pauVar9 + 0x10);
          fVar246 = *(float *)(*pauVar9 + 0x14);
          fVar258 = *(float *)(*pauVar9 + 0x18);
          auVar132 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar20 + 0x2227768 + lVar141 * 4);
          fVar261 = *(float *)*pauVar9;
          fVar264 = *(float *)(*pauVar9 + 4);
          fVar267 = *(float *)(*pauVar9 + 8);
          fVar275 = *(float *)(*pauVar9 + 0xc);
          fVar276 = *(float *)(*pauVar9 + 0x10);
          fVar277 = *(float *)(*pauVar9 + 0x14);
          fVar310 = *(float *)(*pauVar9 + 0x18);
          auVar131 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar20 + 0x2227bec + lVar141 * 4);
          fVar311 = *(float *)*pauVar9;
          fVar238 = *(float *)(*pauVar9 + 4);
          fVar278 = *(float *)(*pauVar9 + 8);
          fVar314 = *(float *)(*pauVar9 + 0xc);
          fVar315 = *(float *)(*pauVar9 + 0x10);
          fVar241 = *(float *)(*pauVar9 + 0x14);
          fVar279 = *(float *)(*pauVar9 + 0x18);
          auVar130 = *pauVar9;
          pfVar1 = (float *)(lVar20 + 0x2228070 + lVar141 * 4);
          local_640 = *pfVar1;
          fStack_63c = pfVar1[1];
          fStack_638 = pfVar1[2];
          fStack_634 = pfVar1[3];
          fStack_630 = pfVar1[4];
          fStack_62c = pfVar1[5];
          fStack_628 = pfVar1[6];
          fStack_624 = pfVar1[7];
          fVar245 = auVar232._28_4_;
          fStack_824 = fVar245 + fVar245 + auVar162._28_4_;
          fVar289 = fVar245 + fVar245 + auVar195._28_4_;
          local_680._0_4_ =
               fVar248 * fVar239 +
               fVar261 * (float)local_460._0_4_ +
               fVar311 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * local_640;
          local_680._4_4_ =
               fVar260 * fVar221 +
               fVar264 * (float)local_460._4_4_ +
               fVar238 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fStack_63c;
          fStack_678 = fVar263 * fVar233 +
                       fVar267 * fStack_458 + fVar278 * fStack_498 + fStack_4b8 * fStack_638;
          fStack_674 = fVar266 * fVar234 +
                       fVar275 * fStack_454 + fVar314 * fStack_494 + fStack_4b4 * fStack_634;
          register0x00001550 =
               fVar338 * fVar236 +
               fVar276 * fStack_450 + fVar315 * fStack_490 + fStack_4b0 * fStack_630;
          register0x00001554 =
               fVar220 * fVar246 +
               fVar277 * fStack_44c + fVar241 * fStack_48c + fStack_4ac * fStack_62c;
          register0x00001558 =
               fVar344 * fVar258 +
               fVar310 * fStack_448 + fVar279 * fStack_488 + fStack_4a8 * fStack_628;
          register0x0000155c = fVar245 + fStack_624 + fStack_824;
          auVar231._0_4_ =
               fVar239 * (float)local_1a0._0_4_ +
               (float)local_440._0_4_ * fVar261 +
               (float)local_720._0_4_ * fVar311 + (float)local_4e0._0_4_ * local_640;
          auVar231._4_4_ =
               fVar221 * (float)local_1a0._4_4_ +
               (float)local_440._4_4_ * fVar264 +
               (float)local_720._4_4_ * fVar238 + (float)local_4e0._4_4_ * fStack_63c;
          auVar231._8_4_ =
               fVar233 * fStack_198 +
               fStack_438 * fVar267 + fStack_718 * fVar278 + fStack_4d8 * fStack_638;
          auVar231._12_4_ =
               fVar234 * fStack_194 +
               fStack_434 * fVar275 + fStack_714 * fVar314 + fStack_4d4 * fStack_634;
          auVar231._16_4_ =
               fVar236 * fStack_190 +
               fStack_430 * fVar276 + fStack_710 * fVar315 + fStack_4d0 * fStack_630;
          auVar231._20_4_ =
               fVar246 * fStack_18c +
               fStack_42c * fVar277 + fStack_70c * fVar241 + fStack_4cc * fStack_62c;
          auVar231._24_4_ =
               fVar258 * fStack_188 +
               fStack_428 * fVar310 + fStack_708 * fVar279 + fStack_4c8 * fStack_628;
          auVar231._28_4_ = fStack_824 + fVar289;
          fVar146 = fVar261 * (float)local_e0._0_4_ +
                    fVar311 * (float)local_c0._0_4_ + (float)local_80._0_4_ * local_640 +
                    fVar239 * (float)local_100._0_4_;
          fVar166 = fVar264 * (float)local_e0._4_4_ +
                    fVar238 * (float)local_c0._4_4_ + (float)local_80._4_4_ * fStack_63c +
                    fVar221 * (float)local_100._4_4_;
          fStack_838 = fVar267 * fStack_d8 + fVar278 * fStack_b8 + fStack_78 * fStack_638 +
                       fVar233 * fStack_f8;
          fStack_834 = fVar275 * fStack_d4 + fVar314 * fStack_b4 + fStack_74 * fStack_634 +
                       fVar234 * fStack_f4;
          fStack_830 = fVar276 * fStack_d0 + fVar315 * fStack_b0 + fStack_70 * fStack_630 +
                       fVar236 * fStack_f0;
          fStack_82c = fVar277 * fStack_cc + fVar241 * fStack_ac + fStack_6c * fStack_62c +
                       fVar246 * fStack_ec;
          fStack_828 = fVar310 * fStack_c8 + fVar279 * fStack_a8 + fStack_68 * fStack_628 +
                       fVar258 * fStack_e8;
          fStack_824 = fVar245 + fVar245 + fStack_624 + fStack_824;
          pfVar1 = (float *)(bezier_basis1 + lVar141 * 4 + lVar20);
          fVar236 = *pfVar1;
          fVar246 = pfVar1[1];
          fVar258 = pfVar1[2];
          fVar261 = pfVar1[3];
          fVar264 = pfVar1[4];
          fVar267 = pfVar1[5];
          fVar275 = pfVar1[6];
          pfVar1 = (float *)(lVar20 + 0x2229b88 + lVar141 * 4);
          fVar276 = *pfVar1;
          fVar277 = pfVar1[1];
          fVar310 = pfVar1[2];
          fVar311 = pfVar1[3];
          fVar238 = pfVar1[4];
          fVar278 = pfVar1[5];
          fVar314 = pfVar1[6];
          pfVar1 = (float *)(lVar20 + 0x222a00c + lVar141 * 4);
          fVar315 = *pfVar1;
          fVar241 = pfVar1[1];
          fVar279 = pfVar1[2];
          fVar245 = pfVar1[3];
          fVar318 = pfVar1[4];
          fVar243 = pfVar1[5];
          fVar280 = pfVar1[6];
          fVar239 = pfVar1[7];
          pfVar1 = (float *)(lVar20 + 0x222a490 + lVar141 * 4);
          fVar173 = *pfVar1;
          fVar176 = pfVar1[1];
          fVar198 = pfVar1[2];
          fVar201 = pfVar1[3];
          fVar204 = pfVar1[4];
          fVar205 = pfVar1[5];
          fVar206 = pfVar1[6];
          fVar289 = fVar239 + fVar289;
          fVar221 = fStack_4a4 + fVar239 + fVar239;
          auVar156._0_4_ =
               fVar248 * fVar236 +
               (float)local_4c0._0_4_ * fVar173 + (float)local_4a0._0_4_ * fVar315 +
               fVar276 * (float)local_460._0_4_;
          auVar156._4_4_ =
               fVar260 * fVar246 +
               (float)local_4c0._4_4_ * fVar176 + (float)local_4a0._4_4_ * fVar241 +
               fVar277 * (float)local_460._4_4_;
          auVar156._8_4_ =
               fVar263 * fVar258 +
               fStack_4b8 * fVar198 + fStack_498 * fVar279 + fVar310 * fStack_458;
          auVar156._12_4_ =
               fVar266 * fVar261 +
               fStack_4b4 * fVar201 + fStack_494 * fVar245 + fVar311 * fStack_454;
          auVar156._16_4_ =
               fVar338 * fVar264 +
               fStack_4b0 * fVar204 + fStack_490 * fVar318 + fVar238 * fStack_450;
          auVar156._20_4_ =
               fVar220 * fVar267 +
               fStack_4ac * fVar205 + fStack_48c * fVar243 + fVar278 * fStack_44c;
          auVar156._24_4_ =
               fVar344 * fVar275 +
               fStack_4a8 * fVar206 + fStack_488 * fVar280 + fVar314 * fStack_448;
          auVar156._28_4_ = fVar289 + fVar221;
          auVar273._0_4_ =
               fVar236 * (float)local_1a0._0_4_ +
               fVar276 * (float)local_440._0_4_ +
               fVar315 * (float)local_720._0_4_ + fVar173 * (float)local_4e0._0_4_;
          auVar273._4_4_ =
               fVar246 * (float)local_1a0._4_4_ +
               fVar277 * (float)local_440._4_4_ +
               fVar241 * (float)local_720._4_4_ + fVar176 * (float)local_4e0._4_4_;
          auVar273._8_4_ =
               fVar258 * fStack_198 +
               fVar310 * fStack_438 + fVar279 * fStack_718 + fVar198 * fStack_4d8;
          auVar273._12_4_ =
               fVar261 * fStack_194 +
               fVar311 * fStack_434 + fVar245 * fStack_714 + fVar201 * fStack_4d4;
          auVar273._16_4_ =
               fVar264 * fStack_190 +
               fVar238 * fStack_430 + fVar318 * fStack_710 + fVar204 * fStack_4d0;
          auVar273._20_4_ =
               fVar267 * fStack_18c +
               fVar278 * fStack_42c + fVar243 * fStack_70c + fVar205 * fStack_4cc;
          auVar273._24_4_ =
               fVar275 * fStack_188 +
               fVar314 * fStack_428 + fVar280 * fStack_708 + fVar206 * fStack_4c8;
          auVar273._28_4_ = fVar221 + fVar239 + fVar239 + fStack_4c4;
          local_5a0._0_4_ =
               fVar276 * (float)local_e0._0_4_ +
               fVar315 * (float)local_c0._0_4_ + (float)local_80._0_4_ * fVar173 +
               fVar236 * (float)local_100._0_4_;
          local_5a0._4_4_ =
               fVar277 * (float)local_e0._4_4_ +
               fVar241 * (float)local_c0._4_4_ + (float)local_80._4_4_ * fVar176 +
               fVar246 * (float)local_100._4_4_;
          fStack_598 = fVar310 * fStack_d8 + fVar279 * fStack_b8 + fStack_78 * fVar198 +
                       fVar258 * fStack_f8;
          fStack_594 = fVar311 * fStack_d4 + fVar245 * fStack_b4 + fStack_74 * fVar201 +
                       fVar261 * fStack_f4;
          fStack_590 = fVar238 * fStack_d0 + fVar318 * fStack_b0 + fStack_70 * fVar204 +
                       fVar264 * fStack_f0;
          fStack_58c = fVar278 * fStack_cc + fVar243 * fStack_ac + fStack_6c * fVar205 +
                       fVar267 * fStack_ec;
          fStack_588 = fVar314 * fStack_c8 + fVar280 * fStack_a8 + fStack_68 * fVar206 +
                       fVar275 * fStack_e8;
          fStack_584 = fVar239 + fVar289 + fVar221;
          auVar191 = vsubps_avx(auVar156,_local_680);
          auVar29 = vsubps_avx(auVar273,auVar231);
          fVar207 = auVar191._0_4_;
          fVar290 = auVar191._4_4_;
          auVar66._4_4_ = fVar290 * auVar231._4_4_;
          auVar66._0_4_ = fVar207 * auVar231._0_4_;
          fVar235 = auVar191._8_4_;
          auVar66._8_4_ = fVar235 * auVar231._8_4_;
          fVar237 = auVar191._12_4_;
          auVar66._12_4_ = fVar237 * auVar231._12_4_;
          fVar240 = auVar191._16_4_;
          auVar66._16_4_ = fVar240 * auVar231._16_4_;
          fVar242 = auVar191._20_4_;
          auVar66._20_4_ = fVar242 * auVar231._20_4_;
          fVar244 = auVar191._24_4_;
          auVar66._24_4_ = fVar244 * auVar231._24_4_;
          auVar66._28_4_ = fVar221;
          fVar338 = auVar29._0_4_;
          fVar220 = auVar29._4_4_;
          auVar67._4_4_ = (float)local_680._4_4_ * fVar220;
          auVar67._0_4_ = (float)local_680._0_4_ * fVar338;
          fVar344 = auVar29._8_4_;
          auVar67._8_4_ = fStack_678 * fVar344;
          fVar239 = auVar29._12_4_;
          auVar67._12_4_ = fStack_674 * fVar239;
          fVar221 = auVar29._16_4_;
          auVar67._16_4_ = register0x00001550 * fVar221;
          fVar233 = auVar29._20_4_;
          auVar67._20_4_ = register0x00001554 * fVar233;
          fVar234 = auVar29._24_4_;
          auVar67._24_4_ = register0x00001558 * fVar234;
          auVar67._28_4_ = auVar273._28_4_;
          auVar37 = vsubps_avx(auVar66,auVar67);
          auVar124._4_4_ = fVar166;
          auVar124._0_4_ = fVar146;
          auVar124._8_4_ = fStack_838;
          auVar124._12_4_ = fStack_834;
          auVar124._16_4_ = fStack_830;
          auVar124._20_4_ = fStack_82c;
          auVar124._24_4_ = fStack_828;
          auVar124._28_4_ = fStack_824;
          auVar162 = ZEXT3264(auVar124);
          auVar155 = vmaxps_avx(auVar124,_local_5a0);
          auVar68._4_4_ = auVar155._4_4_ * auVar155._4_4_ * (fVar290 * fVar290 + fVar220 * fVar220);
          auVar68._0_4_ = auVar155._0_4_ * auVar155._0_4_ * (fVar207 * fVar207 + fVar338 * fVar338);
          auVar68._8_4_ = auVar155._8_4_ * auVar155._8_4_ * (fVar235 * fVar235 + fVar344 * fVar344);
          auVar68._12_4_ =
               auVar155._12_4_ * auVar155._12_4_ * (fVar237 * fVar237 + fVar239 * fVar239);
          auVar68._16_4_ =
               auVar155._16_4_ * auVar155._16_4_ * (fVar240 * fVar240 + fVar221 * fVar221);
          auVar68._20_4_ =
               auVar155._20_4_ * auVar155._20_4_ * (fVar242 * fVar242 + fVar233 * fVar233);
          auVar68._24_4_ =
               auVar155._24_4_ * auVar155._24_4_ * (fVar244 * fVar244 + fVar234 * fVar234);
          auVar68._28_4_ = fVar289 + auVar273._28_4_;
          auVar69._4_4_ = auVar37._4_4_ * auVar37._4_4_;
          auVar69._0_4_ = auVar37._0_4_ * auVar37._0_4_;
          auVar69._8_4_ = auVar37._8_4_ * auVar37._8_4_;
          auVar69._12_4_ = auVar37._12_4_ * auVar37._12_4_;
          auVar69._16_4_ = auVar37._16_4_ * auVar37._16_4_;
          auVar69._20_4_ = auVar37._20_4_ * auVar37._20_4_;
          auVar69._24_4_ = auVar37._24_4_ * auVar37._24_4_;
          auVar69._28_4_ = auVar37._28_4_;
          auVar155 = vcmpps_avx(auVar69,auVar68,2);
          auVar195 = ZEXT3264(auVar155);
          local_320 = (uint)lVar141;
          auVar214 = vpshufd_avx(ZEXT416(local_320),0);
          auVar252 = vpor_avx(auVar214,_DAT_01ff0cf0);
          auVar214 = vpor_avx(auVar214,_DAT_02020ea0);
          auVar125._4_4_ = fStack_65c;
          auVar125._0_4_ = local_660;
          auVar125._8_4_ = fStack_658;
          auVar125._12_4_ = fStack_654;
          auVar252 = vpcmpgtd_avx(auVar125,auVar252);
          auVar214 = vpcmpgtd_avx(auVar125,auVar214);
          register0x000012d0 = auVar214;
          _local_500 = auVar252;
          auVar232 = ZEXT3264(_local_500);
          auVar37 = _local_500 & auVar155;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            local_1c0 = fVar236 * (float)local_120._0_4_ +
                        fVar276 * (float)local_180._0_4_ +
                        fVar315 * (float)local_a0._0_4_ + fVar173 * (float)local_6a0._0_4_;
            fStack_1bc = fVar246 * (float)local_120._4_4_ +
                         fVar277 * (float)local_180._4_4_ +
                         fVar241 * (float)local_a0._4_4_ + fVar176 * (float)local_6a0._4_4_;
            fStack_1b8 = fVar258 * fStack_118 +
                         fVar310 * fStack_178 + fVar279 * fStack_98 + fVar198 * fStack_698;
            fStack_1b4 = fVar261 * fStack_114 +
                         fVar311 * fStack_174 + fVar245 * fStack_94 + fVar201 * fStack_694;
            fStack_1b0 = fVar264 * fStack_110 +
                         fVar238 * fStack_170 + fVar318 * fStack_90 + fVar204 * fStack_690;
            fStack_1ac = fVar267 * fStack_10c +
                         fVar278 * fStack_16c + fVar243 * fStack_8c + fVar205 * fStack_68c;
            fStack_1a8 = fVar275 * fStack_108 +
                         fVar314 * fStack_168 + fVar280 * fStack_88 + fVar206 * fStack_688;
            fStack_1a4 = fStack_484 + fStack_104 + auVar155._28_4_ + 0.0;
            local_760._0_4_ = auVar131._0_4_;
            local_760._4_4_ = auVar131._4_4_;
            fStack_758 = auVar131._8_4_;
            fStack_754 = auVar131._12_4_;
            auStack_750._0_4_ = auVar131._16_4_;
            auStack_750._4_4_ = auVar131._20_4_;
            fStack_748 = auVar131._24_4_;
            local_620._0_4_ = auVar130._0_4_;
            local_620._4_4_ = auVar130._4_4_;
            uStack_618._0_4_ = auVar130._8_4_;
            uStack_618._4_4_ = auVar130._12_4_;
            auStack_610._0_4_ = auVar130._16_4_;
            auStack_610._4_4_ = auVar130._20_4_;
            fStack_608 = auVar130._24_4_;
            fVar176 = (float)local_a0._0_4_ * (float)local_620._0_4_;
            fVar198 = (float)local_a0._4_4_ * (float)local_620._4_4_;
            fVar201 = fStack_98 * (float)uStack_618;
            fVar204 = fStack_94 * uStack_618._4_4_;
            fVar205 = fStack_90 * (float)auStack_610._0_4_;
            fVar206 = fStack_8c * (float)auStack_610._4_4_;
            fVar289 = fStack_88 * fStack_608;
            pfVar2 = (float *)(lVar20 + 0x2228dfc + lVar141 * 4);
            fVar338 = *pfVar2;
            fVar220 = pfVar2[1];
            fVar344 = pfVar2[2];
            fVar239 = pfVar2[3];
            fVar221 = pfVar2[4];
            fVar233 = pfVar2[5];
            fVar234 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x2229280 + lVar141 * 4);
            fVar236 = *pfVar3;
            fVar246 = pfVar3[1];
            fVar258 = pfVar3[2];
            fVar261 = pfVar3[3];
            fVar264 = pfVar3[4];
            fVar267 = pfVar3[5];
            fVar275 = pfVar3[6];
            fVar290 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar20 + 0x2228978 + lVar141 * 4);
            fVar276 = *pfVar4;
            fVar277 = pfVar4[1];
            fVar310 = pfVar4[2];
            fVar311 = pfVar4[3];
            fVar238 = pfVar4[4];
            fVar278 = pfVar4[5];
            fVar314 = pfVar4[6];
            fVar173 = pfVar2[7] + pfVar3[7];
            fVar207 = pfVar3[7] + fVar290;
            fVar290 = pfVar1[7] + register0x0000155c + fVar290;
            pfVar1 = (float *)(lVar20 + 0x22284f4 + lVar141 * 4);
            fVar315 = *pfVar1;
            fVar241 = pfVar1[1];
            fVar279 = pfVar1[2];
            fVar245 = pfVar1[3];
            fVar318 = pfVar1[4];
            fVar243 = pfVar1[5];
            fVar280 = pfVar1[6];
            local_620._4_4_ =
                 (float)local_700._4_4_ * fVar241 +
                 fVar277 * (float)local_460._4_4_ +
                 (float)local_4a0._4_4_ * fVar220 + (float)local_4c0._4_4_ * fVar246;
            local_620._0_4_ =
                 (float)local_700._0_4_ * fVar315 +
                 fVar276 * (float)local_460._0_4_ +
                 (float)local_4a0._0_4_ * fVar338 + (float)local_4c0._0_4_ * fVar236;
            uStack_618._0_4_ =
                 fStack_6f8 * fVar279 +
                 fVar310 * fStack_458 + fStack_498 * fVar344 + fStack_4b8 * fVar258;
            uStack_618._4_4_ =
                 fStack_6f4 * fVar245 +
                 fVar311 * fStack_454 + fStack_494 * fVar239 + fStack_4b4 * fVar261;
            auStack_610._0_4_ =
                 fStack_6f0 * fVar318 +
                 fVar238 * fStack_450 + fStack_490 * fVar221 + fStack_4b0 * fVar264;
            auStack_610._4_4_ =
                 fStack_6ec * fVar243 +
                 fVar278 * fStack_44c + fStack_48c * fVar233 + fStack_4ac * fVar267;
            fStack_608 = fStack_6e8 * fVar280 +
                         fVar314 * fStack_448 + fStack_488 * fVar234 + fStack_4a8 * fVar275;
            fStack_604 = fVar173 + fVar207;
            auVar188._0_4_ =
                 fVar315 * (float)local_1a0._0_4_ +
                 fVar338 * (float)local_720._0_4_ + (float)local_4e0._0_4_ * fVar236 +
                 fVar276 * (float)local_440._0_4_;
            auVar188._4_4_ =
                 fVar241 * (float)local_1a0._4_4_ +
                 fVar220 * (float)local_720._4_4_ + (float)local_4e0._4_4_ * fVar246 +
                 fVar277 * (float)local_440._4_4_;
            auVar188._8_4_ =
                 fVar279 * fStack_198 +
                 fVar344 * fStack_718 + fStack_4d8 * fVar258 + fVar310 * fStack_438;
            auVar188._12_4_ =
                 fVar245 * fStack_194 +
                 fVar239 * fStack_714 + fStack_4d4 * fVar261 + fVar311 * fStack_434;
            auVar188._16_4_ =
                 fVar318 * fStack_190 +
                 fVar221 * fStack_710 + fStack_4d0 * fVar264 + fVar238 * fStack_430;
            auVar188._20_4_ =
                 fVar243 * fStack_18c +
                 fVar233 * fStack_70c + fStack_4cc * fVar267 + fVar278 * fStack_42c;
            auVar188._24_4_ =
                 fVar280 * fStack_188 +
                 fVar234 * fStack_708 + fStack_4c8 * fVar275 + fVar314 * fStack_428;
            auVar188._28_4_ = fVar207 + fVar290;
            auVar361._0_4_ =
                 fVar276 * (float)local_180._0_4_ +
                 (float)local_a0._0_4_ * fVar338 + (float)local_6a0._0_4_ * fVar236 +
                 (float)local_120._0_4_ * fVar315;
            auVar361._4_4_ =
                 fVar277 * (float)local_180._4_4_ +
                 (float)local_a0._4_4_ * fVar220 + (float)local_6a0._4_4_ * fVar246 +
                 (float)local_120._4_4_ * fVar241;
            auVar361._8_4_ =
                 fVar310 * fStack_178 + fStack_98 * fVar344 + fStack_698 * fVar258 +
                 fStack_118 * fVar279;
            auVar361._12_4_ =
                 fVar311 * fStack_174 + fStack_94 * fVar239 + fStack_694 * fVar261 +
                 fStack_114 * fVar245;
            auVar361._16_4_ =
                 fVar238 * fStack_170 + fStack_90 * fVar221 + fStack_690 * fVar264 +
                 fStack_110 * fVar318;
            auVar361._20_4_ =
                 fVar278 * fStack_16c + fStack_8c * fVar233 + fStack_68c * fVar267 +
                 fStack_10c * fVar243;
            auVar361._24_4_ =
                 fVar314 * fStack_168 + fStack_88 * fVar234 + fStack_688 * fVar275 +
                 fStack_108 * fVar280;
            auVar361._28_4_ = pfVar4[7] + fVar173 + fVar290;
            pfVar1 = (float *)(lVar20 + 0x222b21c + lVar141 * 4);
            fVar338 = *pfVar1;
            fVar220 = pfVar1[1];
            fVar344 = pfVar1[2];
            fVar239 = pfVar1[3];
            fVar221 = pfVar1[4];
            fVar233 = pfVar1[5];
            fVar234 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x222b6a0 + lVar141 * 4);
            fVar236 = *pfVar2;
            fVar246 = pfVar2[1];
            fVar258 = pfVar2[2];
            fVar261 = pfVar2[3];
            fVar264 = pfVar2[4];
            fVar267 = pfVar2[5];
            fVar275 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x222ad98 + lVar141 * 4);
            fVar276 = *pfVar3;
            fVar277 = pfVar3[1];
            fVar310 = pfVar3[2];
            fVar311 = pfVar3[3];
            fVar238 = pfVar3[4];
            fVar278 = pfVar3[5];
            fVar314 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x222a914 + lVar141 * 4);
            fVar315 = *pfVar4;
            fVar241 = pfVar4[1];
            fVar279 = pfVar4[2];
            fVar245 = pfVar4[3];
            fVar318 = pfVar4[4];
            fVar243 = pfVar4[5];
            fVar280 = pfVar4[6];
            auVar322._0_4_ =
                 (float)local_700._0_4_ * fVar315 +
                 fVar276 * (float)local_460._0_4_ +
                 fVar338 * (float)local_4a0._0_4_ + (float)local_4c0._0_4_ * fVar236;
            auVar322._4_4_ =
                 (float)local_700._4_4_ * fVar241 +
                 fVar277 * (float)local_460._4_4_ +
                 fVar220 * (float)local_4a0._4_4_ + (float)local_4c0._4_4_ * fVar246;
            auVar322._8_4_ =
                 fStack_6f8 * fVar279 +
                 fVar310 * fStack_458 + fVar344 * fStack_498 + fStack_4b8 * fVar258;
            auVar322._12_4_ =
                 fStack_6f4 * fVar245 +
                 fVar311 * fStack_454 + fVar239 * fStack_494 + fStack_4b4 * fVar261;
            auVar322._16_4_ =
                 fStack_6f0 * fVar318 +
                 fVar238 * fStack_450 + fVar221 * fStack_490 + fStack_4b0 * fVar264;
            auVar322._20_4_ =
                 fStack_6ec * fVar243 +
                 fVar278 * fStack_44c + fVar233 * fStack_48c + fStack_4ac * fVar267;
            auVar322._24_4_ =
                 fStack_6e8 * fVar280 +
                 fVar314 * fStack_448 + fVar234 * fStack_488 + fStack_4a8 * fVar275;
            auVar322._28_4_ = fStack_104 + fStack_104 + fStack_4a4 + fStack_104;
            auVar355._0_4_ =
                 fVar315 * (float)local_1a0._0_4_ +
                 fVar276 * (float)local_440._0_4_ +
                 fVar338 * (float)local_720._0_4_ + (float)local_4e0._0_4_ * fVar236;
            auVar355._4_4_ =
                 fVar241 * (float)local_1a0._4_4_ +
                 fVar277 * (float)local_440._4_4_ +
                 fVar220 * (float)local_720._4_4_ + (float)local_4e0._4_4_ * fVar246;
            auVar355._8_4_ =
                 fVar279 * fStack_198 +
                 fVar310 * fStack_438 + fVar344 * fStack_718 + fStack_4d8 * fVar258;
            auVar355._12_4_ =
                 fVar245 * fStack_194 +
                 fVar311 * fStack_434 + fVar239 * fStack_714 + fStack_4d4 * fVar261;
            auVar355._16_4_ =
                 fVar318 * fStack_190 +
                 fVar238 * fStack_430 + fVar221 * fStack_710 + fStack_4d0 * fVar264;
            auVar355._20_4_ =
                 fVar243 * fStack_18c +
                 fVar278 * fStack_42c + fVar233 * fStack_70c + fStack_4cc * fVar267;
            auVar355._24_4_ =
                 fVar280 * fStack_188 +
                 fVar314 * fStack_428 + fVar234 * fStack_708 + fStack_4c8 * fVar275;
            auVar355._28_4_ = fStack_104 + fStack_104 + fStack_4c4 + fStack_104;
            auVar274._8_4_ = 0x7fffffff;
            auVar274._0_8_ = 0x7fffffff7fffffff;
            auVar274._12_4_ = 0x7fffffff;
            auVar274._16_4_ = 0x7fffffff;
            auVar274._20_4_ = 0x7fffffff;
            auVar274._24_4_ = 0x7fffffff;
            auVar274._28_4_ = 0x7fffffff;
            auVar37 = vandps_avx(_local_620,auVar274);
            auVar329 = vandps_avx(auVar188,auVar274);
            auVar329 = vmaxps_avx(auVar37,auVar329);
            auVar37 = vandps_avx(auVar361,auVar274);
            auVar329 = vmaxps_avx(auVar329,auVar37);
            auVar329 = vcmpps_avx(auVar329,_local_1e0,1);
            auVar227 = vblendvps_avx(_local_620,auVar191,auVar329);
            auVar157._0_4_ =
                 fVar315 * (float)local_120._0_4_ +
                 fVar276 * (float)local_180._0_4_ +
                 fVar236 * (float)local_6a0._0_4_ + (float)local_a0._0_4_ * fVar338;
            auVar157._4_4_ =
                 fVar241 * (float)local_120._4_4_ +
                 fVar277 * (float)local_180._4_4_ +
                 fVar246 * (float)local_6a0._4_4_ + (float)local_a0._4_4_ * fVar220;
            auVar157._8_4_ =
                 fVar279 * fStack_118 +
                 fVar310 * fStack_178 + fVar258 * fStack_698 + fStack_98 * fVar344;
            auVar157._12_4_ =
                 fVar245 * fStack_114 +
                 fVar311 * fStack_174 + fVar261 * fStack_694 + fStack_94 * fVar239;
            auVar157._16_4_ =
                 fVar318 * fStack_110 +
                 fVar238 * fStack_170 + fVar264 * fStack_690 + fStack_90 * fVar221;
            auVar157._20_4_ =
                 fVar243 * fStack_10c +
                 fVar278 * fStack_16c + fVar267 * fStack_68c + fStack_8c * fVar233;
            auVar157._24_4_ =
                 fVar280 * fStack_108 +
                 fVar314 * fStack_168 + fVar275 * fStack_688 + fStack_88 * fVar234;
            auVar157._28_4_ = auVar37._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar226 = vblendvps_avx(auVar188,auVar29,auVar329);
            auVar37 = vandps_avx(auVar322,auVar274);
            auVar329 = vandps_avx(auVar355,auVar274);
            auVar253 = vmaxps_avx(auVar37,auVar329);
            auVar37 = vandps_avx(auVar157,auVar274);
            auVar37 = vmaxps_avx(auVar253,auVar37);
            local_7e0._0_4_ = auVar132._0_4_;
            local_7e0._4_4_ = auVar132._4_4_;
            uStack_7d8._0_4_ = auVar132._8_4_;
            uStack_7d8._4_4_ = auVar132._12_4_;
            auStack_7d0._0_4_ = auVar132._16_4_;
            auStack_7d0._4_4_ = auVar132._20_4_;
            fStack_7c8 = auVar132._24_4_;
            auVar329 = vcmpps_avx(auVar37,_local_1e0,1);
            auVar37 = vblendvps_avx(auVar322,auVar191,auVar329);
            auVar158._0_4_ =
                 (float)local_120._0_4_ * (float)local_7e0._0_4_ +
                 (float)local_180._0_4_ * (float)local_760._0_4_ +
                 fVar176 + (float)local_6a0._0_4_ * local_640;
            auVar158._4_4_ =
                 (float)local_120._4_4_ * (float)local_7e0._4_4_ +
                 (float)local_180._4_4_ * (float)local_760._4_4_ +
                 fVar198 + (float)local_6a0._4_4_ * fStack_63c;
            auVar158._8_4_ =
                 fStack_118 * (float)uStack_7d8 +
                 fStack_178 * fStack_758 + fVar201 + fStack_698 * fStack_638;
            auVar158._12_4_ =
                 fStack_114 * uStack_7d8._4_4_ +
                 fStack_174 * fStack_754 + fVar204 + fStack_694 * fStack_634;
            auVar158._16_4_ =
                 fStack_110 * (float)auStack_7d0._0_4_ +
                 fStack_170 * (float)auStack_750._0_4_ + fVar205 + fStack_690 * fStack_630;
            auVar158._20_4_ =
                 fStack_10c * (float)auStack_7d0._4_4_ +
                 fStack_16c * (float)auStack_750._4_4_ + fVar206 + fStack_68c * fStack_62c;
            auVar158._24_4_ =
                 fStack_108 * fStack_7c8 +
                 fStack_168 * fStack_748 + fVar289 + fStack_688 * fStack_628;
            auVar158._28_4_ = auVar253._28_4_ + fStack_1a4 + auVar155._28_4_ + 0.0;
            auVar329 = vblendvps_avx(auVar355,auVar29,auVar329);
            fVar289 = auVar227._0_4_;
            fVar207 = auVar227._4_4_;
            fVar290 = auVar227._8_4_;
            fVar235 = auVar227._12_4_;
            fVar237 = auVar227._16_4_;
            fVar240 = auVar227._20_4_;
            fVar242 = auVar227._24_4_;
            fVar244 = auVar227._28_4_;
            fVar276 = auVar37._0_4_;
            fVar310 = auVar37._4_4_;
            fVar238 = auVar37._8_4_;
            fVar314 = auVar37._12_4_;
            fVar241 = auVar37._16_4_;
            fVar245 = auVar37._20_4_;
            fVar243 = auVar37._24_4_;
            fVar338 = auVar226._0_4_;
            fVar344 = auVar226._4_4_;
            fVar221 = auVar226._8_4_;
            fVar234 = auVar226._12_4_;
            fVar246 = auVar226._16_4_;
            fVar261 = auVar226._20_4_;
            fVar267 = auVar226._24_4_;
            auVar330._0_4_ = fVar338 * fVar338 + fVar289 * fVar289;
            auVar330._4_4_ = fVar344 * fVar344 + fVar207 * fVar207;
            auVar330._8_4_ = fVar221 * fVar221 + fVar290 * fVar290;
            auVar330._12_4_ = fVar234 * fVar234 + fVar235 * fVar235;
            auVar330._16_4_ = fVar246 * fVar246 + fVar237 * fVar237;
            auVar330._20_4_ = fVar261 * fVar261 + fVar240 * fVar240;
            auVar330._24_4_ = fVar267 * fVar267 + fVar242 * fVar242;
            auVar330._28_4_ = auVar191._28_4_ + auVar29._28_4_;
            auVar191 = vrsqrtps_avx(auVar330);
            fVar220 = auVar191._0_4_;
            fVar239 = auVar191._4_4_;
            auVar70._4_4_ = fVar239 * 1.5;
            auVar70._0_4_ = fVar220 * 1.5;
            fVar233 = auVar191._8_4_;
            auVar70._8_4_ = fVar233 * 1.5;
            fVar236 = auVar191._12_4_;
            auVar70._12_4_ = fVar236 * 1.5;
            fVar258 = auVar191._16_4_;
            auVar70._16_4_ = fVar258 * 1.5;
            fVar264 = auVar191._20_4_;
            auVar70._20_4_ = fVar264 * 1.5;
            fVar275 = auVar191._24_4_;
            auVar70._24_4_ = fVar275 * 1.5;
            auVar70._28_4_ = auVar355._28_4_;
            auVar71._4_4_ = fVar239 * fVar239 * fVar239 * auVar330._4_4_ * 0.5;
            auVar71._0_4_ = fVar220 * fVar220 * fVar220 * auVar330._0_4_ * 0.5;
            auVar71._8_4_ = fVar233 * fVar233 * fVar233 * auVar330._8_4_ * 0.5;
            auVar71._12_4_ = fVar236 * fVar236 * fVar236 * auVar330._12_4_ * 0.5;
            auVar71._16_4_ = fVar258 * fVar258 * fVar258 * auVar330._16_4_ * 0.5;
            auVar71._20_4_ = fVar264 * fVar264 * fVar264 * auVar330._20_4_ * 0.5;
            auVar71._24_4_ = fVar275 * fVar275 * fVar275 * auVar330._24_4_ * 0.5;
            auVar71._28_4_ = auVar330._28_4_;
            auVar29 = vsubps_avx(auVar70,auVar71);
            fVar173 = auVar29._0_4_;
            fVar176 = auVar29._4_4_;
            fVar198 = auVar29._8_4_;
            fVar201 = auVar29._12_4_;
            fVar204 = auVar29._16_4_;
            fVar205 = auVar29._20_4_;
            fVar206 = auVar29._24_4_;
            fVar220 = auVar329._0_4_;
            fVar239 = auVar329._4_4_;
            fVar233 = auVar329._8_4_;
            fVar236 = auVar329._12_4_;
            fVar258 = auVar329._16_4_;
            fVar264 = auVar329._20_4_;
            fVar275 = auVar329._24_4_;
            auVar307._0_4_ = fVar220 * fVar220 + fVar276 * fVar276;
            auVar307._4_4_ = fVar239 * fVar239 + fVar310 * fVar310;
            auVar307._8_4_ = fVar233 * fVar233 + fVar238 * fVar238;
            auVar307._12_4_ = fVar236 * fVar236 + fVar314 * fVar314;
            auVar307._16_4_ = fVar258 * fVar258 + fVar241 * fVar241;
            auVar307._20_4_ = fVar264 * fVar264 + fVar245 * fVar245;
            auVar307._24_4_ = fVar275 * fVar275 + fVar243 * fVar243;
            auVar307._28_4_ = auVar191._28_4_ + auVar37._28_4_;
            auVar191 = vrsqrtps_avx(auVar307);
            fVar277 = auVar191._0_4_;
            fVar311 = auVar191._4_4_;
            auVar72._4_4_ = fVar311 * 1.5;
            auVar72._0_4_ = fVar277 * 1.5;
            fVar278 = auVar191._8_4_;
            auVar72._8_4_ = fVar278 * 1.5;
            fVar315 = auVar191._12_4_;
            auVar72._12_4_ = fVar315 * 1.5;
            fVar279 = auVar191._16_4_;
            auVar72._16_4_ = fVar279 * 1.5;
            fVar318 = auVar191._20_4_;
            auVar72._20_4_ = fVar318 * 1.5;
            fVar280 = auVar191._24_4_;
            auVar72._24_4_ = fVar280 * 1.5;
            auVar72._28_4_ = auVar355._28_4_;
            auVar73._4_4_ = fVar311 * fVar311 * fVar311 * auVar307._4_4_ * 0.5;
            auVar73._0_4_ = fVar277 * fVar277 * fVar277 * auVar307._0_4_ * 0.5;
            auVar73._8_4_ = fVar278 * fVar278 * fVar278 * auVar307._8_4_ * 0.5;
            auVar73._12_4_ = fVar315 * fVar315 * fVar315 * auVar307._12_4_ * 0.5;
            auVar73._16_4_ = fVar279 * fVar279 * fVar279 * auVar307._16_4_ * 0.5;
            auVar73._20_4_ = fVar318 * fVar318 * fVar318 * auVar307._20_4_ * 0.5;
            auVar73._24_4_ = fVar280 * fVar280 * fVar280 * auVar307._24_4_ * 0.5;
            auVar73._28_4_ = auVar307._28_4_;
            auVar29 = vsubps_avx(auVar72,auVar73);
            fVar277 = auVar29._0_4_;
            fVar311 = auVar29._4_4_;
            fVar278 = auVar29._8_4_;
            fVar315 = auVar29._12_4_;
            fVar279 = auVar29._16_4_;
            fVar318 = auVar29._20_4_;
            fVar280 = auVar29._24_4_;
            fVar338 = fVar146 * fVar173 * fVar338;
            fVar344 = fVar166 * fVar176 * fVar344;
            auVar74._4_4_ = fVar344;
            auVar74._0_4_ = fVar338;
            fVar221 = fStack_838 * fVar198 * fVar221;
            auVar74._8_4_ = fVar221;
            fVar234 = fStack_834 * fVar201 * fVar234;
            auVar74._12_4_ = fVar234;
            fVar246 = fStack_830 * fVar204 * fVar246;
            auVar74._16_4_ = fVar246;
            fVar261 = fStack_82c * fVar205 * fVar261;
            auVar74._20_4_ = fVar261;
            fVar267 = fStack_828 * fVar206 * fVar267;
            auVar74._24_4_ = fVar267;
            auVar74._28_4_ = auVar191._28_4_;
            local_7e0._4_4_ = fVar344 + (float)local_680._4_4_;
            local_7e0._0_4_ = fVar338 + (float)local_680._0_4_;
            uStack_7d8._0_4_ = fVar221 + fStack_678;
            uStack_7d8._4_4_ = fVar234 + fStack_674;
            auStack_7d0._0_4_ = fVar246 + register0x00001550;
            auStack_7d0._4_4_ = fVar261 + register0x00001554;
            fStack_7c8 = fVar267 + register0x00001558;
            fStack_7c4 = auVar191._28_4_ + register0x0000155c;
            fVar338 = fVar146 * fVar173 * -fVar289;
            fVar344 = fVar166 * fVar176 * -fVar207;
            auVar75._4_4_ = fVar344;
            auVar75._0_4_ = fVar338;
            fVar221 = fStack_838 * fVar198 * -fVar290;
            auVar75._8_4_ = fVar221;
            fVar234 = fStack_834 * fVar201 * -fVar235;
            auVar75._12_4_ = fVar234;
            fVar246 = fStack_830 * fVar204 * -fVar237;
            auVar75._16_4_ = fVar246;
            fVar261 = fStack_82c * fVar205 * -fVar240;
            auVar75._20_4_ = fVar261;
            fVar267 = fStack_828 * fVar206 * -fVar242;
            auVar75._24_4_ = fVar267;
            auVar75._28_4_ = -fVar244;
            local_760._4_4_ = auVar231._4_4_ + fVar344;
            local_760._0_4_ = auVar231._0_4_ + fVar338;
            fStack_758 = auVar231._8_4_ + fVar221;
            fStack_754 = auVar231._12_4_ + fVar234;
            auStack_750._0_4_ = auVar231._16_4_ + fVar246;
            auStack_750._4_4_ = auVar231._20_4_ + fVar261;
            fStack_748 = auVar231._24_4_ + fVar267;
            fStack_744 = auVar231._28_4_ + -fVar244;
            fVar338 = fVar173 * 0.0 * fVar146;
            fVar344 = fVar176 * 0.0 * fVar166;
            auVar76._4_4_ = fVar344;
            auVar76._0_4_ = fVar338;
            fVar221 = fVar198 * 0.0 * fStack_838;
            auVar76._8_4_ = fVar221;
            fVar234 = fVar201 * 0.0 * fStack_834;
            auVar76._12_4_ = fVar234;
            fVar246 = fVar204 * 0.0 * fStack_830;
            auVar76._16_4_ = fVar246;
            fVar261 = fVar205 * 0.0 * fStack_82c;
            auVar76._20_4_ = fVar261;
            fVar267 = fVar206 * 0.0 * fStack_828;
            auVar76._24_4_ = fVar267;
            auVar76._28_4_ = fVar244;
            auVar253 = vsubps_avx(_local_680,auVar74);
            auVar380._0_4_ = fVar338 + auVar158._0_4_;
            auVar380._4_4_ = fVar344 + auVar158._4_4_;
            auVar380._8_4_ = fVar221 + auVar158._8_4_;
            auVar380._12_4_ = fVar234 + auVar158._12_4_;
            auVar380._16_4_ = fVar246 + auVar158._16_4_;
            auVar380._20_4_ = fVar261 + auVar158._20_4_;
            auVar380._24_4_ = fVar267 + auVar158._24_4_;
            auVar380._28_4_ = fVar244 + auVar158._28_4_;
            fVar338 = (float)local_5a0._0_4_ * fVar277 * fVar220;
            fVar220 = (float)local_5a0._4_4_ * fVar311 * fVar239;
            auVar77._4_4_ = fVar220;
            auVar77._0_4_ = fVar338;
            fVar344 = fStack_598 * fVar278 * fVar233;
            auVar77._8_4_ = fVar344;
            fVar239 = fStack_594 * fVar315 * fVar236;
            auVar77._12_4_ = fVar239;
            fVar221 = fStack_590 * fVar279 * fVar258;
            auVar77._16_4_ = fVar221;
            fVar233 = fStack_58c * fVar318 * fVar264;
            auVar77._20_4_ = fVar233;
            fVar234 = fStack_588 * fVar280 * fVar275;
            auVar77._24_4_ = fVar234;
            auVar77._28_4_ = fStack_824;
            auVar32 = vsubps_avx(auVar231,auVar75);
            auVar362._0_4_ = auVar156._0_4_ + fVar338;
            auVar362._4_4_ = auVar156._4_4_ + fVar220;
            auVar362._8_4_ = auVar156._8_4_ + fVar344;
            auVar362._12_4_ = auVar156._12_4_ + fVar239;
            auVar362._16_4_ = auVar156._16_4_ + fVar221;
            auVar362._20_4_ = auVar156._20_4_ + fVar233;
            auVar362._24_4_ = auVar156._24_4_ + fVar234;
            auVar362._28_4_ = auVar156._28_4_ + fStack_824;
            fVar338 = fVar277 * -fVar276 * (float)local_5a0._0_4_;
            fVar220 = fVar311 * -fVar310 * (float)local_5a0._4_4_;
            auVar78._4_4_ = fVar220;
            auVar78._0_4_ = fVar338;
            fVar344 = fVar278 * -fVar238 * fStack_598;
            auVar78._8_4_ = fVar344;
            fVar239 = fVar315 * -fVar314 * fStack_594;
            auVar78._12_4_ = fVar239;
            fVar221 = fVar279 * -fVar241 * fStack_590;
            auVar78._16_4_ = fVar221;
            fVar233 = fVar318 * -fVar245 * fStack_58c;
            auVar78._20_4_ = fVar233;
            fVar234 = fVar280 * -fVar243 * fStack_588;
            auVar78._24_4_ = fVar234;
            auVar78._28_4_ = register0x0000155c;
            auVar33 = vsubps_avx(auVar158,auVar76);
            auVar256._0_4_ = auVar273._0_4_ + fVar338;
            auVar256._4_4_ = auVar273._4_4_ + fVar220;
            auVar256._8_4_ = auVar273._8_4_ + fVar344;
            auVar256._12_4_ = auVar273._12_4_ + fVar239;
            auVar256._16_4_ = auVar273._16_4_ + fVar221;
            auVar256._20_4_ = auVar273._20_4_ + fVar233;
            auVar256._24_4_ = auVar273._24_4_ + fVar234;
            auVar256._28_4_ = auVar273._28_4_ + register0x0000155c;
            fVar338 = fVar277 * 0.0 * (float)local_5a0._0_4_;
            fVar220 = fVar311 * 0.0 * (float)local_5a0._4_4_;
            auVar79._4_4_ = fVar220;
            auVar79._0_4_ = fVar338;
            fVar344 = fVar278 * 0.0 * fStack_598;
            auVar79._8_4_ = fVar344;
            fVar239 = fVar315 * 0.0 * fStack_594;
            auVar79._12_4_ = fVar239;
            fVar221 = fVar279 * 0.0 * fStack_590;
            auVar79._16_4_ = fVar221;
            fVar233 = fVar318 * 0.0 * fStack_58c;
            auVar79._20_4_ = fVar233;
            fVar234 = fVar280 * 0.0 * fStack_588;
            auVar79._24_4_ = fVar234;
            auVar79._28_4_ = auVar158._28_4_;
            auVar191 = vsubps_avx(auVar156,auVar77);
            auVar129._4_4_ = fStack_1bc;
            auVar129._0_4_ = local_1c0;
            auVar129._8_4_ = fStack_1b8;
            auVar129._12_4_ = fStack_1b4;
            auVar129._16_4_ = fStack_1b0;
            auVar129._20_4_ = fStack_1ac;
            auVar129._24_4_ = fStack_1a8;
            auVar129._28_4_ = fStack_1a4;
            auVar323._0_4_ = local_1c0 + fVar338;
            auVar323._4_4_ = fStack_1bc + fVar220;
            auVar323._8_4_ = fStack_1b8 + fVar344;
            auVar323._12_4_ = fStack_1b4 + fVar239;
            auVar323._16_4_ = fStack_1b0 + fVar221;
            auVar323._20_4_ = fStack_1ac + fVar233;
            auVar323._24_4_ = fStack_1a8 + fVar234;
            auVar323._28_4_ = fStack_1a4 + auVar158._28_4_;
            auVar37 = vsubps_avx(auVar273,auVar78);
            auVar329 = vsubps_avx(auVar129,auVar79);
            auVar227 = vsubps_avx(auVar256,auVar32);
            auVar226 = vsubps_avx(auVar323,auVar33);
            auVar80._4_4_ = auVar33._4_4_ * auVar227._4_4_;
            auVar80._0_4_ = auVar33._0_4_ * auVar227._0_4_;
            auVar80._8_4_ = auVar33._8_4_ * auVar227._8_4_;
            auVar80._12_4_ = auVar33._12_4_ * auVar227._12_4_;
            auVar80._16_4_ = auVar33._16_4_ * auVar227._16_4_;
            auVar80._20_4_ = auVar33._20_4_ * auVar227._20_4_;
            auVar80._24_4_ = auVar33._24_4_ * auVar227._24_4_;
            auVar80._28_4_ = auVar355._28_4_;
            auVar81._4_4_ = auVar32._4_4_ * auVar226._4_4_;
            auVar81._0_4_ = auVar32._0_4_ * auVar226._0_4_;
            auVar81._8_4_ = auVar32._8_4_ * auVar226._8_4_;
            auVar81._12_4_ = auVar32._12_4_ * auVar226._12_4_;
            auVar81._16_4_ = auVar32._16_4_ * auVar226._16_4_;
            auVar81._20_4_ = auVar32._20_4_ * auVar226._20_4_;
            auVar81._24_4_ = auVar32._24_4_ * auVar226._24_4_;
            auVar81._28_4_ = auVar273._28_4_;
            auVar306 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar253._4_4_ * auVar226._4_4_;
            auVar82._0_4_ = auVar253._0_4_ * auVar226._0_4_;
            auVar82._8_4_ = auVar253._8_4_ * auVar226._8_4_;
            auVar82._12_4_ = auVar253._12_4_ * auVar226._12_4_;
            auVar82._16_4_ = auVar253._16_4_ * auVar226._16_4_;
            auVar82._20_4_ = auVar253._20_4_ * auVar226._20_4_;
            auVar82._24_4_ = auVar253._24_4_ * auVar226._24_4_;
            auVar82._28_4_ = auVar226._28_4_;
            auVar226 = vsubps_avx(auVar362,auVar253);
            auVar83._4_4_ = auVar33._4_4_ * auVar226._4_4_;
            auVar83._0_4_ = auVar33._0_4_ * auVar226._0_4_;
            auVar83._8_4_ = auVar33._8_4_ * auVar226._8_4_;
            auVar83._12_4_ = auVar33._12_4_ * auVar226._12_4_;
            auVar83._16_4_ = auVar33._16_4_ * auVar226._16_4_;
            auVar83._20_4_ = auVar33._20_4_ * auVar226._20_4_;
            auVar83._24_4_ = auVar33._24_4_ * auVar226._24_4_;
            auVar83._28_4_ = auVar29._28_4_;
            auVar320 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar32._4_4_ * auVar226._4_4_;
            auVar84._0_4_ = auVar32._0_4_ * auVar226._0_4_;
            auVar84._8_4_ = auVar32._8_4_ * auVar226._8_4_;
            auVar84._12_4_ = auVar32._12_4_ * auVar226._12_4_;
            auVar84._16_4_ = auVar32._16_4_ * auVar226._16_4_;
            auVar84._20_4_ = auVar32._20_4_ * auVar226._20_4_;
            auVar84._24_4_ = auVar32._24_4_ * auVar226._24_4_;
            auVar84._28_4_ = auVar29._28_4_;
            auVar85._4_4_ = auVar253._4_4_ * auVar227._4_4_;
            auVar85._0_4_ = auVar253._0_4_ * auVar227._0_4_;
            auVar85._8_4_ = auVar253._8_4_ * auVar227._8_4_;
            auVar85._12_4_ = auVar253._12_4_ * auVar227._12_4_;
            auVar85._16_4_ = auVar253._16_4_ * auVar227._16_4_;
            auVar85._20_4_ = auVar253._20_4_ * auVar227._20_4_;
            auVar85._24_4_ = auVar253._24_4_ * auVar227._24_4_;
            auVar85._28_4_ = auVar227._28_4_;
            auVar29 = vsubps_avx(auVar85,auVar84);
            auVar189._0_4_ = auVar306._0_4_ * 0.0 + auVar29._0_4_ + auVar320._0_4_ * 0.0;
            auVar189._4_4_ = auVar306._4_4_ * 0.0 + auVar29._4_4_ + auVar320._4_4_ * 0.0;
            auVar189._8_4_ = auVar306._8_4_ * 0.0 + auVar29._8_4_ + auVar320._8_4_ * 0.0;
            auVar189._12_4_ = auVar306._12_4_ * 0.0 + auVar29._12_4_ + auVar320._12_4_ * 0.0;
            auVar189._16_4_ = auVar306._16_4_ * 0.0 + auVar29._16_4_ + auVar320._16_4_ * 0.0;
            auVar189._20_4_ = auVar306._20_4_ * 0.0 + auVar29._20_4_ + auVar320._20_4_ * 0.0;
            auVar189._24_4_ = auVar306._24_4_ * 0.0 + auVar29._24_4_ + auVar320._24_4_ * 0.0;
            auVar189._28_4_ = auVar306._28_4_ + auVar29._28_4_ + auVar320._28_4_;
            auVar352 = vcmpps_avx(auVar189,ZEXT832(0) << 0x20,2);
            auVar191 = vblendvps_avx(auVar191,_local_7e0,auVar352);
            auVar232 = ZEXT3264(auVar191);
            auVar29 = vblendvps_avx(auVar37,_local_760,auVar352);
            auVar37 = vblendvps_avx(auVar329,auVar380,auVar352);
            auVar329 = vblendvps_avx(auVar253,auVar362,auVar352);
            auVar227 = vblendvps_avx(auVar32,auVar256,auVar352);
            auVar226 = vblendvps_avx(auVar33,auVar323,auVar352);
            auVar253 = vblendvps_avx(auVar362,auVar253,auVar352);
            auVar306 = vblendvps_avx(auVar256,auVar32,auVar352);
            auVar320 = vblendvps_avx(auVar323,auVar33,auVar352);
            _local_860 = vandps_avx(auVar155,_local_500);
            auVar253 = vsubps_avx(auVar253,auVar191);
            auVar34 = vsubps_avx(auVar306,auVar29);
            auVar320 = vsubps_avx(auVar320,auVar37);
            auVar35 = vsubps_avx(auVar29,auVar227);
            fVar338 = auVar34._0_4_;
            fVar291 = auVar37._0_4_;
            fVar236 = auVar34._4_4_;
            fVar299 = auVar37._4_4_;
            auVar86._4_4_ = fVar299 * fVar236;
            auVar86._0_4_ = fVar291 * fVar338;
            fVar276 = auVar34._8_4_;
            fVar248 = auVar37._8_4_;
            auVar86._8_4_ = fVar248 * fVar276;
            fVar315 = auVar34._12_4_;
            fVar260 = auVar37._12_4_;
            auVar86._12_4_ = fVar260 * fVar315;
            fVar173 = auVar34._16_4_;
            fVar263 = auVar37._16_4_;
            auVar86._16_4_ = fVar263 * fVar173;
            fVar289 = auVar34._20_4_;
            fVar266 = auVar37._20_4_;
            auVar86._20_4_ = fVar266 * fVar289;
            fVar244 = auVar34._24_4_;
            fVar143 = auVar37._24_4_;
            auVar86._24_4_ = fVar143 * fVar244;
            auVar86._28_4_ = auVar306._28_4_;
            fVar220 = auVar29._0_4_;
            fVar144 = auVar320._0_4_;
            fVar246 = auVar29._4_4_;
            fVar163 = auVar320._4_4_;
            auVar87._4_4_ = fVar163 * fVar246;
            auVar87._0_4_ = fVar144 * fVar220;
            fVar277 = auVar29._8_4_;
            fVar164 = auVar320._8_4_;
            auVar87._8_4_ = fVar164 * fVar277;
            fVar241 = auVar29._12_4_;
            fVar167 = auVar320._12_4_;
            auVar87._12_4_ = fVar167 * fVar241;
            fVar176 = auVar29._16_4_;
            fVar168 = auVar320._16_4_;
            auVar87._16_4_ = fVar168 * fVar176;
            fVar207 = auVar29._20_4_;
            fVar170 = auVar320._20_4_;
            auVar87._20_4_ = fVar170 * fVar207;
            fVar282 = auVar29._24_4_;
            fVar171 = auVar320._24_4_;
            uVar10 = auVar32._28_4_;
            auVar87._24_4_ = fVar171 * fVar282;
            auVar87._28_4_ = uVar10;
            auVar306 = vsubps_avx(auVar87,auVar86);
            fVar344 = auVar191._0_4_;
            fVar258 = auVar191._4_4_;
            auVar88._4_4_ = fVar163 * fVar258;
            auVar88._0_4_ = fVar144 * fVar344;
            fVar310 = auVar191._8_4_;
            auVar88._8_4_ = fVar164 * fVar310;
            fVar279 = auVar191._12_4_;
            auVar88._12_4_ = fVar167 * fVar279;
            fVar198 = auVar191._16_4_;
            auVar88._16_4_ = fVar168 * fVar198;
            fVar290 = auVar191._20_4_;
            auVar88._20_4_ = fVar170 * fVar290;
            fVar309 = auVar191._24_4_;
            auVar88._24_4_ = fVar171 * fVar309;
            auVar88._28_4_ = uVar10;
            fVar239 = auVar253._0_4_;
            fVar261 = auVar253._4_4_;
            auVar89._4_4_ = fVar299 * fVar261;
            auVar89._0_4_ = fVar291 * fVar239;
            fVar311 = auVar253._8_4_;
            auVar89._8_4_ = fVar248 * fVar311;
            fVar245 = auVar253._12_4_;
            auVar89._12_4_ = fVar260 * fVar245;
            fVar201 = auVar253._16_4_;
            auVar89._16_4_ = fVar263 * fVar201;
            fVar235 = auVar253._20_4_;
            auVar89._20_4_ = fVar266 * fVar235;
            fVar312 = auVar253._24_4_;
            auVar89._24_4_ = fVar143 * fVar312;
            auVar89._28_4_ = auVar362._28_4_;
            auVar32 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar246 * fVar261;
            auVar90._0_4_ = fVar220 * fVar239;
            auVar90._8_4_ = fVar277 * fVar311;
            auVar90._12_4_ = fVar241 * fVar245;
            auVar90._16_4_ = fVar176 * fVar201;
            auVar90._20_4_ = fVar207 * fVar235;
            auVar90._24_4_ = fVar282 * fVar312;
            auVar90._28_4_ = uVar10;
            auVar91._4_4_ = fVar258 * fVar236;
            auVar91._0_4_ = fVar344 * fVar338;
            auVar91._8_4_ = fVar310 * fVar276;
            auVar91._12_4_ = fVar279 * fVar315;
            auVar91._16_4_ = fVar198 * fVar173;
            auVar91._20_4_ = fVar290 * fVar289;
            auVar91._24_4_ = fVar309 * fVar244;
            auVar91._28_4_ = auVar33._28_4_;
            auVar33 = vsubps_avx(auVar91,auVar90);
            auVar36 = vsubps_avx(auVar37,auVar226);
            fVar233 = auVar33._28_4_ + auVar32._28_4_;
            auVar331._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar306._0_4_ * 0.0;
            auVar331._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar306._4_4_ * 0.0;
            auVar331._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar306._8_4_ * 0.0;
            auVar331._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar306._12_4_ * 0.0;
            auVar331._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar306._16_4_ * 0.0;
            auVar331._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar306._20_4_ * 0.0;
            auVar331._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar306._24_4_ * 0.0;
            auVar331._28_4_ = fVar233 + auVar306._28_4_;
            fVar221 = auVar35._0_4_;
            fVar264 = auVar35._4_4_;
            auVar92._4_4_ = auVar226._4_4_ * fVar264;
            auVar92._0_4_ = auVar226._0_4_ * fVar221;
            fVar238 = auVar35._8_4_;
            auVar92._8_4_ = auVar226._8_4_ * fVar238;
            fVar318 = auVar35._12_4_;
            auVar92._12_4_ = auVar226._12_4_ * fVar318;
            fVar204 = auVar35._16_4_;
            auVar92._16_4_ = auVar226._16_4_ * fVar204;
            fVar237 = auVar35._20_4_;
            auVar92._20_4_ = auVar226._20_4_ * fVar237;
            fVar313 = auVar35._24_4_;
            auVar92._24_4_ = auVar226._24_4_ * fVar313;
            auVar92._28_4_ = fVar233;
            fVar233 = auVar36._0_4_;
            fVar267 = auVar36._4_4_;
            auVar93._4_4_ = auVar227._4_4_ * fVar267;
            auVar93._0_4_ = auVar227._0_4_ * fVar233;
            fVar278 = auVar36._8_4_;
            auVar93._8_4_ = auVar227._8_4_ * fVar278;
            fVar243 = auVar36._12_4_;
            auVar93._12_4_ = auVar227._12_4_ * fVar243;
            fVar205 = auVar36._16_4_;
            auVar93._16_4_ = auVar227._16_4_ * fVar205;
            fVar240 = auVar36._20_4_;
            auVar93._20_4_ = auVar227._20_4_ * fVar240;
            fVar316 = auVar36._24_4_;
            auVar93._24_4_ = auVar227._24_4_ * fVar316;
            auVar93._28_4_ = auVar33._28_4_;
            auVar32 = vsubps_avx(auVar93,auVar92);
            auVar33 = vsubps_avx(auVar191,auVar329);
            fVar234 = auVar33._0_4_;
            fVar275 = auVar33._4_4_;
            auVar94._4_4_ = auVar226._4_4_ * fVar275;
            auVar94._0_4_ = auVar226._0_4_ * fVar234;
            fVar314 = auVar33._8_4_;
            auVar94._8_4_ = auVar226._8_4_ * fVar314;
            fVar280 = auVar33._12_4_;
            auVar94._12_4_ = auVar226._12_4_ * fVar280;
            fVar206 = auVar33._16_4_;
            auVar94._16_4_ = auVar226._16_4_ * fVar206;
            fVar242 = auVar33._20_4_;
            auVar94._20_4_ = auVar226._20_4_ * fVar242;
            fVar317 = auVar33._24_4_;
            auVar94._24_4_ = auVar226._24_4_ * fVar317;
            auVar94._28_4_ = auVar226._28_4_;
            auVar95._4_4_ = fVar267 * auVar329._4_4_;
            auVar95._0_4_ = fVar233 * auVar329._0_4_;
            auVar95._8_4_ = fVar278 * auVar329._8_4_;
            auVar95._12_4_ = fVar243 * auVar329._12_4_;
            auVar95._16_4_ = fVar205 * auVar329._16_4_;
            auVar95._20_4_ = fVar240 * auVar329._20_4_;
            auVar95._24_4_ = fVar316 * auVar329._24_4_;
            auVar95._28_4_ = auVar306._28_4_;
            auVar226 = vsubps_avx(auVar94,auVar95);
            auVar381 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar96._4_4_ = auVar227._4_4_ * fVar275;
            auVar96._0_4_ = auVar227._0_4_ * fVar234;
            auVar96._8_4_ = auVar227._8_4_ * fVar314;
            auVar96._12_4_ = auVar227._12_4_ * fVar280;
            auVar96._16_4_ = auVar227._16_4_ * fVar206;
            auVar96._20_4_ = auVar227._20_4_ * fVar242;
            auVar96._24_4_ = auVar227._24_4_ * fVar317;
            auVar96._28_4_ = auVar227._28_4_;
            auVar97._4_4_ = fVar264 * auVar329._4_4_;
            auVar97._0_4_ = fVar221 * auVar329._0_4_;
            auVar97._8_4_ = fVar238 * auVar329._8_4_;
            auVar97._12_4_ = fVar318 * auVar329._12_4_;
            auVar97._16_4_ = fVar204 * auVar329._16_4_;
            auVar97._20_4_ = fVar237 * auVar329._20_4_;
            auVar97._24_4_ = fVar313 * auVar329._24_4_;
            auVar97._28_4_ = auVar329._28_4_;
            auVar329 = vsubps_avx(auVar97,auVar96);
            auVar306 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar159._0_4_ = auVar32._0_4_ * 0.0 + auVar329._0_4_ + auVar226._0_4_ * 0.0;
            auVar159._4_4_ = auVar32._4_4_ * 0.0 + auVar329._4_4_ + auVar226._4_4_ * 0.0;
            auVar159._8_4_ = auVar32._8_4_ * 0.0 + auVar329._8_4_ + auVar226._8_4_ * 0.0;
            auVar159._12_4_ = auVar32._12_4_ * 0.0 + auVar329._12_4_ + auVar226._12_4_ * 0.0;
            auVar159._16_4_ = auVar32._16_4_ * 0.0 + auVar329._16_4_ + auVar226._16_4_ * 0.0;
            auVar159._20_4_ = auVar32._20_4_ * 0.0 + auVar329._20_4_ + auVar226._20_4_ * 0.0;
            auVar159._24_4_ = auVar32._24_4_ * 0.0 + auVar329._24_4_ + auVar226._24_4_ * 0.0;
            auVar159._28_4_ = auVar226._28_4_ + auVar329._28_4_ + auVar226._28_4_;
            auVar162 = ZEXT3264(auVar159);
            auVar329 = vmaxps_avx(auVar331,auVar159);
            auVar329 = vcmpps_avx(auVar329,auVar306,2);
            auVar227 = _local_860 & auVar329;
            if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar227 >> 0x7f,0) == '\0') &&
                  (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar227 >> 0xbf,0) == '\0') &&
                (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar227[0x1f]) {
LAB_0104f1e4:
              auVar195 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              auVar324 = ZEXT3264(local_520);
              auVar341._4_4_ = fVar166;
              auVar341._0_4_ = fVar146;
              auVar341._8_4_ = fStack_838;
              auVar341._12_4_ = fStack_834;
              auVar341._16_4_ = fStack_830;
              auVar341._20_4_ = fStack_82c;
              auVar341._24_4_ = fStack_828;
              auVar341._28_4_ = fStack_824;
            }
            else {
              auVar227 = vandps_avx(auVar329,_local_860);
              auVar98._4_4_ = fVar267 * fVar236;
              auVar98._0_4_ = fVar233 * fVar338;
              auVar98._8_4_ = fVar278 * fVar276;
              auVar98._12_4_ = fVar243 * fVar315;
              auVar98._16_4_ = fVar205 * fVar173;
              auVar98._20_4_ = fVar240 * fVar289;
              auVar98._24_4_ = fVar316 * fVar244;
              auVar98._28_4_ = local_860._28_4_;
              auVar99._4_4_ = fVar264 * fVar163;
              auVar99._0_4_ = fVar221 * fVar144;
              auVar99._8_4_ = fVar238 * fVar164;
              auVar99._12_4_ = fVar318 * fVar167;
              auVar99._16_4_ = fVar204 * fVar168;
              auVar99._20_4_ = fVar237 * fVar170;
              auVar99._24_4_ = fVar313 * fVar171;
              auVar99._28_4_ = auVar329._28_4_;
              auVar226 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar275 * fVar163;
              auVar100._0_4_ = fVar234 * fVar144;
              auVar100._8_4_ = fVar314 * fVar164;
              auVar100._12_4_ = fVar280 * fVar167;
              auVar100._16_4_ = fVar206 * fVar168;
              auVar100._20_4_ = fVar242 * fVar170;
              auVar100._24_4_ = fVar317 * fVar171;
              auVar100._28_4_ = auVar320._28_4_;
              auVar101._4_4_ = fVar267 * fVar261;
              auVar101._0_4_ = fVar233 * fVar239;
              auVar101._8_4_ = fVar278 * fVar311;
              auVar101._12_4_ = fVar243 * fVar245;
              auVar101._16_4_ = fVar205 * fVar201;
              auVar101._20_4_ = fVar240 * fVar235;
              auVar101._24_4_ = fVar316 * fVar312;
              auVar101._28_4_ = auVar36._28_4_;
              auVar320 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar264 * fVar261;
              auVar102._0_4_ = fVar221 * fVar239;
              auVar102._8_4_ = fVar238 * fVar311;
              auVar102._12_4_ = fVar318 * fVar245;
              auVar102._16_4_ = fVar204 * fVar201;
              auVar102._20_4_ = fVar237 * fVar235;
              auVar102._24_4_ = fVar313 * fVar312;
              auVar102._28_4_ = auVar253._28_4_;
              auVar103._4_4_ = fVar275 * fVar236;
              auVar103._0_4_ = fVar234 * fVar338;
              auVar103._8_4_ = fVar314 * fVar276;
              auVar103._12_4_ = fVar280 * fVar315;
              auVar103._16_4_ = fVar206 * fVar173;
              auVar103._20_4_ = fVar242 * fVar289;
              auVar103._24_4_ = fVar317 * fVar244;
              auVar103._28_4_ = auVar34._28_4_;
              auVar32 = vsubps_avx(auVar103,auVar102);
              auVar190._0_4_ = auVar226._0_4_ * 0.0 + auVar32._0_4_ + auVar320._0_4_ * 0.0;
              auVar190._4_4_ = auVar226._4_4_ * 0.0 + auVar32._4_4_ + auVar320._4_4_ * 0.0;
              auVar190._8_4_ = auVar226._8_4_ * 0.0 + auVar32._8_4_ + auVar320._8_4_ * 0.0;
              auVar190._12_4_ = auVar226._12_4_ * 0.0 + auVar32._12_4_ + auVar320._12_4_ * 0.0;
              auVar190._16_4_ = auVar226._16_4_ * 0.0 + auVar32._16_4_ + auVar320._16_4_ * 0.0;
              auVar190._20_4_ = auVar226._20_4_ * 0.0 + auVar32._20_4_ + auVar320._20_4_ * 0.0;
              auVar190._24_4_ = auVar226._24_4_ * 0.0 + auVar32._24_4_ + auVar320._24_4_ * 0.0;
              auVar190._28_4_ = auVar34._28_4_ + auVar32._28_4_ + auVar253._28_4_;
              auVar329 = vrcpps_avx(auVar190);
              fVar338 = auVar329._0_4_;
              fVar239 = auVar329._4_4_;
              auVar104._4_4_ = auVar190._4_4_ * fVar239;
              auVar104._0_4_ = auVar190._0_4_ * fVar338;
              fVar221 = auVar329._8_4_;
              auVar104._8_4_ = auVar190._8_4_ * fVar221;
              fVar233 = auVar329._12_4_;
              auVar104._12_4_ = auVar190._12_4_ * fVar233;
              fVar234 = auVar329._16_4_;
              auVar104._16_4_ = auVar190._16_4_ * fVar234;
              fVar236 = auVar329._20_4_;
              auVar104._20_4_ = auVar190._20_4_ * fVar236;
              fVar261 = auVar329._24_4_;
              auVar104._24_4_ = auVar190._24_4_ * fVar261;
              auVar104._28_4_ = auVar36._28_4_;
              auVar356._8_4_ = 0x3f800000;
              auVar356._0_8_ = &DAT_3f8000003f800000;
              auVar356._12_4_ = 0x3f800000;
              auVar356._16_4_ = 0x3f800000;
              auVar356._20_4_ = 0x3f800000;
              auVar356._24_4_ = 0x3f800000;
              auVar356._28_4_ = 0x3f800000;
              auVar329 = vsubps_avx(auVar356,auVar104);
              fVar338 = auVar329._0_4_ * fVar338 + fVar338;
              fVar239 = auVar329._4_4_ * fVar239 + fVar239;
              fVar221 = auVar329._8_4_ * fVar221 + fVar221;
              fVar233 = auVar329._12_4_ * fVar233 + fVar233;
              fVar234 = auVar329._16_4_ * fVar234 + fVar234;
              fVar236 = auVar329._20_4_ * fVar236 + fVar236;
              fVar261 = auVar329._24_4_ * fVar261 + fVar261;
              auVar105._4_4_ =
                   (fVar258 * auVar226._4_4_ + auVar320._4_4_ * fVar246 + auVar32._4_4_ * fVar299) *
                   fVar239;
              auVar105._0_4_ =
                   (fVar344 * auVar226._0_4_ + auVar320._0_4_ * fVar220 + auVar32._0_4_ * fVar291) *
                   fVar338;
              auVar105._8_4_ =
                   (fVar310 * auVar226._8_4_ + auVar320._8_4_ * fVar277 + auVar32._8_4_ * fVar248) *
                   fVar221;
              auVar105._12_4_ =
                   (fVar279 * auVar226._12_4_ + auVar320._12_4_ * fVar241 + auVar32._12_4_ * fVar260
                   ) * fVar233;
              auVar105._16_4_ =
                   (fVar198 * auVar226._16_4_ + auVar320._16_4_ * fVar176 + auVar32._16_4_ * fVar263
                   ) * fVar234;
              auVar105._20_4_ =
                   (fVar290 * auVar226._20_4_ + auVar320._20_4_ * fVar207 + auVar32._20_4_ * fVar266
                   ) * fVar236;
              auVar105._24_4_ =
                   (fVar309 * auVar226._24_4_ + auVar320._24_4_ * fVar282 + auVar32._24_4_ * fVar143
                   ) * fVar261;
              auVar105._28_4_ = auVar191._28_4_ + auVar29._28_4_ + auVar37._28_4_;
              auVar232 = ZEXT3264(auVar105);
              uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar257._4_4_ = uVar10;
              auVar257._0_4_ = uVar10;
              auVar257._8_4_ = uVar10;
              auVar257._12_4_ = uVar10;
              auVar257._16_4_ = uVar10;
              auVar257._20_4_ = uVar10;
              auVar257._24_4_ = uVar10;
              auVar257._28_4_ = uVar10;
              auVar191 = vcmpps_avx(local_200,auVar105,2);
              auVar29 = vcmpps_avx(auVar105,auVar257,2);
              auVar191 = vandps_avx(auVar191,auVar29);
              auVar29 = auVar227 & auVar191;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar29 >> 0x7f,0) == '\0') &&
                    (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0xbf,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar29[0x1f]) goto LAB_0104f1e4;
              auVar191 = vandps_avx(auVar227,auVar191);
              auVar29 = vcmpps_avx(auVar306,auVar190,4);
              auVar37 = auVar191 & auVar29;
              auVar195 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              auVar324 = ZEXT3264(local_520);
              auVar341._4_4_ = fVar166;
              auVar341._0_4_ = fVar146;
              auVar341._8_4_ = fStack_838;
              auVar341._12_4_ = fStack_834;
              auVar341._16_4_ = fStack_830;
              auVar341._20_4_ = fStack_82c;
              auVar341._24_4_ = fStack_828;
              auVar341._28_4_ = fStack_824;
              if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar37 >> 0x7f,0) != '\0') ||
                    (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar37 >> 0xbf,0) != '\0') ||
                  (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar37[0x1f] < '\0') {
                auVar191 = vandps_avx(auVar29,auVar191);
                auVar195 = ZEXT3264(auVar191);
                auVar106._4_4_ = auVar331._4_4_ * fVar239;
                auVar106._0_4_ = auVar331._0_4_ * fVar338;
                auVar106._8_4_ = auVar331._8_4_ * fVar221;
                auVar106._12_4_ = auVar331._12_4_ * fVar233;
                auVar106._16_4_ = auVar331._16_4_ * fVar234;
                auVar106._20_4_ = auVar331._20_4_ * fVar236;
                auVar106._24_4_ = auVar331._24_4_ * fVar261;
                auVar106._28_4_ = local_540._28_4_;
                auVar107._4_4_ = auVar159._4_4_ * fVar239;
                auVar107._0_4_ = auVar159._0_4_ * fVar338;
                auVar107._8_4_ = auVar159._8_4_ * fVar221;
                auVar107._12_4_ = auVar159._12_4_ * fVar233;
                auVar107._16_4_ = auVar159._16_4_ * fVar234;
                auVar107._20_4_ = auVar159._20_4_ * fVar236;
                auVar107._24_4_ = auVar159._24_4_ * fVar261;
                auVar107._28_4_ = auVar159._28_4_;
                auVar162 = ZEXT3264(auVar107);
                auVar288._8_4_ = 0x3f800000;
                auVar288._0_8_ = &DAT_3f8000003f800000;
                auVar288._12_4_ = 0x3f800000;
                auVar288._16_4_ = 0x3f800000;
                auVar288._20_4_ = 0x3f800000;
                auVar288._24_4_ = 0x3f800000;
                auVar288._28_4_ = 0x3f800000;
                auVar191 = vsubps_avx(auVar288,auVar106);
                local_240 = vblendvps_avx(auVar191,auVar106,auVar352);
                auVar191 = vsubps_avx(auVar288,auVar107);
                _local_540 = vblendvps_avx(auVar191,auVar107,auVar352);
                auVar324 = ZEXT3264(auVar105);
              }
            }
            auVar191 = auVar195._0_32_;
            local_520 = auVar324._0_32_;
            if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar191 >> 0x7f,0) != '\0') ||
                  (auVar195 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar191 >> 0xbf,0) != '\0') ||
                (auVar195 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar195[0x1f] < '\0') {
              auVar29 = vsubps_avx(_local_5a0,auVar341);
              fVar220 = auVar341._0_4_ + local_240._0_4_ * auVar29._0_4_;
              fVar344 = auVar341._4_4_ + local_240._4_4_ * auVar29._4_4_;
              fVar239 = auVar341._8_4_ + local_240._8_4_ * auVar29._8_4_;
              fVar221 = auVar341._12_4_ + local_240._12_4_ * auVar29._12_4_;
              fVar233 = auVar341._16_4_ + local_240._16_4_ * auVar29._16_4_;
              fVar234 = auVar341._20_4_ + local_240._20_4_ * auVar29._20_4_;
              fVar236 = auVar341._24_4_ + local_240._24_4_ * auVar29._24_4_;
              fVar246 = auVar341._28_4_ + auVar29._28_4_;
              fVar338 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
              auVar108._4_4_ = (fVar344 + fVar344) * fVar338;
              auVar108._0_4_ = (fVar220 + fVar220) * fVar338;
              auVar108._8_4_ = (fVar239 + fVar239) * fVar338;
              auVar108._12_4_ = (fVar221 + fVar221) * fVar338;
              auVar108._16_4_ = (fVar233 + fVar233) * fVar338;
              auVar108._20_4_ = (fVar234 + fVar234) * fVar338;
              auVar108._24_4_ = (fVar236 + fVar236) * fVar338;
              auVar108._28_4_ = fVar246 + fVar246;
              auVar29 = vcmpps_avx(local_520,auVar108,6);
              auVar162 = ZEXT3264(auVar29);
              auVar37 = auVar191 & auVar29;
              if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar37 >> 0x7f,0) != '\0') ||
                    (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar37 >> 0xbf,0) != '\0') ||
                  (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar37[0x1f] < '\0') {
                local_2c0 = vandps_avx(auVar29,auVar191);
                auVar162 = ZEXT3264(local_2c0);
                local_360 = local_540._0_4_ + local_540._0_4_ + -1.0;
                fStack_35c = local_540._4_4_ + local_540._4_4_ + -1.0;
                fStack_358 = local_540._8_4_ + local_540._8_4_ + -1.0;
                fStack_354 = local_540._12_4_ + local_540._12_4_ + -1.0;
                fStack_350 = local_540._16_4_ + local_540._16_4_ + -1.0;
                fStack_34c = local_540._20_4_ + local_540._20_4_ + -1.0;
                fStack_348 = local_540._24_4_ + local_540._24_4_ + -1.0;
                fStack_344 = local_540._28_4_ + local_540._28_4_ + -1.0;
                local_380 = local_240;
                local_340 = local_520;
                local_31c = uVar13;
                local_310 = auVar304._0_8_;
                uStack_308 = uStack_888;
                local_300 = local_6c0;
                uStack_2f8 = uStack_6b8;
                local_2f0 = local_6d0;
                uStack_2e8 = uStack_6c8;
                auVar195 = ZEXT1664(_local_6b0);
                local_2e0 = _local_6b0;
                pGVar142 = (context->scene->geometries).items[uVar137].ptr;
                local_540._4_4_ = fStack_35c;
                local_540._0_4_ = local_360;
                fStack_538 = fStack_358;
                fStack_534 = fStack_354;
                fStack_530 = fStack_350;
                fStack_52c = fStack_34c;
                fStack_528 = fStack_348;
                fStack_524 = fStack_344;
                if ((pGVar142->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar213._0_4_ = (float)(int)local_320;
                  auVar213._4_8_ = SUB128(ZEXT812(0),4);
                  auVar213._12_4_ = 0;
                  auVar252 = vshufps_avx(auVar213,auVar213,0);
                  local_2a0[0] = (auVar252._0_4_ + local_240._0_4_ + 0.0) * (float)local_480._0_4_;
                  local_2a0[1] = (auVar252._4_4_ + local_240._4_4_ + 1.0) * (float)local_480._4_4_;
                  local_2a0[2] = (auVar252._8_4_ + local_240._8_4_ + 2.0) * fStack_478;
                  local_2a0[3] = (auVar252._12_4_ + local_240._12_4_ + 3.0) * fStack_474;
                  fStack_290 = (auVar252._0_4_ + local_240._16_4_ + 4.0) * fStack_470;
                  fStack_28c = (auVar252._4_4_ + local_240._20_4_ + 5.0) * fStack_46c;
                  fStack_288 = (auVar252._8_4_ + local_240._24_4_ + 6.0) * fStack_468;
                  fStack_284 = auVar252._12_4_ + local_240._28_4_ + 7.0;
                  local_280 = CONCAT44(fStack_35c,local_360);
                  uStack_278 = CONCAT44(fStack_354,fStack_358);
                  uStack_270 = CONCAT44(fStack_34c,fStack_350);
                  uStack_268 = CONCAT44(fStack_344,fStack_348);
                  local_260 = local_520;
                  auVar192._8_4_ = 0x7f800000;
                  auVar192._0_8_ = 0x7f8000007f800000;
                  auVar192._12_4_ = 0x7f800000;
                  auVar192._16_4_ = 0x7f800000;
                  auVar192._20_4_ = 0x7f800000;
                  auVar192._24_4_ = 0x7f800000;
                  auVar192._28_4_ = 0x7f800000;
                  auVar191 = vblendvps_avx(auVar192,local_520,local_2c0);
                  auVar29 = vshufps_avx(auVar191,auVar191,0xb1);
                  auVar29 = vminps_avx(auVar191,auVar29);
                  auVar37 = vshufpd_avx(auVar29,auVar29,5);
                  auVar29 = vminps_avx(auVar29,auVar37);
                  auVar37 = vperm2f128_avx(auVar29,auVar29,1);
                  auVar29 = vminps_avx(auVar29,auVar37);
                  auVar29 = vcmpps_avx(auVar191,auVar29,0);
                  auVar37 = local_2c0 & auVar29;
                  auVar191 = local_2c0;
                  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar37 >> 0x7f,0) != '\0') ||
                        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar37 >> 0xbf,0) != '\0') ||
                      (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar37[0x1f] < '\0') {
                    auVar191 = vandps_avx(auVar29,local_2c0);
                  }
                  uVar135 = vmovmskps_avx(auVar191);
                  uVar19 = 0;
                  if (uVar135 != 0) {
                    for (; (uVar135 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar136 = (ulong)uVar19;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar142->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar338 = local_2a0[uVar136];
                    auVar162 = ZEXT464((uint)fVar338);
                    uVar19 = *(uint *)((long)&local_280 + uVar136 * 4);
                    auVar195 = ZEXT464(uVar19);
                    fVar344 = 1.0 - fVar338;
                    fVar220 = fVar338 * fVar344 + fVar338 * fVar344;
                    auVar252 = ZEXT416((uint)(fVar338 * fVar338 * 3.0));
                    auVar252 = vshufps_avx(auVar252,auVar252,0);
                    auVar214 = ZEXT416((uint)((fVar220 - fVar338 * fVar338) * 3.0));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar225 = ZEXT416((uint)((fVar344 * fVar344 - fVar220) * 3.0));
                    auVar225 = vshufps_avx(auVar225,auVar225,0);
                    auVar216 = ZEXT416((uint)(fVar344 * fVar344 * -3.0));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar215._0_4_ =
                         auVar216._0_4_ * fVar300 +
                         auVar225._0_4_ * (float)local_6c0._0_4_ +
                         auVar252._0_4_ * (float)local_6b0._0_4_ +
                         auVar214._0_4_ * (float)local_6d0._0_4_;
                    auVar215._4_4_ =
                         auVar216._4_4_ * fVar308 +
                         auVar225._4_4_ * (float)local_6c0._4_4_ +
                         auVar252._4_4_ * (float)local_6b0._4_4_ +
                         auVar214._4_4_ * (float)local_6d0._4_4_;
                    auVar215._8_4_ =
                         auVar216._8_4_ * auVar304._8_4_ +
                         auVar225._8_4_ * (float)uStack_6b8 +
                         auVar252._8_4_ * (float)uStack_6a8 + auVar214._8_4_ * (float)uStack_6c8;
                    auVar215._12_4_ =
                         auVar216._12_4_ * auVar304._12_4_ +
                         auVar225._12_4_ * uStack_6b8._4_4_ +
                         auVar252._12_4_ * uStack_6a8._4_4_ + auVar214._12_4_ * uStack_6c8._4_4_;
                    auVar232 = ZEXT464(*(uint *)(local_260 + uVar136 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_260 + uVar136 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar215._0_4_;
                    uVar10 = vextractps_avx(auVar215,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                    uVar10 = vextractps_avx(auVar215,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                    *(float *)(ray + k * 4 + 0xf0) = fVar338;
                    *(uint *)(ray + k * 4 + 0x100) = uVar19;
                    *(uint *)(ray + k * 4 + 0x110) = uVar12;
                    *(uint *)(ray + k * 4 + 0x120) = uVar137;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    _local_680 = _local_6c0;
                    auStack_7b0 = auVar273._16_16_;
                    _local_7c0 = _local_6d0;
                    _local_7e0 = _local_6b0;
                    auStack_730 = auVar155._16_16_;
                    local_740 = *local_788;
                    _auStack_778 = auVar156._8_24_;
                    local_780 = pGVar142;
                    local_600 = local_2c0;
                    do {
                      local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_3e0 = local_2a0[uVar136];
                      local_3d0._4_4_ = *(undefined4 *)((long)&local_280 + uVar136 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar136 * 4)
                      ;
                      fVar220 = 1.0 - local_3e0;
                      fVar338 = local_3e0 * fVar220 + local_3e0 * fVar220;
                      auVar252 = ZEXT416((uint)(local_3e0 * local_3e0 * 3.0));
                      auVar252 = vshufps_avx(auVar252,auVar252,0);
                      auVar214 = ZEXT416((uint)((fVar338 - local_3e0 * local_3e0) * 3.0));
                      auVar214 = vshufps_avx(auVar214,auVar214,0);
                      auVar225 = ZEXT416((uint)((fVar220 * fVar220 - fVar338) * 3.0));
                      auVar225 = vshufps_avx(auVar225,auVar225,0);
                      local_810.context = context->user;
                      auVar216 = ZEXT416((uint)(fVar220 * fVar220 * -3.0));
                      auVar216 = vshufps_avx(auVar216,auVar216,0);
                      auVar217._0_4_ =
                           auVar216._0_4_ * fVar300 +
                           auVar225._0_4_ * (float)local_680._0_4_ +
                           auVar252._0_4_ * (float)local_7e0._0_4_ +
                           auVar214._0_4_ * (float)local_7c0._0_4_;
                      auVar217._4_4_ =
                           auVar216._4_4_ * fVar308 +
                           auVar225._4_4_ * (float)local_680._4_4_ +
                           auVar252._4_4_ * (float)local_7e0._4_4_ +
                           auVar214._4_4_ * (float)local_7c0._4_4_;
                      auVar217._8_4_ =
                           auVar216._8_4_ * auVar304._8_4_ +
                           auVar225._8_4_ * fStack_678 +
                           auVar252._8_4_ * (float)uStack_7d8 + auVar214._8_4_ * fStack_7b8;
                      auVar217._12_4_ =
                           auVar216._12_4_ * auVar304._12_4_ +
                           auVar225._12_4_ * fStack_674 +
                           auVar252._12_4_ * uStack_7d8._4_4_ + auVar214._12_4_ * fStack_7b4;
                      auVar252 = vshufps_avx(auVar217,auVar217,0);
                      local_410[0] = (RTCHitN)auVar252[0];
                      local_410[1] = (RTCHitN)auVar252[1];
                      local_410[2] = (RTCHitN)auVar252[2];
                      local_410[3] = (RTCHitN)auVar252[3];
                      local_410[4] = (RTCHitN)auVar252[4];
                      local_410[5] = (RTCHitN)auVar252[5];
                      local_410[6] = (RTCHitN)auVar252[6];
                      local_410[7] = (RTCHitN)auVar252[7];
                      local_410[8] = (RTCHitN)auVar252[8];
                      local_410[9] = (RTCHitN)auVar252[9];
                      local_410[10] = (RTCHitN)auVar252[10];
                      local_410[0xb] = (RTCHitN)auVar252[0xb];
                      local_410[0xc] = (RTCHitN)auVar252[0xc];
                      local_410[0xd] = (RTCHitN)auVar252[0xd];
                      local_410[0xe] = (RTCHitN)auVar252[0xe];
                      local_410[0xf] = (RTCHitN)auVar252[0xf];
                      local_400 = vshufps_avx(auVar217,auVar217,0x55);
                      auVar232 = ZEXT1664(local_400);
                      local_3f0 = vshufps_avx(auVar217,auVar217,0xaa);
                      fStack_3dc = local_3e0;
                      fStack_3d8 = local_3e0;
                      fStack_3d4 = local_3e0;
                      local_3d0._0_4_ = local_3d0._4_4_;
                      local_3d0._8_4_ = local_3d0._4_4_;
                      local_3d0._12_4_ = local_3d0._4_4_;
                      local_3c0 = local_150._0_8_;
                      uStack_3b8 = local_150._8_8_;
                      local_3b0 = local_140._0_8_;
                      uStack_3a8 = local_140._8_8_;
                      vcmpps_avx(auVar381._0_32_,auVar381._0_32_,0xf);
                      uStack_39c = (local_810.context)->instID[0];
                      local_3a0 = uStack_39c;
                      uStack_398 = uStack_39c;
                      uStack_394 = uStack_39c;
                      uStack_390 = (local_810.context)->instPrimID[0];
                      uStack_38c = uStack_390;
                      uStack_388 = uStack_390;
                      uStack_384 = uStack_390;
                      local_880 = local_740._0_8_;
                      uStack_878 = local_740._8_8_;
                      local_810.valid = (int *)&local_880;
                      local_810.geometryUserPtr = pGVar142->userPtr;
                      local_810.hit = local_410;
                      local_810.N = 4;
                      local_840 = (uint)uVar136;
                      uStack_83c = (undefined4)(uVar136 >> 0x20);
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar142->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar232 = ZEXT1664(local_400);
                        (*pGVar142->intersectionFilterN)(&local_810);
                        uVar136 = CONCAT44(uStack_83c,local_840);
                        auVar324 = ZEXT3264(local_520);
                        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar142 = local_780;
                      }
                      auVar252 = auVar232._0_16_;
                      auVar117._8_8_ = uStack_878;
                      auVar117._0_8_ = local_880;
                      if (auVar117 == (undefined1  [16])0x0) {
                        auVar252 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar252 = auVar252 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar142->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var18)(&local_810);
                          uVar136 = CONCAT44(uStack_83c,local_840);
                          auVar324 = ZEXT3264(local_520);
                          auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar142 = local_780;
                        }
                        auVar118._8_8_ = uStack_878;
                        auVar118._0_8_ = local_880;
                        auVar214 = vpcmpeqd_avx(auVar118,_DAT_01feba10);
                        auVar225 = vpcmpeqd_avx(auVar252,auVar252);
                        auVar232 = ZEXT1664(auVar225);
                        auVar252 = auVar214 ^ auVar225;
                        if (auVar118 != (undefined1  [16])0x0) {
                          auVar214 = auVar214 ^ auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])local_810.hit);
                          *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x10));
                          *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x20));
                          *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x30));
                          *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x40));
                          *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x50));
                          *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x60));
                          *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar225;
                          auVar225 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x70));
                          *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar225;
                          auVar214 = vmaskmovps_avx(auVar214,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x80));
                          *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar214;
                        }
                      }
                      auVar182._8_8_ = 0x100000001;
                      auVar182._0_8_ = 0x100000001;
                      if ((auVar182 & auVar252) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                      }
                      *(undefined4 *)(local_600 + uVar136 * 4) = 0;
                      uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar160._4_4_ = uVar10;
                      auVar160._0_4_ = uVar10;
                      auVar160._8_4_ = uVar10;
                      auVar160._12_4_ = uVar10;
                      auVar160._16_4_ = uVar10;
                      auVar160._20_4_ = uVar10;
                      auVar160._24_4_ = uVar10;
                      auVar160._28_4_ = uVar10;
                      auVar191 = vcmpps_avx(auVar324._0_32_,auVar160,2);
                      auVar155 = vandps_avx(auVar191,local_600);
                      auVar162 = ZEXT3264(auVar155);
                      local_600 = local_600 & auVar191;
                      bVar115 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar116 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar114 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar113 = SUB321(local_600 >> 0x7f,0) != '\0';
                      bVar112 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar111 = SUB321(local_600 >> 0xbf,0) != '\0';
                      bVar110 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar109 = local_600[0x1f] < '\0';
                      if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                          || bVar110) || bVar109) {
                        auVar193._8_4_ = 0x7f800000;
                        auVar193._0_8_ = 0x7f8000007f800000;
                        auVar193._12_4_ = 0x7f800000;
                        auVar193._16_4_ = 0x7f800000;
                        auVar193._20_4_ = 0x7f800000;
                        auVar193._24_4_ = 0x7f800000;
                        auVar193._28_4_ = 0x7f800000;
                        auVar191 = vblendvps_avx(auVar193,auVar324._0_32_,auVar155);
                        auVar29 = vshufps_avx(auVar191,auVar191,0xb1);
                        auVar29 = vminps_avx(auVar191,auVar29);
                        auVar37 = vshufpd_avx(auVar29,auVar29,5);
                        auVar29 = vminps_avx(auVar29,auVar37);
                        auVar37 = vperm2f128_avx(auVar29,auVar29,1);
                        auVar232 = ZEXT3264(auVar37);
                        auVar29 = vminps_avx(auVar29,auVar37);
                        auVar191 = vcmpps_avx(auVar191,auVar29,0);
                        auVar29 = auVar155 & auVar191;
                        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar29 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar29 >> 0x7f,0) != '\0') ||
                              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar29 >> 0xbf,0) != '\0') ||
                            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar29[0x1f] < '\0') {
                          auVar29 = vandps_avx(auVar191,auVar155);
                          auVar162 = ZEXT3264(auVar29);
                        }
                        uVar135 = vmovmskps_avx(auVar162._0_32_);
                        uVar19 = 0;
                        if (uVar135 != 0) {
                          for (; (uVar135 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar136 = (ulong)uVar19;
                      }
                      auVar195 = ZEXT3264(auVar191);
                      local_600 = auVar155;
                    } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) ||
                              bVar111) || bVar110) || bVar109);
                  }
                }
              }
            }
          }
          lVar141 = lVar141 + 8;
          fVar248 = (float)local_700._0_4_;
          fVar260 = (float)local_700._4_4_;
          fVar263 = fStack_6f8;
          fVar266 = fStack_6f4;
          fVar338 = fStack_6f0;
          fVar220 = fStack_6ec;
          fVar344 = fStack_6e8;
        } while ((int)lVar141 < (int)uVar13);
      }
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar150._4_4_ = uVar10;
      auVar150._0_4_ = uVar10;
      auVar150._8_4_ = uVar10;
      auVar150._12_4_ = uVar10;
      auVar252 = vcmpps_avx(local_130,auVar150,2);
      uVar137 = vmovmskps_avx(auVar252);
      uVar134 = uVar134 & uVar134 + 0xf & uVar137;
    } while (uVar134 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }